

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_2d_b86_mgc.c
# Opt level: O0

void func_fxc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  double dVar372;
  double dVar373;
  double dVar374;
  double dVar375;
  double dVar376;
  double dVar377;
  double dVar378;
  double dVar379;
  double dVar380;
  double dVar381;
  double dVar382;
  double dVar383;
  double dVar384;
  double dVar385;
  double dVar386;
  double dVar387;
  double dVar388;
  double dVar389;
  double dVar390;
  double dVar391;
  double dVar392;
  double dVar393;
  double dVar394;
  double dVar395;
  double dVar396;
  double dVar397;
  double dVar398;
  double dVar399;
  double dVar400;
  double dVar401;
  double dVar402;
  double dVar403;
  double dVar404;
  double dVar405;
  double dVar406;
  double dVar407;
  double dVar408;
  double dVar409;
  double dVar410;
  double dVar411;
  double dVar412;
  double dVar413;
  double dVar414;
  double dVar415;
  double dVar416;
  double dVar417;
  double dVar418;
  double dVar419;
  double dVar420;
  double dVar421;
  double dVar422;
  double dVar423;
  double dVar424;
  double dVar425;
  double dVar426;
  double dVar427;
  double dVar428;
  double dVar429;
  double dVar430;
  double dVar431;
  double dVar432;
  double dVar433;
  double dVar434;
  double dVar435;
  double dVar436;
  double dVar437;
  double dVar438;
  double dVar439;
  double dVar440;
  double dVar441;
  double dVar442;
  double dVar443;
  double dVar444;
  double dVar445;
  double dVar446;
  double dVar447;
  double dVar448;
  double dVar449;
  double dVar450;
  double dVar451;
  double dVar452;
  double dVar453;
  double dVar454;
  double dVar455;
  double dVar456;
  double dVar457;
  double dVar458;
  double dVar459;
  double dVar460;
  double dVar461;
  double dVar462;
  double dVar463;
  double dVar464;
  double dVar465;
  double dVar466;
  double dVar467;
  double dVar468;
  double dVar469;
  double dVar470;
  double dVar471;
  double dVar472;
  double dVar473;
  double dVar474;
  double dVar475;
  double dVar476;
  double dVar477;
  double dVar478;
  double dVar479;
  double dVar480;
  double dVar481;
  double dVar482;
  double dVar483;
  double dVar484;
  double dVar485;
  double dVar486;
  double dVar487;
  double dVar488;
  double dVar489;
  double dVar490;
  double dVar491;
  double dVar492;
  double dVar493;
  double dVar494;
  double dVar495;
  double dVar496;
  double dVar497;
  double dVar498;
  double dVar499;
  double dVar500;
  double dVar501;
  double dVar502;
  double dVar503;
  double dVar504;
  double dVar505;
  double dVar506;
  double dVar507;
  double dVar508;
  double dVar509;
  double dVar510;
  double dVar511;
  double dVar512;
  double dVar513;
  double dVar514;
  double dVar515;
  double dVar516;
  double dVar517;
  double dVar518;
  double dVar519;
  double dVar520;
  double dVar521;
  double dVar522;
  double dVar523;
  double dVar524;
  long *in_stack_00000008;
  double tv2tau22;
  double tv2tau21;
  double tv2tau20;
  double tv2lapltau3;
  double tv2lapltau2;
  double tv2lapltau1;
  double tv2lapltau0;
  double tv2lapl22;
  double tv2lapl21;
  double tv2lapl20;
  double tv2sigmatau5;
  double t8180;
  double t8176;
  double t8173;
  double t8172;
  double tv2sigmatau4;
  double tv2sigmatau3;
  double tv2sigmatau2;
  double tv2sigmatau1;
  double tv2sigmatau0;
  double t8171;
  double t8167;
  double t8164;
  double t8163;
  double tv2sigmalapl5;
  double tv2sigmalapl4;
  double tv2sigmalapl3;
  double tv2sigmalapl2;
  double tv2sigmalapl1;
  double tv2sigmalapl0;
  double tv2sigma25;
  double t8162;
  double t8158;
  double t8155;
  double t8154;
  double t8153;
  double t8152;
  double t8149;
  double t8148;
  double t8145;
  double t8138;
  double t8137;
  double t8136;
  double t8132;
  double t8129;
  double t8119;
  double t8113;
  double t8111;
  double t8109;
  double t8107;
  double t8105;
  double t8103;
  double t8091;
  double t8088;
  double t8085;
  double t8079;
  double t8077;
  double t8075;
  double t8073;
  double t8071;
  double t8069;
  double t8068;
  double t8062;
  double t8060;
  double t8056;
  double t8054;
  double t8052;
  double t8050;
  double t8048;
  double t8046;
  double t8044;
  double t8042;
  double t8040;
  double t8038;
  double t8036;
  double t8034;
  double t8032;
  double t8030;
  double t8028;
  double t8026;
  double t8024;
  double t8023;
  double t8022;
  double t8020;
  double t8018;
  double t8016;
  double t8014;
  double t8012;
  double t8010;
  double t8008;
  double t8006;
  double t8004;
  double t8002;
  double t8000;
  double t7998;
  double t7996;
  double t7994;
  double t7992;
  double t7990;
  double t7988;
  double t7985;
  double t7982;
  double t7979;
  double t7972;
  double t7969;
  double t7968;
  double t7964;
  double t7949;
  double t7946;
  double t7943;
  double t7942;
  double t7940;
  double t7937;
  double t7933;
  double t7928;
  double t7925;
  double t7923;
  double t7921;
  double t7919;
  double t7917;
  double t7913;
  double t7911;
  double t7909;
  double t7907;
  double t7905;
  double t7903;
  double t7902;
  double t7900;
  double t7898;
  double t7896;
  double t7894;
  double t7892;
  double t7890;
  double t7888;
  double t7886;
  double t7884;
  double t7882;
  double t7880;
  double t7879;
  double t7877;
  double t7875;
  double t7873;
  double t7871;
  double t7869;
  double t7867;
  double t7865;
  double t7861;
  double t7859;
  double t7857;
  double t7855;
  double t7854;
  double t7852;
  double t7850;
  double t7848;
  double t7846;
  double t7844;
  double t7842;
  double t7840;
  double t7838;
  double t7836;
  double t7834;
  double t7832;
  double t7831;
  double t7823;
  double t7819;
  double t7816;
  double t7805;
  double t7789;
  double t7788;
  double t7783;
  double t7782;
  double t7780;
  double t7778;
  double t7776;
  double t7774;
  double t7772;
  double t7770;
  double t7768;
  double t7766;
  double t7764;
  double t7762;
  double t7760;
  double t7758;
  double t7756;
  double t7754;
  double t7751;
  double t7750;
  double t7746;
  double t7745;
  double t7744;
  double t7740;
  double t7739;
  double t7736;
  double tv2sigma24;
  double tv2sigma23;
  double tv2sigma22;
  double tv2sigma21;
  double tv2sigma20;
  double t7735;
  double t7731;
  double t7728;
  double t7727;
  double t7726;
  double t7725;
  double t7722;
  double t7721;
  double t7718;
  double t7711;
  double t7710;
  double t7709;
  double t7705;
  double t7702;
  double t7692;
  double t7686;
  double t7684;
  double t7682;
  double t7680;
  double t7678;
  double t7676;
  double t7664;
  double t7661;
  double t7658;
  double t7652;
  double t7650;
  double t7648;
  double t7646;
  double t7644;
  double t7642;
  double t7641;
  double t7635;
  double t7633;
  double t7631;
  double t7629;
  double t7627;
  double t7625;
  double t7623;
  double t7621;
  double t7619;
  double t7617;
  double t7615;
  double t7613;
  double t7611;
  double t7609;
  double t7607;
  double t7605;
  double t7603;
  double t7601;
  double t7599;
  double t7596;
  double t7595;
  double t7593;
  double t7591;
  double t7589;
  double t7587;
  double t7585;
  double t7583;
  double t7581;
  double t7579;
  double t7577;
  double t7575;
  double t7573;
  double t7571;
  double t7569;
  double t7567;
  double t7565;
  double t7563;
  double t7561;
  double t7558;
  double t7555;
  double t7552;
  double t7545;
  double t7542;
  double t7541;
  double t7537;
  double t7522;
  double t7519;
  double t7516;
  double t7515;
  double t7513;
  double t7510;
  double t7506;
  double t7501;
  double t7498;
  double t7496;
  double t7494;
  double t7492;
  double t7490;
  double t7488;
  double t7486;
  double t7484;
  double t7482;
  double t7480;
  double t7478;
  double t7476;
  double t7475;
  double t7473;
  double t7471;
  double t7469;
  double t7467;
  double t7465;
  double t7463;
  double t7461;
  double t7459;
  double t7455;
  double t7453;
  double t7452;
  double t7450;
  double t7448;
  double t7446;
  double t7444;
  double t7442;
  double t7440;
  double t7438;
  double t7436;
  double t7434;
  double t7432;
  double t7430;
  double t7428;
  double t7427;
  double t7425;
  double t7423;
  double t7421;
  double t7419;
  double t7417;
  double t7415;
  double t7413;
  double t7411;
  double t7407;
  double t7405;
  double t7404;
  double t7396;
  double t7392;
  double t7389;
  double t7378;
  double t7362;
  double t7361;
  double t7356;
  double t7355;
  double t7353;
  double t7351;
  double t7349;
  double t7347;
  double t7345;
  double t7343;
  double t7341;
  double t7339;
  double t7337;
  double t7335;
  double t7333;
  double t7331;
  double t7329;
  double t7327;
  double t7324;
  double t7323;
  double t7319;
  double t7318;
  double t7317;
  double t7316;
  double t7311;
  double t7310;
  double t7307;
  double tv2rhotau3;
  double t7305;
  double t7301;
  double t7298;
  double t7297;
  double t7294;
  double t7293;
  double t7290;
  double t7289;
  double tv2rhotau2;
  double t7287;
  double t7283;
  double t7282;
  double t7279;
  double t7278;
  double tv2rhotau1;
  double t7276;
  double t7272;
  double t7271;
  double t7270;
  double t7268;
  double t7267;
  double t7264;
  double t7263;
  double tv2rhotau0;
  double t7261;
  double t7257;
  double t7254;
  double t7253;
  double t7250;
  double t7249;
  double t7248;
  double t7246;
  double t7245;
  double t7242;
  double t7241;
  double tv2rholapl3;
  double tv2rholapl2;
  double tv2rholapl1;
  double tv2rholapl0;
  double tv2rhosigma5;
  double t7239;
  double t7234;
  double t7233;
  double t7229;
  double t7225;
  double t7222;
  double t7216;
  double t7213;
  double t7196;
  double t7193;
  double t7189;
  double t7188;
  double t7186;
  double t7182;
  double t7178;
  double t7174;
  double t7170;
  double t7166;
  double t7162;
  double t7157;
  double t7152;
  double t7145;
  double t7142;
  double t7136;
  double t7133;
  double t7130;
  double t7129;
  double t7125;
  double t7120;
  double t7110;
  double t7107;
  double t7101;
  double t7100;
  double t7098;
  double t7095;
  double t7093;
  double t7088;
  double t7083;
  double t7080;
  double t7057;
  double t7033;
  double t7031;
  double t7029;
  double t7027;
  double t7025;
  double t7023;
  double t7021;
  double t7019;
  double t7017;
  double t7015;
  double t7013;
  double t7011;
  double t7010;
  double t7006;
  double t7004;
  double t7002;
  double t7000;
  double t6998;
  double t6996;
  double t6994;
  double t6992;
  double t6990;
  double t6988;
  double t6987;
  double t6984;
  double t6983;
  double t6980;
  double t6979;
  double t6978;
  double t6974;
  double t6971;
  double t6962;
  double t6959;
  double t6956;
  double t6954;
  double t6950;
  double t6946;
  double t6936;
  double t6931;
  double t6928;
  double t6922;
  double t6916;
  double t6912;
  double t6908;
  double t6901;
  double t6899;
  double t6862;
  double t6860;
  double t6858;
  double t6856;
  double t6852;
  double t6850;
  double t6848;
  double t6846;
  double t6844;
  double t6842;
  double t6840;
  double t6838;
  double t6836;
  double t6834;
  double t6832;
  double t6830;
  double t6828;
  double t6826;
  double t6825;
  double t6824;
  double t6819;
  double t6815;
  double t6811;
  double t6810;
  double t6807;
  double t6800;
  double t6797;
  double t6790;
  double t6789;
  double t6788;
  double t6780;
  double t6777;
  double t6772;
  double t6771;
  double t6770;
  double t6769;
  double t6768;
  double tv2rhosigma4;
  double tv2rhosigma3;
  double t6763;
  double t6758;
  double t6751;
  double t6750;
  double t6749;
  double t6745;
  double t6742;
  double t6733;
  double t6730;
  double t6727;
  double t6725;
  double t6721;
  double t6717;
  double t6707;
  double t6702;
  double t6699;
  double t6693;
  double t6687;
  double t6683;
  double t6679;
  double t6672;
  double t6670;
  double t6668;
  double t6666;
  double t6664;
  double t6662;
  double t6660;
  double t6658;
  double t6656;
  double t6652;
  double t6650;
  double t6648;
  double t6646;
  double t6644;
  double t6642;
  double t6640;
  double t6638;
  double t6636;
  double t6634;
  double t6633;
  double t6632;
  double t6591;
  double t6588;
  double t6587;
  double t6583;
  double t6578;
  double t6568;
  double t6565;
  double t6559;
  double t6558;
  double t6556;
  double t6553;
  double t6551;
  double t6546;
  double t6541;
  double t6538;
  double t6536;
  double t6534;
  double t6532;
  double t6530;
  double t6528;
  double t6526;
  double t6524;
  double t6522;
  double t6520;
  double t6516;
  double t6515;
  double t6513;
  double t6511;
  double t6509;
  double t6507;
  double t6505;
  double t6503;
  double t6501;
  double t6499;
  double t6497;
  double t6495;
  double t6493;
  double t6492;
  double t6490;
  double t6467;
  double t6441;
  double t6437;
  double t6434;
  double t6428;
  double t6425;
  double t6408;
  double t6405;
  double t6401;
  double t6400;
  double t6398;
  double t6394;
  double t6390;
  double t6386;
  double t6382;
  double t6378;
  double t6374;
  double t6369;
  double t6368;
  double t6363;
  double tv2rhosigma2;
  double t6356;
  double t6351;
  double t6344;
  double t6343;
  double t6342;
  double t6338;
  double t6335;
  double t6331;
  double t6327;
  double t6324;
  double t6319;
  double t6317;
  double t6313;
  double t6309;
  double t6305;
  double t6298;
  double t6293;
  double t6290;
  double t6285;
  double t6283;
  double t6278;
  double t6276;
  double t6272;
  double t6268;
  double t6261;
  double t6259;
  double t6256;
  double t6253;
  double t6250;
  double t6247;
  double t6244;
  double t6241;
  double t6238;
  double t6235;
  double t6232;
  double t6229;
  double t6226;
  double t6223;
  double t6220;
  double t6217;
  double t6214;
  double t6211;
  double t6208;
  double t6205;
  double t6204;
  double t6202;
  double t6198;
  double t6196;
  double t6194;
  double t6192;
  double t6190;
  double t6188;
  double t6186;
  double t6184;
  double t6182;
  double t6180;
  double t6178;
  double t6176;
  double t6174;
  double t6172;
  double t6170;
  double t6168;
  double t6167;
  double t6162;
  double t6159;
  double t6158;
  double t6154;
  double t6140;
  double t6137;
  double t6132;
  double t6130;
  double t6129;
  double t6127;
  double t6125;
  double t6123;
  double t6121;
  double t6118;
  double t6115;
  double t6108;
  double t6105;
  double t6102;
  double t6099;
  double t6096;
  double t6093;
  double t6090;
  double t6087;
  double t6084;
  double t6081;
  double t6078;
  double t6075;
  double t6074;
  double t6071;
  double t6068;
  double t6065;
  double t6062;
  double t6059;
  double t6056;
  double t6053;
  double t6050;
  double t6047;
  double t6044;
  double t6041;
  double t6039;
  double t6037;
  double t6035;
  double t6033;
  double t6031;
  double t6027;
  double t6025;
  double t6023;
  double t6021;
  double t6019;
  double t6017;
  double t6016;
  double t6014;
  double t6012;
  double t6010;
  double t6008;
  double t6006;
  double t6004;
  double t6002;
  double t6000;
  double t5998;
  double t5996;
  double t5994;
  double t5993;
  double t5989;
  double t5985;
  double t5982;
  double t5972;
  double t5966;
  double t5956;
  double t5953;
  double t5949;
  double t5948;
  double t5946;
  double t5943;
  double t5941;
  double t5938;
  double t5936;
  double t5933;
  double t5931;
  double t5928;
  double t5926;
  double t5923;
  double t5921;
  double t5918;
  double t5916;
  double t5913;
  double t5910;
  double t5909;
  double t5904;
  double t5903;
  double t5902;
  double t5897;
  double t5896;
  double tv2rhosigma1;
  double tv2rhosigma0;
  double t5889;
  double t5884;
  double t5883;
  double t5878;
  double t5873;
  double t5867;
  double t5864;
  double t5863;
  double t5861;
  double t5857;
  double t5854;
  double t5844;
  double t5838;
  double t5828;
  double t5825;
  double t5821;
  double t5820;
  double t5818;
  double t5815;
  double t5813;
  double t5810;
  double t5808;
  double t5805;
  double t5803;
  double t5800;
  double t5798;
  double t5795;
  double t5793;
  double t5790;
  double t5788;
  double t5785;
  double t5782;
  double t5779;
  double t5776;
  double t5769;
  double t5766;
  double t5761;
  double t5756;
  double t5753;
  double t5750;
  double t5749;
  double t5745;
  double t5731;
  double t5728;
  double t5723;
  double t5721;
  double t5720;
  double t5718;
  double t5716;
  double t5714;
  double t5712;
  double t5709;
  double t5706;
  double t5699;
  double t5696;
  double t5693;
  double t5690;
  double t5687;
  double t5684;
  double t5681;
  double t5678;
  double t5675;
  double t5672;
  double t5669;
  double t5666;
  double t5665;
  double t5662;
  double t5659;
  double t5656;
  double t5653;
  double t5650;
  double t5647;
  double t5644;
  double t5641;
  double t5638;
  double t5635;
  double t5632;
  double t5630;
  double t5628;
  double t5626;
  double t5624;
  double t5622;
  double t5620;
  double t5618;
  double t5616;
  double t5614;
  double t5612;
  double t5610;
  double t5608;
  double t5607;
  double t5605;
  double t5601;
  double t5599;
  double t5597;
  double t5595;
  double t5593;
  double t5591;
  double t5589;
  double t5587;
  double t5585;
  double t5584;
  double t5579;
  double t5576;
  double t5573;
  double t5572;
  double t5569;
  double t5568;
  double t5567;
  double t5563;
  double t5560;
  double t5556;
  double t5552;
  double t5549;
  double t5544;
  double t5542;
  double t5538;
  double t5534;
  double t5530;
  double t5523;
  double t5518;
  double t5515;
  double t5510;
  double t5508;
  double t5503;
  double t5501;
  double t5497;
  double t5493;
  double t5486;
  double t5484;
  double t5481;
  double t5478;
  double t5475;
  double t5472;
  double t5469;
  double t5466;
  double t5463;
  double t5460;
  double t5457;
  double t5454;
  double t5451;
  double t5448;
  double t5445;
  double t5442;
  double t5439;
  double t5436;
  double t5433;
  double t5430;
  double t5429;
  double t5425;
  double t5423;
  double t5421;
  double t5419;
  double t5417;
  double t5415;
  double t5413;
  double t5411;
  double t5409;
  double t5407;
  double t5405;
  double t5403;
  double t5401;
  double t5399;
  double t5397;
  double t5395;
  double t5393;
  double t5392;
  double t5391;
  double t5386;
  double t5385;
  double t5376;
  double t5375;
  double t5371;
  double t5370;
  double t5365;
  double t5364;
  double t5363;
  double t5362;
  double t5361;
  double t5360;
  double tv2rho22;
  double t5352;
  double t5347;
  double t5344;
  double t5341;
  double t5340;
  double t5336;
  double t5321;
  double t5318;
  double t5315;
  double t5314;
  double t5312;
  double t5309;
  double t5305;
  double t5300;
  double t5297;
  double t5295;
  double t5293;
  double t5291;
  double t5289;
  double t5285;
  double t5283;
  double t5281;
  double t5279;
  double t5277;
  double t5275;
  double t5274;
  double t5272;
  double t5270;
  double t5268;
  double t5266;
  double t5264;
  double t5262;
  double t5260;
  double t5258;
  double t5256;
  double t5254;
  double t5252;
  double t5250;
  double t5246;
  double t5244;
  double t5242;
  double t5240;
  double t5238;
  double t5236;
  double t5234;
  double t5232;
  double t5230;
  double t5228;
  double t5227;
  double t5225;
  double t5223;
  double t5221;
  double t5219;
  double t5217;
  double t5215;
  double t5213;
  double t5211;
  double t5209;
  double t5207;
  double t5206;
  double t5204;
  double t5203;
  double t5200;
  double t5199;
  double t5193;
  double t5188;
  double t5187;
  double t5184;
  double t5180;
  double t5177;
  double t5166;
  double t5150;
  double t5149;
  double t5144;
  double t5143;
  double t5141;
  double t5139;
  double t5137;
  double t5135;
  double t5133;
  double t5131;
  double t5129;
  double t5127;
  double t5125;
  double t5123;
  double t5121;
  double t5119;
  double t5117;
  double t5115;
  double t5112;
  double t5109;
  double t5106;
  double t5105;
  double t5098;
  double t5095;
  double t5092;
  double t5091;
  double t5088;
  double t5087;
  double t5086;
  double t5082;
  double t5079;
  double t5076;
  double t5075;
  double t5074;
  double t5070;
  double t5067;
  double t5064;
  double t5057;
  double t5051;
  double t5049;
  double t5047;
  double t5045;
  double t5043;
  double t5041;
  double t5029;
  double t5026;
  double t5023;
  double t5017;
  double t5015;
  double t5013;
  double t5011;
  double t5009;
  double t5007;
  double t5006;
  double t5000;
  double t4998;
  double t4996;
  double t4992;
  double t4990;
  double t4988;
  double t4986;
  double t4984;
  double t4982;
  double t4980;
  double t4978;
  double t4976;
  double t4974;
  double t4972;
  double t4970;
  double t4968;
  double t4966;
  double t4964;
  double t4962;
  double t4961;
  double t4960;
  double t4958;
  double t4954;
  double t4952;
  double t4950;
  double t4948;
  double t4946;
  double t4944;
  double t4942;
  double t4940;
  double t4938;
  double t4936;
  double t4934;
  double t4932;
  double t4930;
  double t4928;
  double t4926;
  double t4924;
  double t4923;
  double t4922;
  double t4917;
  double t4916;
  double t4912;
  double t4908;
  double t4904;
  double t4903;
  double t4899;
  double t4895;
  double t4891;
  double t4890;
  double t4889;
  double t4888;
  double t4886;
  double t4881;
  double t4880;
  double t4876;
  double t4874;
  double t4871;
  double t4870;
  double t4860;
  double t4859;
  double t4855;
  double t4850;
  double t4849;
  double t4844;
  double t4841;
  double t4840;
  double t4839;
  double t4835;
  double t4832;
  double t4829;
  double t4822;
  double t4816;
  double t4814;
  double t4812;
  double t4810;
  double t4808;
  double t4806;
  double t4794;
  double t4791;
  double t4788;
  double t4782;
  double t4780;
  double t4778;
  double t4776;
  double t4774;
  double t4772;
  double t4771;
  double t4765;
  double t4763;
  double t4761;
  double t4759;
  double t4757;
  double t4755;
  double t4753;
  double t4751;
  double t4749;
  double t4745;
  double t4743;
  double t4741;
  double t4739;
  double t4737;
  double t4735;
  double t4733;
  double t4731;
  double t4729;
  double t4727;
  double t4726;
  double t4725;
  double t4721;
  double t4719;
  double t4717;
  double t4715;
  double t4713;
  double t4711;
  double t4709;
  double t4707;
  double t4705;
  double t4703;
  double t4701;
  double t4699;
  double t4697;
  double t4695;
  double t4693;
  double t4691;
  double t4689;
  double t4688;
  double t4685;
  double t4684;
  double t4680;
  double t4665;
  double t4662;
  double t4659;
  double t4658;
  double t4656;
  double t4653;
  double t4649;
  double t4644;
  double t4641;
  double t4639;
  double t4637;
  double t4635;
  double t4633;
  double t4631;
  double t4629;
  double t4627;
  double t4625;
  double t4623;
  double t4621;
  double t4619;
  double t4618;
  double t4616;
  double t4614;
  double t4612;
  double t4610;
  double t4608;
  double t4606;
  double t4604;
  double t4602;
  double t4600;
  double t4598;
  double t4596;
  double t4594;
  double t4592;
  double t4590;
  double t4588;
  double t4586;
  double t4582;
  double t4580;
  double t4578;
  double t4576;
  double t4574;
  double t4572;
  double t4571;
  double t4569;
  double t4567;
  double t4565;
  double t4563;
  double t4561;
  double t4559;
  double t4557;
  double t4556;
  double t4554;
  double t4552;
  double t4550;
  double t4547;
  double t4545;
  double t4541;
  double t4538;
  double t4527;
  double t4511;
  double t4510;
  double t4505;
  double t4504;
  double t4502;
  double t4500;
  double t4498;
  double t4496;
  double t4494;
  double t4492;
  double t4490;
  double t4488;
  double t4486;
  double t4484;
  double t4482;
  double t4480;
  double t4478;
  double t4476;
  double t4473;
  double t4472;
  double t4467;
  double t4466;
  double t4462;
  double t4459;
  double t4455;
  double t4454;
  double t4450;
  double t4441;
  double t4440;
  double t4436;
  double t4435;
  double t4431;
  double tv2rho21;
  double t4426;
  double t4421;
  double t4414;
  double t4413;
  double t4412;
  double t4408;
  double t4405;
  double t4401;
  double t4397;
  double t4394;
  double t4391;
  double t4388;
  double t4386;
  double t4382;
  double t4378;
  double t4374;
  double t4367;
  double t4362;
  double t4359;
  double t4354;
  double t4352;
  double t4347;
  double t4345;
  double t4341;
  double t4337;
  double t4330;
  double t4328;
  double t4325;
  double t4322;
  double t4319;
  double t4316;
  double t4313;
  double t4310;
  double t4307;
  double t4304;
  double t4301;
  double t4298;
  double t4295;
  double t4292;
  double t4289;
  double t4286;
  double t4283;
  double t4280;
  double t4277;
  double t4274;
  double t4273;
  double t4269;
  double t4267;
  double t4265;
  double t4263;
  double t4261;
  double t4259;
  double t4257;
  double t4255;
  double t4253;
  double t4251;
  double t4249;
  double t4247;
  double t4245;
  double t4243;
  double t4241;
  double t4239;
  double t4237;
  double t4236;
  double t4233;
  double t4230;
  double t4227;
  double t4226;
  double t4222;
  double t4217;
  double t4207;
  double t4204;
  double t4199;
  double t4197;
  double t4196;
  double t4194;
  double t4192;
  double t4190;
  double t4188;
  double t4185;
  double t4182;
  double t4177;
  double t4174;
  double t4171;
  double t4168;
  double t4165;
  double t4162;
  double t4159;
  double t4156;
  double t4153;
  double t4150;
  double t4147;
  double t4144;
  double t4141;
  double t4140;
  double t4137;
  double t4134;
  double t4131;
  double t4128;
  double t4125;
  double t4122;
  double t4119;
  double t4116;
  double t4113;
  double t4110;
  double t4107;
  double t4105;
  double t4103;
  double t4101;
  double t4099;
  double t4097;
  double t4095;
  double t4093;
  double t4089;
  double t4087;
  double t4085;
  double t4083;
  double t4082;
  double t4080;
  double t4078;
  double t4076;
  double t4074;
  double t4072;
  double t4070;
  double t4068;
  double t4066;
  double t4064;
  double t4062;
  double t4060;
  double t4059;
  double t4056;
  double t4054;
  double t4050;
  double t4047;
  double t4041;
  double t4038;
  double t4035;
  double t4029;
  double t4028;
  double t4018;
  double t4015;
  double t4014;
  double t4010;
  double t4009;
  double t4007;
  double t4004;
  double t4002;
  double t3999;
  double t3997;
  double t3994;
  double t3992;
  double t3989;
  double t3987;
  double t3984;
  double t3982;
  double t3979;
  double t3977;
  double t3974;
  double t3971;
  double t3970;
  double t3965;
  double t3964;
  double t3960;
  double t3957;
  double t3953;
  double t3952;
  double t3950;
  double t3945;
  double t3944;
  double t3942;
  double t3940;
  double t3936;
  double t3934;
  double t3923;
  double t3921;
  double t3917;
  double t3916;
  double t3912;
  double t3908;
  double t3907;
  double t3902;
  double t3895;
  double t3894;
  double t3893;
  double t3889;
  double t3886;
  double t3883;
  double t3882;
  double t3878;
  double t3875;
  double t3872;
  double t3869;
  double t3867;
  double t3863;
  double t3859;
  double t3855;
  double t3848;
  double t3843;
  double t3840;
  double t3835;
  double t3833;
  double t3828;
  double t3826;
  double t3822;
  double t3818;
  double t3811;
  double t3809;
  double t3806;
  double t3803;
  double t3800;
  double t3797;
  double t3794;
  double t3791;
  double t3788;
  double t3785;
  double t3782;
  double t3779;
  double t3776;
  double t3773;
  double t3770;
  double t3767;
  double t3764;
  double t3761;
  double t3758;
  double t3755;
  double t3754;
  double t3752;
  double t3748;
  double t3746;
  double t3744;
  double t3742;
  double t3740;
  double t3738;
  double t3736;
  double t3734;
  double t3732;
  double t3730;
  double t3728;
  double t3726;
  double t3724;
  double t3722;
  double t3720;
  double t3718;
  double t3717;
  double t3714;
  double t3711;
  double t3708;
  double t3707;
  double t3703;
  double t3698;
  double t3688;
  double t3685;
  double t3680;
  double t3678;
  double t3677;
  double t3675;
  double t3673;
  double t3671;
  double t3669;
  double t3666;
  double t3663;
  double t3658;
  double t3655;
  double t3652;
  double t3649;
  double t3646;
  double t3643;
  double t3640;
  double t3637;
  double t3634;
  double t3631;
  double t3628;
  double t3625;
  double t3622;
  double t3621;
  double t3618;
  double t3615;
  double t3612;
  double t3609;
  double t3606;
  double t3603;
  double t3600;
  double t3597;
  double t3594;
  double t3591;
  double t3588;
  double t3586;
  double t3584;
  double t3582;
  double t3580;
  double t3578;
  double t3576;
  double t3574;
  double t3572;
  double t3570;
  double t3568;
  double t3566;
  double t3564;
  double t3563;
  double t3561;
  double t3559;
  double t3557;
  double t3555;
  double t3553;
  double t3551;
  double t3549;
  double t3547;
  double t3545;
  double t3543;
  double t3540;
  double t3537;
  double t3535;
  double t3531;
  double t3528;
  double t3522;
  double t3519;
  double t3516;
  double t3510;
  double t3509;
  double t3499;
  double t3496;
  double t3495;
  double t3491;
  double t3490;
  double t3488;
  double t3485;
  double t3483;
  double t3480;
  double t3478;
  double t3475;
  double t3473;
  double t3470;
  double t3468;
  double t3465;
  double t3463;
  double t3460;
  double t3458;
  double t3455;
  double t3452;
  double t3451;
  double t3446;
  double t3445;
  double t3441;
  double t3438;
  double t3434;
  double t3433;
  double t3429;
  double t3427;
  double t3421;
  double t3419;
  double t3408;
  double t3406;
  double t3402;
  double t3401;
  double t3397;
  double t3396;
  double t3393;
  double tv2rho20;
  double t3390;
  double t3385;
  double t3382;
  double t3381;
  double t3380;
  double t3376;
  double t3373;
  double t3370;
  double t3368;
  double t3367;
  double t3361;
  double t3355;
  double t3351;
  double t3347;
  double t3339;
  double t3336;
  double t3333;
  double t3332;
  double t3329;
  double t3326;
  double t3325;
  double t3324;
  double t3322;
  double t3320;
  double t3308;
  double t3304;
  double t3303;
  double t3297;
  double t3295;
  double t3292;
  double t3256;
  double t3255;
  double t3253;
  double t3251;
  double t3249;
  double t3245;
  double t3243;
  double t3241;
  double t3239;
  double t3237;
  double t3235;
  double t3233;
  double t3231;
  double t3229;
  double t3227;
  double t3225;
  double t3223;
  double t3221;
  double t3219;
  double t3218;
  double t3215;
  double t3214;
  double t3210;
  double t3197;
  double t3196;
  double t3192;
  double t3189;
  double t3188;
  double t3187;
  double t3185;
  double t3183;
  double t3182;
  double t3180;
  double t3177;
  double t3173;
  double t3170;
  double t3167;
  double t3164;
  double t3141;
  double t3120;
  double t3116;
  double t3114;
  double t3112;
  double t3110;
  double t3108;
  double t3106;
  double t3104;
  double t3102;
  double t3098;
  double t3096;
  double t3094;
  double t3092;
  double t3091;
  double t3089;
  double t3087;
  double t3085;
  double t3083;
  double t3081;
  double t3079;
  double t3077;
  double t3075;
  double t3073;
  double t3071;
  double t3069;
  double t3068;
  double t3066;
  double t3062;
  double t3059;
  double t3048;
  double t3047;
  double t3039;
  double t3031;
  double t3028;
  double t3027;
  double t3026;
  double t3024;
  double t3019;
  double t3018;
  double t3013;
  double t2985;
  double t2984;
  double t2979;
  double t2978;
  double t2974;
  double t2970;
  double t2969;
  double t2964;
  double t2963;
  double t2962;
  double t2959;
  double t2957;
  double t2956;
  double t2951;
  double t2949;
  double t2947;
  double t2944;
  double t2939;
  double t2937;
  double t2933;
  double t2932;
  double t2928;
  double t2925;
  double t2922;
  double t2921;
  double t2920;
  double t2919;
  double t2914;
  double t2911;
  double t2910;
  double t2909;
  double t2905;
  double t2902;
  double t2899;
  double t2897;
  double t2896;
  double t2890;
  double t2884;
  double t2880;
  double t2876;
  double t2868;
  double t2865;
  double t2862;
  double t2861;
  double t2858;
  double t2855;
  double t2854;
  double t2853;
  double t2851;
  double t2849;
  double t2837;
  double t2833;
  double t2832;
  double t2826;
  double t2824;
  double t2813;
  double t2785;
  double t2781;
  double t2752;
  double t2747;
  double t2744;
  double t2741;
  double t2738;
  double t2735;
  double t2734;
  double t2728;
  double t2725;
  double t2724;
  double t2720;
  double t2707;
  double t2706;
  double t2702;
  double t2699;
  double t2698;
  double t2697;
  double t2695;
  double t2693;
  double t2692;
  double t2690;
  double t2687;
  double t2683;
  double t2680;
  double t2677;
  double t2674;
  double t2670;
  double t2668;
  double t2666;
  double t2664;
  double t2662;
  double t2660;
  double t2658;
  double t2656;
  double t2654;
  double t2652;
  double t2651;
  double t2649;
  double t2647;
  double t2645;
  double t2643;
  double t2641;
  double t2639;
  double t2637;
  double t2635;
  double t2633;
  double t2631;
  double t2627;
  double t2622;
  double t2602;
  double t2581;
  double t2579;
  double t2578;
  double t2575;
  double t2574;
  double t2571;
  double t2567;
  double t2564;
  double t2553;
  double t2552;
  double t2544;
  double t2536;
  double t2533;
  double t2532;
  double t2531;
  double t2529;
  double t2524;
  double t2523;
  double t2518;
  double t2490;
  double t2489;
  double t2484;
  double t2483;
  double t2479;
  double t2476;
  double t2475;
  double t2470;
  double t2469;
  double t2468;
  double t2463;
  double t2459;
  double t2458;
  double t2454;
  double t2453;
  double t2452;
  double t2449;
  double t2447;
  double t2445;
  double t2443;
  double t2442;
  double t2439;
  double t2438;
  double t2434;
  double t2431;
  double t2430;
  double t2427;
  double t2418;
  double t2415;
  double t2412;
  double t2411;
  double t2410;
  double t2406;
  double t2404;
  double t2401;
  double t2400;
  double t2396;
  double t2395;
  double t2394;
  double t2393;
  double t2391;
  double t2389;
  double t2387;
  double t2384;
  double t2383;
  double t2377;
  double t2375;
  double t2371;
  double t2370;
  double t2366;
  double t2365;
  double t2363;
  double t2362;
  double t2361;
  double t2358;
  double t2357;
  double t2356;
  double tvtau1;
  double t2353;
  double t2350;
  double t2349;
  double t2348;
  double t2347;
  double t2346;
  double t2345;
  double tvtau0;
  double t2344;
  double t2341;
  double t2340;
  double t2339;
  double t2338;
  double t2337;
  double t2336;
  double tvlapl1;
  double tvlapl0;
  double tvsigma2;
  double t2335;
  double t2331;
  double t2328;
  double t2327;
  double t2324;
  double t2320;
  double t2319;
  double t2318;
  double t2314;
  double t2311;
  double t2308;
  double t2305;
  double t2303;
  double t2301;
  double t2299;
  double t2294;
  double t2292;
  double t2288;
  double t2286;
  double t2284;
  double t2281;
  double t2280;
  double t2278;
  double t2276;
  double t2274;
  double t2272;
  double t2270;
  double t2268;
  double t2266;
  double t2264;
  double t2262;
  double t2260;
  double t2258;
  double t2256;
  double t2254;
  double t2252;
  double t2250;
  double t2248;
  double t2246;
  double t2243;
  double t2240;
  double t2237;
  double t2234;
  double t2233;
  double t2229;
  double t2220;
  double t2218;
  double t2217;
  double t2214;
  double t2211;
  double t2209;
  double t2207;
  double t2205;
  double t2203;
  double t2201;
  double t2199;
  double t2197;
  double t2195;
  double t2193;
  double t2191;
  double t2189;
  double t2187;
  double t2186;
  double t2184;
  double t2182;
  double t2180;
  double t2178;
  double t2176;
  double t2174;
  double t2172;
  double t2170;
  double t2166;
  double t2164;
  double t2163;
  double t2159;
  double t2155;
  double t2152;
  double t2140;
  double t2137;
  double t2135;
  double t2133;
  double t2131;
  double t2129;
  double t2127;
  double t2125;
  double t2122;
  double t2121;
  double t2117;
  double t2116;
  double tvsigma1;
  double tvsigma0;
  double t2110;
  double t2106;
  double t2103;
  double t2102;
  double t2099;
  double t2095;
  double t2094;
  double t2093;
  double t2089;
  double t2086;
  double t2083;
  double t2080;
  double t2078;
  double t2076;
  double t2074;
  double t2069;
  double t2067;
  double t2063;
  double t2061;
  double t2059;
  double t2056;
  double t2055;
  double t2053;
  double t2051;
  double t2049;
  double t2047;
  double t2045;
  double t2043;
  double t2041;
  double t2039;
  double t2037;
  double t2035;
  double t2033;
  double t2031;
  double t2029;
  double t2027;
  double t2025;
  double t2023;
  double t2021;
  double t2018;
  double t2015;
  double t2012;
  double t2009;
  double t2008;
  double t2004;
  double t1995;
  double t1993;
  double t1992;
  double t1989;
  double t1986;
  double t1984;
  double t1982;
  double t1980;
  double t1978;
  double t1976;
  double t1974;
  double t1972;
  double t1970;
  double t1968;
  double t1966;
  double t1964;
  double t1962;
  double t1961;
  double t1959;
  double t1957;
  double t1955;
  double t1953;
  double t1951;
  double t1949;
  double t1947;
  double t1945;
  double t1941;
  double t1939;
  double t1938;
  double t1934;
  double t1930;
  double t1927;
  double t1915;
  double t1912;
  double t1910;
  double t1908;
  double t1906;
  double t1904;
  double t1902;
  double t1900;
  double t1897;
  double t1896;
  double t1892;
  double t1891;
  double tvrho1;
  double t1883;
  double t1878;
  double t1875;
  double t1874;
  double t1871;
  double t1868;
  double t1867;
  double t1866;
  double t1862;
  double t1859;
  double t1856;
  double t1853;
  double t1851;
  double t1849;
  double t1847;
  double t1842;
  double t1840;
  double t1836;
  double t1834;
  double t1832;
  double t1829;
  double t1828;
  double t1826;
  double t1824;
  double t1822;
  double t1820;
  double t1818;
  double t1816;
  double t1814;
  double t1812;
  double t1810;
  double t1808;
  double t1806;
  double t1804;
  double t1802;
  double t1800;
  double t1798;
  double t1796;
  double t1794;
  double t1791;
  double t1788;
  double t1787;
  double t1786;
  double t1784;
  double t1781;
  double t1780;
  double t1774;
  double t1773;
  double t1769;
  double t1760;
  double t1758;
  double t1757;
  double t1754;
  double t1751;
  double t1749;
  double t1747;
  double t1745;
  double t1743;
  double t1741;
  double t1739;
  double t1737;
  double t1735;
  double t1733;
  double t1731;
  double t1729;
  double t1727;
  double t1726;
  double t1724;
  double t1722;
  double t1720;
  double t1718;
  double t1716;
  double t1714;
  double t1712;
  double t1710;
  double t1706;
  double t1704;
  double t1703;
  double t1700;
  double t1699;
  double t1696;
  double t1692;
  double t1689;
  double t1677;
  double t1674;
  double t1672;
  double t1670;
  double t1668;
  double t1666;
  double t1664;
  double t1662;
  double t1659;
  double t1658;
  double t1653;
  double t1652;
  double t1649;
  double t1644;
  double t1643;
  double t1639;
  double t1637;
  double t1634;
  double t1633;
  double t1631;
  double t1630;
  double t1629;
  double t1624;
  double t1623;
  double t1620;
  double t1618;
  double t1613;
  double t1610;
  double t1609;
  double t1608;
  double t1604;
  double t1601;
  double t1598;
  double t1595;
  double t1593;
  double t1591;
  double t1589;
  double t1584;
  double t1582;
  double t1578;
  double t1576;
  double t1574;
  double t1571;
  double t1570;
  double t1568;
  double t1566;
  double t1564;
  double t1562;
  double t1560;
  double t1558;
  double t1556;
  double t1554;
  double t1552;
  double t1550;
  double t1548;
  double t1546;
  double t1544;
  double t1542;
  double t1540;
  double t1538;
  double t1536;
  double t1533;
  double t1530;
  double t1529;
  double t1525;
  double t1516;
  double t1514;
  double t1513;
  double t1510;
  double t1507;
  double t1505;
  double t1503;
  double t1501;
  double t1499;
  double t1497;
  double t1495;
  double t1493;
  double t1491;
  double t1489;
  double t1487;
  double t1485;
  double t1483;
  double t1482;
  double t1480;
  double t1478;
  double t1476;
  double t1474;
  double t1472;
  double t1470;
  double t1468;
  double t1466;
  double t1462;
  double t1460;
  double t1459;
  double t1457;
  double t1453;
  double t1450;
  double t1438;
  double t1435;
  double t1433;
  double t1431;
  double t1429;
  double t1427;
  double t1425;
  double t1423;
  double t1420;
  double t1419;
  double t1414;
  double t1413;
  double t1410;
  double t1406;
  double t1405;
  double t1402;
  double t1401;
  double tvrho0;
  double t1398;
  double t1393;
  double t1390;
  double t1389;
  double t1388;
  double t1384;
  double t1381;
  double t1380;
  double t1376;
  double t1373;
  double t1371;
  double t1369;
  double t1367;
  double t1364;
  double t1361;
  double t1360;
  double t1359;
  double t1357;
  double t1351;
  double t1349;
  double t1346;
  double t1345;
  double t1342;
  double t1338;
  double t1334;
  double t1330;
  double t1326;
  double t1322;
  double t1318;
  double t1314;
  double t1310;
  double t1306;
  double t1302;
  double t1298;
  double t1294;
  double t1293;
  double t1290;
  double t1289;
  double t1286;
  double t1285;
  double t1282;
  double t1281;
  double t1278;
  double t1277;
  double t1276;
  double t1273;
  double t1272;
  double t1271;
  double t1268;
  double t1267;
  double t1263;
  double t1260;
  double t1253;
  double t1252;
  double t1251;
  double t1249;
  double t1248;
  double t1246;
  double t1244;
  double t1241;
  double t1240;
  double t1238;
  double t1235;
  double t1231;
  double t1227;
  double t1223;
  double t1219;
  double t1215;
  double t1211;
  double t1207;
  double t1203;
  double t1199;
  double t1195;
  double t1193;
  double t1190;
  double t1186;
  double t1182;
  double t1181;
  double t1178;
  double t1175;
  double t1172;
  double t1171;
  double t1168;
  double t1167;
  double t1164;
  double t1161;
  double t1158;
  double t1156;
  double t1155;
  double t1154;
  double t1151;
  double t1150;
  double t1148;
  double t1147;
  double t1145;
  double t1141;
  double t1138;
  double t1133;
  double t1129;
  double t1128;
  double t1124;
  double t1122;
  double t1118;
  double t1114;
  double t1110;
  double t1106;
  double t1102;
  double t1098;
  double t1097;
  double t1094;
  double t1093;
  double t1090;
  double t1089;
  double t1084;
  double t1083;
  double t1080;
  double t1078;
  double t1077;
  double t1076;
  double t1075;
  double t1074;
  double t1073;
  double t1070;
  double t1069;
  double t1068;
  double t1065;
  double t1061;
  double t1060;
  double t1057;
  double t1055;
  double t1054;
  double t1049;
  double t1046;
  double t1045;
  double t1042;
  double t1039;
  double t1038;
  double t1037;
  double t1033;
  double t1030;
  double t1029;
  double t1025;
  double t1022;
  double t1020;
  double t1018;
  double t1016;
  double t1013;
  double t1010;
  double t1009;
  double t1008;
  double t1006;
  double t1000;
  double t998;
  double t995;
  double t994;
  double t991;
  double t987;
  double t983;
  double t979;
  double t975;
  double t971;
  double t967;
  double t963;
  double t959;
  double t955;
  double t951;
  double t947;
  double t943;
  double t942;
  double t939;
  double t938;
  double t935;
  double t934;
  double t931;
  double t930;
  double t927;
  double t926;
  double t925;
  double t922;
  double t921;
  double t920;
  double t917;
  double t916;
  double t915;
  double t913;
  double t910;
  double t909;
  double t903;
  double t902;
  double t898;
  double t895;
  double t888;
  double t887;
  double t886;
  double t884;
  double t883;
  double t881;
  double t879;
  double t876;
  double t875;
  double t873;
  double t870;
  double t866;
  double t862;
  double t858;
  double t854;
  double t850;
  double t846;
  double t842;
  double t838;
  double t834;
  double t830;
  double t828;
  double t825;
  double t821;
  double t817;
  double t816;
  double t813;
  double t810;
  double t807;
  double t806;
  double t803;
  double t802;
  double t799;
  double t796;
  double t793;
  double t791;
  double t790;
  double t789;
  double t786;
  double t785;
  double t783;
  double t782;
  double t779;
  double t778;
  double t775;
  double t771;
  double t768;
  double t763;
  double t759;
  double t758;
  double t754;
  double t752;
  double t748;
  double t744;
  double t740;
  double t736;
  double t732;
  double t728;
  double t727;
  double t724;
  double t723;
  double t720;
  double t719;
  double t714;
  double t713;
  double t710;
  double t709;
  double t708;
  double t707;
  double t706;
  double t705;
  double t701;
  double t700;
  double t696;
  double t694;
  double t691;
  double t690;
  double t688;
  double t687;
  double t686;
  double t684;
  double t683;
  double t682;
  double t679;
  double t678;
  double t676;
  double t675;
  double t674;
  double t671;
  double t670;
  double t669;
  double t665;
  double t664;
  double t661;
  double t660;
  double t659;
  double t658;
  double t657;
  double tzk0;
  double t656;
  double t652;
  double t649;
  double t648;
  double t647;
  double t646;
  double t642;
  double t639;
  double t637;
  double t635;
  double t631;
  double t629;
  double t625;
  double t623;
  double t622;
  double t620;
  double t619;
  double t617;
  double t615;
  double t614;
  double t612;
  double t611;
  double t609;
  double t608;
  double t606;
  double t603;
  double t600;
  double t597;
  double t596;
  double t594;
  double t591;
  double t588;
  double t585;
  double t582;
  double t579;
  double t576;
  double t573;
  double t572;
  double t570;
  double t569;
  double t567;
  double t566;
  double t564;
  double t563;
  double t561;
  double t560;
  double t558;
  double t557;
  double t554;
  double t553;
  double t552;
  double t551;
  double t550;
  double t547;
  double t546;
  double t545;
  double t544;
  double t543;
  double t539;
  double t537;
  double t533;
  double t530;
  double t528;
  double t524;
  double t521;
  double t520;
  double t519;
  double t517;
  double t516;
  double t514;
  double t512;
  double t509;
  double t506;
  double t503;
  double t500;
  double t497;
  double t495;
  double t492;
  double t489;
  double t486;
  double t483;
  double t481;
  double t479;
  double t476;
  double t475;
  double t473;
  double t471;
  double t469;
  double t467;
  double t466;
  double t464;
  double t462;
  double t458;
  double t456;
  double t455;
  double t453;
  double t451;
  double t450;
  double t449;
  double t448;
  double t447;
  double t446;
  double t445;
  double t444;
  double t443;
  double t441;
  double t440;
  double t439;
  double t435;
  double t432;
  double t429;
  double t428;
  double t426;
  double t425;
  double t423;
  double t421;
  double t420;
  double t417;
  double t416;
  double t414;
  double t411;
  double t408;
  double t405;
  double t404;
  double t402;
  double t401;
  double t399;
  double t398;
  double t395;
  double t394;
  double t393;
  double t392;
  double t391;
  double t390;
  double t389;
  double t386;
  double t385;
  double t384;
  double t383;
  double t382;
  double t381;
  double t380;
  double t379;
  double t378;
  double t377;
  double t373;
  double t371;
  double t370;
  double t369;
  double t366;
  double t365;
  double t363;
  double t362;
  double t361;
  double t360;
  double t359;
  double t357;
  double t356;
  double t355;
  double t354;
  double t352;
  double t351;
  double t350;
  double t346;
  double t343;
  double t342;
  double t341;
  double t340;
  double t336;
  double t333;
  double t331;
  double t329;
  double t325;
  double t323;
  double t319;
  double t317;
  double t316;
  double t314;
  double t313;
  double t311;
  double t309;
  double t308;
  double t306;
  double t305;
  double t303;
  double t302;
  double t300;
  double t297;
  double t294;
  double t291;
  double t290;
  double t288;
  double t285;
  double t282;
  double t279;
  double t276;
  double t273;
  double t270;
  double t267;
  double t266;
  double t264;
  double t263;
  double t261;
  double t260;
  double t258;
  double t257;
  double t255;
  double t254;
  double t252;
  double t251;
  double t248;
  double t247;
  double t246;
  double t245;
  double t244;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t235;
  double t231;
  double t229;
  double t225;
  double t222;
  double t220;
  double t216;
  double t213;
  double t212;
  double t211;
  double t209;
  double t208;
  double t206;
  double t204;
  double t201;
  double t198;
  double t195;
  double t192;
  double t189;
  double t187;
  double t184;
  double t181;
  double t178;
  double t175;
  double t173;
  double t171;
  double t168;
  double t167;
  double t165;
  double t163;
  double t161;
  double t159;
  double t158;
  double t156;
  double t154;
  double t150;
  double t148;
  double t147;
  double t145;
  double t143;
  double t142;
  double t141;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t135;
  double t133;
  double t132;
  double t131;
  double t127;
  double t124;
  double t121;
  double t120;
  double t118;
  double t117;
  double t115;
  double t113;
  double t112;
  double t111;
  double t108;
  double t107;
  double t105;
  double t102;
  double t99;
  double t96;
  double t95;
  double t93;
  double t92;
  double t90;
  double t89;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t80;
  double t77;
  double t76;
  double t75;
  double t74;
  double t73;
  double t72;
  double t71;
  double t70;
  double t68;
  double t66;
  double t65;
  double t64;
  double t60;
  double t58;
  double t57;
  double t56;
  double t55;
  double t54;
  double t52;
  double t49;
  double t48;
  double t46;
  double t45;
  double t44;
  double t43;
  double t42;
  double t41;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t12;
  double t11;
  double t8;
  double t7;
  double t6;
  double t4;
  double t3;
  double t2;
  double local_67a8;
  double local_67a0;
  double local_6798;
  double local_6790;
  double local_6788;
  double local_6780;
  double local_6778;
  double local_6770;
  double local_6768;
  double local_6760;
  double local_6758;
  double local_6750;
  double local_6748;
  double local_6740;
  double local_6738;
  double local_6730;
  double local_6728;
  double local_6720;
  double local_6718;
  double local_6710;
  double local_6708;
  double local_6700;
  double local_66f8;
  double local_66f0;
  double local_66e8;
  double local_66e0;
  double local_66d8;
  double local_66d0;
  double local_66c8;
  double local_66c0;
  double local_66b8;
  double local_66b0;
  double local_66a8;
  double local_66a0;
  double local_6698;
  double local_6690;
  double local_6688;
  double local_6680;
  double local_6678;
  double local_6670;
  double local_6668;
  double local_6660;
  double local_6658;
  double local_6650;
  double local_6648;
  double local_6640;
  double local_6638;
  double local_6630;
  double local_6628;
  double local_6620;
  double local_6618;
  double local_6610;
  double local_6608;
  double local_6600;
  double local_65f8;
  double local_65f0;
  double local_65e8;
  double local_65e0;
  double local_65d8;
  double local_65d0;
  double local_65c8;
  double local_65c0;
  double local_65b8;
  double local_65b0;
  double local_65a8;
  double local_65a0;
  double local_6598;
  double local_6590;
  double local_6588;
  double local_6580;
  double local_6578;
  double local_6570;
  double local_6568;
  double local_6560;
  double local_6558;
  double local_6550;
  double local_6548;
  double local_6540;
  double local_6538;
  double local_6530;
  double local_6528;
  double local_6520;
  double local_6518;
  double local_6510;
  double local_6508;
  double local_6500;
  double local_64f8;
  double local_64f0;
  double local_64e8;
  double local_64e0;
  double local_64d8;
  double local_64d0;
  double local_64c8;
  double local_64c0;
  double local_64b8;
  double local_64b0;
  double local_64a8;
  double local_64a0;
  double local_6498;
  double local_6490;
  double local_6488;
  double local_6480;
  double local_6478;
  double local_6470;
  double local_6468;
  double local_6460;
  double local_6458;
  double local_6450;
  double local_6448;
  double local_6440;
  double local_6438;
  double local_6430;
  double local_6428;
  double local_6420;
  double local_6418;
  double local_6410;
  double local_6408;
  double local_6400;
  double local_63f8;
  double local_63f0;
  double local_63e8;
  double local_63e0;
  double local_63d8;
  double local_63d0;
  double local_63c8;
  double local_63c0;
  double local_63b8;
  double local_63b0;
  double local_63a8;
  double local_63a0;
  double local_6398;
  double local_6390;
  double local_6388;
  double local_6380;
  double local_6378;
  double local_6370;
  double local_6368;
  double local_6360;
  double local_6358;
  double local_6350;
  double local_6348;
  double local_6340;
  double local_6338;
  double local_6330;
  double local_6328;
  double local_6320;
  double local_6318;
  double local_6310;
  double local_6308;
  double local_6300;
  double local_62f8;
  double local_62f0;
  double local_62e8;
  double local_62e0;
  double local_62d8;
  double local_62d0;
  double local_62c8;
  double local_62c0;
  double local_62b8;
  double local_62b0;
  double local_62a8;
  double local_62a0;
  double local_6298;
  double local_6290;
  double local_6288;
  double local_6280;
  double local_6278;
  double local_6270;
  double local_6268;
  double local_6260;
  double local_6258;
  double local_6250;
  double local_6248;
  double local_6240;
  double local_6238;
  double local_6230;
  double local_6228;
  double local_6220;
  double local_6218;
  double local_6210;
  double local_6208;
  double local_6200;
  double local_61f8;
  double local_61f0;
  double local_61e8;
  double local_61e0;
  double local_61d8;
  double local_61d0;
  double local_61c8;
  double local_61c0;
  double local_61b8;
  double local_61b0;
  double local_61a8;
  double local_61a0;
  double local_6198;
  double local_6190;
  double local_6188;
  double local_6180;
  double local_6178;
  double local_6170;
  double local_6168;
  double local_6160;
  double local_6158;
  double local_6150;
  double local_6148;
  double local_6140;
  double local_6138;
  double local_6130;
  double local_6128;
  double local_6120;
  double local_6118;
  double local_6110;
  double local_6108;
  double local_6100;
  double local_60f8;
  double local_60f0;
  double local_60e8;
  double local_60e0;
  double local_60d8;
  double local_60d0;
  double local_60c8;
  double local_60c0;
  double local_60b8;
  double local_60b0;
  double local_60a8;
  double local_60a0;
  double local_6098;
  double local_6090;
  double local_6088;
  double local_6080;
  double local_6078;
  double local_6070;
  double local_6068;
  double local_6060;
  double local_6058;
  double local_6050;
  double local_6048;
  double local_6040;
  double local_6038;
  double local_6030;
  double local_6028;
  double local_6020;
  double local_6018;
  double local_6010;
  double local_6008;
  double local_6000;
  double local_5ff8;
  double local_5ff0;
  double local_5fe8;
  double local_5fe0;
  double local_5fd8;
  double local_5fd0;
  double local_5fc8;
  double local_5fc0;
  double local_5fb8;
  double local_5fb0;
  double local_5fa8;
  double local_5fa0;
  double local_5f98;
  double local_5f90;
  double local_5f88;
  double local_5f80;
  double local_5f78;
  double local_5f70;
  double local_5f68;
  double local_5f60;
  double local_5f58;
  double local_5f50;
  double local_5f48;
  double local_5f40;
  double local_5f38;
  double local_5f30;
  double local_5f28;
  double local_5f20;
  double local_5f18;
  double local_5f10;
  double local_5f08;
  double local_5f00;
  double local_5ef8;
  double local_5ef0;
  double local_5ee8;
  double local_5ee0;
  double local_5ed8;
  double local_5ed0;
  double local_5ec8;
  double local_5ec0;
  double local_5eb8;
  double local_5eb0;
  double local_5ea8;
  double local_5ea0;
  double local_5e98;
  double local_5e90;
  double local_5e88;
  double local_5e80;
  double local_5e78;
  double local_5e70;
  double local_5e68;
  double local_5e60;
  double local_5e58;
  double local_5e50;
  
  dVar4 = (double)(*in_RDX <= (double)in_RDI[0x30]);
  __x = *in_RDX + in_RDX[1];
  local_6100 = 1.0 / __x;
  dVar5 = (double)(*in_RDX * 2.0 * local_6100 <= (double)in_RDI[0x31]);
  local_5ef0 = (double)in_RDI[0x31] - 1.0;
  dVar6 = (double)(in_RDX[1] * 2.0 * local_6100 <= (double)in_RDI[0x31]);
  local_5ef8 = -local_5ef0;
  dVar7 = *in_RDX - in_RDX[1];
  dVar8 = dVar7 * local_6100;
  local_5e50 = local_5ef0;
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    local_5e58 = local_5ef8;
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      local_5e58 = dVar8;
    }
    local_5e50 = local_5e58;
  }
  local_5e50 = local_5e50 + 1.0;
  dVar9 = (double)(local_5e50 <= (double)in_RDI[0x31]);
  local_5f00 = cbrt((double)in_RDI[0x31]);
  local_5ee8 = local_5f00 * (double)in_RDI[0x31];
  dVar10 = cbrt(local_5e50);
  local_5e60 = local_5ee8;
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    local_5e60 = dVar10 * local_5e50;
  }
  dVar11 = cbrt(__x);
  dVar12 = local_5e60 * dVar11;
  dVar13 = cbrt(9.0);
  dVar14 = cbrt(0.3183098861837907);
  dVar13 = dVar13 * dVar13 * dVar14 * dVar14;
  dVar14 = dVar13 * (double)in_RDI[4];
  dVar15 = 1.0 / dVar11;
  dVar16 = cbrt(9.869604401089358);
  dVar17 = 1.0 / (dVar16 * dVar16);
  dVar18 = dVar17 * 1.8171205928321397;
  dVar19 = *in_RDX * *in_RDX;
  dVar20 = cbrt(*in_RDX);
  dVar21 = dVar20 * dVar20;
  dVar22 = (1.0 / dVar21) / dVar19;
  dVar23 = *in_RCX * dVar22;
  dVar24 = ((1.0 / dVar16) / 9.869604401089358) * 3.3019272488946267;
  dVar25 = *in_RCX * *in_RCX;
  dVar26 = dVar19 * dVar19;
  dVar27 = (1.0 / dVar20) / (dVar26 * *in_RDX);
  dVar28 = dVar24 * 0.002689949046226295 * dVar25 * dVar27 +
           dVar18 * 0.1504548888888889 * dVar23 + 1.0;
  dVar29 = pow(dVar28,0.1);
  dVar30 = 1.0 / dVar29;
  dVar31 = (double)(dVar8 + 1.0 <= (double)in_RDI[0x31]);
  dVar32 = (double)(1.0 - dVar8 <= (double)in_RDI[0x31]);
  local_5e68 = local_5ef0;
  if ((dVar31 == 0.0) && (!NAN(dVar31))) {
    local_5e70 = local_5ef8;
    if ((dVar32 == 0.0) && (!NAN(dVar32))) {
      local_5e70 = dVar8;
    }
    local_5e68 = local_5e70;
  }
  local_5e68 = local_5e68 + 1.0;
  dVar33 = (double)(local_5e68 <= (double)in_RDI[0x31]);
  dVar34 = cbrt(local_5e68);
  local_5e78 = local_5f00;
  if ((dVar33 == 0.0) && (!NAN(dVar33))) {
    local_5e78 = dVar34;
  }
  dVar35 = 1.0 / local_5e78;
  dVar36 = dVar30 * dVar35;
  local_5e80 = (dVar14 * dVar15 * 1.4422495703074083 * dVar36) / 18.0;
  dVar37 = (double)(local_5e80 < 1e-10);
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_5e80 = 1e-10;
  }
  dVar38 = (double)(1.35 <= local_5e80);
  dVar39 = (double)(1.35 < local_5e80);
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_5e88 = local_5e80;
  }
  else {
    local_5e88 = 1.35;
  }
  dVar40 = local_5e88 * local_5e88;
  dVar41 = dVar40 * dVar40;
  dVar42 = 1.0 / dVar41;
  dVar43 = 1.0 / (dVar41 * dVar40);
  dVar44 = dVar41 * dVar41;
  dVar45 = 1.0 / dVar44;
  dVar46 = (1.0 / dVar44) / dVar40;
  dVar47 = (1.0 / dVar44) / dVar41;
  dVar48 = (1.0 / dVar44) / (dVar41 * dVar40);
  dVar49 = dVar44 * dVar44;
  dVar50 = 1.0 / dVar49;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_5e90 = 1.35;
  }
  else {
    local_5e90 = local_5e80;
  }
  dVar51 = sqrt(3.141592653589793);
  dVar52 = 1.0 / local_5e90;
  dVar53 = erf(dVar52 / 2.0);
  dVar54 = local_5e90 * local_5e90;
  dVar55 = 1.0 / dVar54;
  dVar56 = exp(-dVar55 / 4.0);
  dVar57 = dVar56 - 1.0;
  dVar58 = -(dVar54 * 2.0) * dVar57 + (dVar56 - 1.5);
  dVar53 = local_5e90 * 2.0 * dVar58 + dVar51 * dVar53;
  if ((dVar38 != 0.0) || (NAN(dVar38))) {
    local_5e98 = (((((((1.0 / dVar40) / 36.0 - dVar42 / 960.0) + dVar43 / 26880.0) -
                    dVar45 / 829440.0) + dVar46 / 28385280.0) - dVar47 / 1073479680.0) +
                 dVar48 / 44590694400.0) - dVar50 / 2021444812800.0;
  }
  else {
    local_5e98 = -(local_5e90 * 2.6666666666666665) * dVar53 + 1.0;
  }
  dVar59 = pow(dVar28,0.2);
  dVar60 = 1.0 / dVar59;
  dVar61 = (double)(0.27 <= local_5e80);
  dVar62 = (double)(0.27 < local_5e80);
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_5ea0 = local_5e80;
  }
  else {
    local_5ea0 = 0.27;
  }
  dVar63 = local_5ea0 * local_5ea0;
  dVar64 = dVar63 * dVar63;
  dVar65 = dVar64 * dVar64;
  dVar66 = dVar65 * dVar64;
  dVar67 = dVar65 * dVar65;
  dVar68 = dVar67 * dVar67;
  dVar69 = (1.0 / dVar68) / dVar66;
  dVar70 = dVar64 * dVar63;
  dVar71 = dVar65 * dVar70;
  dVar72 = (1.0 / dVar68) / dVar71;
  dVar73 = 1.0 / dVar70;
  dVar74 = 1.0 / dVar65;
  dVar75 = dVar65 * dVar63;
  dVar76 = 1.0 / dVar75;
  dVar77 = 1.0 / dVar66;
  dVar78 = 1.0 / dVar71;
  dVar79 = 1.0 / dVar67;
  dVar80 = 1.0 / (dVar67 * dVar63);
  dVar81 = (1.0 / dVar67) / dVar64;
  dVar82 = (1.0 / dVar67) / dVar70;
  dVar83 = (1.0 / dVar67) / dVar65;
  dVar84 = (1.0 / dVar67) / dVar75;
  dVar66 = (1.0 / dVar67) / dVar66;
  dVar71 = (1.0 / dVar67) / dVar71;
  dVar85 = 1.0 / dVar68;
  dVar86 = (1.0 / dVar68) / dVar63;
  dVar87 = (1.0 / dVar68) / dVar64;
  dVar70 = (1.0 / dVar68) / dVar70;
  dVar88 = (1.0 / dVar68) / dVar65;
  dVar75 = (1.0 / dVar68) / dVar75;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_5ea8 = 0.27;
  }
  else {
    local_5ea8 = local_5e80;
  }
  dVar89 = local_5ea8 * local_5ea8;
  dVar90 = dVar89 * dVar89;
  dVar91 = dVar89 * 20.0 + -(dVar90 * 64.0);
  dVar92 = exp((-1.0 / dVar89) / 4.0);
  dVar93 = erf((1.0 / local_5ea8) / 2.0);
  dVar94 = (dVar89 * -36.0 + dVar51 * 10.0 * local_5ea8 * dVar93 + dVar91 * dVar92 + dVar90 * 64.0)
           - 3.0;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_5eb0 = ((((((dVar74 * 3.804788961038961e-06 +
                      (((dVar69 / 3.3929038000650147e+37 - dVar72 / 3.511556992918352e+39) +
                       0.0013392857142857143 / dVar64) - dVar73 / 11520.0)) - dVar76 / 7454720.0) +
                    dVar77 / 247726080.0) - dVar78 / 9358540800.0) + dVar79 / 394474291200.0) -
                 dVar80 / 18311911833600.0) + dVar81 / 927028425523200.0 +
                 ((((((((((-dVar82 / 5.0785035485184e+16 + dVar83 / 2.991700272218112e+18) -
                         dVar84 / 1.88514051721003e+20) + dVar66 / 1.2648942844388573e+22) -
                       dVar71 / 9.002316741416457e+23) + dVar85 / 6.772652029299977e+25) -
                     dVar86 / 5.36974553751641e+27) + dVar87 / 4.474731034888079e+29) -
                   dVar70 / 3.909716563474291e+31) + dVar88 / 3.5738523369945735e+33) -
                 dVar75 / 3.410951160703658e+35);
  }
  else {
    local_5eb0 = dVar89 * 24.0 * dVar94 + 1.0;
  }
  dVar95 = (1.0 / dVar21) / *in_RDX;
  dVar16 = dVar16 * dVar16 * 0.14417005510442776;
  dVar96 = dVar23 * 0.04229627833333333 + *in_R9 * -0.14554132 * dVar95 + dVar16;
  dVar97 = local_5eb0 * dVar96;
  dVar98 = dVar59 * dVar59;
  dVar99 = 1.0 / dVar98;
  dVar100 = dVar18 * dVar99;
  dVar101 = (double)(0.32 <= local_5e80);
  dVar102 = (double)(0.32 < local_5e80);
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_5eb8 = local_5e80;
  }
  else {
    local_5eb8 = 0.32;
  }
  dVar103 = local_5eb8 * local_5eb8;
  dVar104 = dVar103 * dVar103;
  dVar105 = dVar104 * dVar103;
  dVar106 = 1.0 / dVar105;
  dVar107 = dVar104 * dVar104;
  dVar108 = 1.0 / dVar107;
  dVar109 = 1.0 / (dVar107 * dVar103);
  dVar110 = 1.0 / (dVar107 * dVar104);
  dVar111 = 1.0 / (dVar107 * dVar105);
  dVar112 = dVar107 * dVar107;
  dVar113 = 1.0 / dVar112;
  dVar114 = (1.0 / dVar112) / dVar103;
  dVar115 = (1.0 / dVar112) / dVar104;
  dVar116 = (1.0 / dVar112) / dVar105;
  dVar117 = (1.0 / dVar112) / dVar107;
  dVar118 = (1.0 / dVar112) / (dVar107 * dVar103);
  dVar119 = (1.0 / dVar112) / (dVar107 * dVar104);
  dVar120 = (1.0 / dVar112) / (dVar107 * dVar105);
  dVar121 = dVar112 * dVar112;
  dVar122 = 1.0 / dVar121;
  dVar123 = (1.0 / dVar121) / dVar103;
  dVar124 = (1.0 / dVar121) / dVar104;
  dVar105 = (1.0 / dVar121) / dVar105;
  local_5ec8 = (((((((((((((((dVar108 * 5.871587902837903e-07 +
                             (0.0003826530612244898 / dVar104 - dVar106 / 56448.0)) -
                            dVar109 / 61501440.0) + dVar110 / 2530344960.0) -
                          dVar111 / 115811942400.0) + dVar113 / 5811921223680.0) -
                        dVar114 / 316612955602944.0) + dVar115 / 1.85827061661696e+16) -
                      dVar116 / 1.168055816159232e+18) + dVar117 / 7.824446865801216e+19) -
                    dVar118 / 5.562511054710453e+21) + dVar119 / 4.181740504354862e+23) -
                  dVar120 / 3.3139778504339334e+25) + dVar122 / 2.7608516801793436e+27) -
                dVar123 / 2.4119107039344544e+29) + dVar124 / 2.2046293272414373e+31) -
               dVar105 / 2.1042094544618633e+33;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_5ec0 = 0.32;
  }
  else {
    local_5ec0 = local_5e80;
  }
  dVar125 = local_5ec0 * local_5ec0;
  dVar126 = dVar125 * local_5ec0;
  dVar127 = dVar125 * dVar125;
  dVar128 = dVar127 * local_5ec0;
  dVar129 = dVar127 * dVar126;
  dVar130 = dVar127 * dVar127;
  dVar131 = dVar130 * local_5ec0 * -122880.0 +
            dVar129 * 3840.0 + dVar128 * -576.0 + local_5ec0 * -8.0 + dVar126 * 256.0;
  dVar132 = 1.0 / dVar125;
  dVar133 = exp(-dVar132 / 4.0);
  dVar134 = dVar127 * dVar125;
  dVar135 = dVar134 * 5120.0 + dVar127 * -1440.0 + dVar125 * 224.0 + -35.0;
  dVar136 = dVar125 * 60.0 + -2.0;
  dVar137 = 1.0 / local_5ec0;
  dVar138 = erf(dVar137 / 2.0);
  dVar139 = dVar131 * dVar133 + dVar51 * 2.0 * dVar136 * dVar138 + dVar126 * 24.0 * dVar135;
  if ((dVar101 == 0.0) && (!NAN(dVar101))) {
    local_5ec8 = local_5ec0 * 1.1428571428571428 * dVar139 + 1.0;
  }
  dVar140 = local_5ec8 * 1.8171205928321397;
  dVar141 = dVar140 * dVar17;
  dVar142 = dVar23 * dVar99;
  dVar143 = dVar141 * 0.026329605555555555 * dVar142 +
            local_5e98 * dVar60 + dVar97 * 0.43209876543209874 * dVar100;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_5ed0 = 0.0;
  }
  else {
    local_5ed0 = dVar12 * -0.36927938319101117 * dVar143;
  }
  dVar144 = (double)(in_RDX[1] <= (double)in_RDI[0x30]);
  dVar2 = -dVar7;
  local_5ed8 = local_5ef0;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    local_5ee0 = local_5ef8;
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      local_5ee0 = dVar2 * local_6100;
    }
    local_5ed8 = local_5ee0;
  }
  local_5ed8 = local_5ed8 + 1.0;
  dVar145 = (double)(local_5ed8 <= (double)in_RDI[0x31]);
  dVar146 = cbrt(local_5ed8);
  if ((dVar145 == 0.0) && (!NAN(dVar145))) {
    local_5ee8 = dVar146 * local_5ed8;
  }
  dVar147 = local_5ee8 * dVar11;
  dVar148 = in_RDX[1] * in_RDX[1];
  dVar149 = cbrt(in_RDX[1]);
  dVar150 = dVar149 * dVar149;
  dVar151 = (1.0 / dVar150) / dVar148;
  dVar152 = in_RCX[2] * dVar151;
  dVar153 = in_RCX[2] * in_RCX[2];
  dVar154 = dVar148 * dVar148;
  dVar155 = (1.0 / dVar149) / (dVar154 * in_RDX[1]);
  dVar156 = dVar24 * 0.002689949046226295 * dVar153 * dVar155 +
            dVar18 * 0.1504548888888889 * dVar152 + 1.0;
  dVar157 = pow(dVar156,0.1);
  dVar158 = 1.0 / dVar157;
  if ((dVar32 == 0.0) && (!NAN(dVar32))) {
    if ((dVar31 == 0.0) && (!NAN(dVar31))) {
      local_5ef8 = -dVar8;
    }
    local_5ef0 = local_5ef8;
  }
  local_5ef0 = local_5ef0 + 1.0;
  dVar8 = (double)(local_5ef0 <= (double)in_RDI[0x31]);
  dVar159 = cbrt(local_5ef0);
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_5f00 = dVar159;
  }
  dVar160 = 1.0 / local_5f00;
  dVar161 = dVar158 * dVar160;
  local_5f08 = (dVar14 * dVar15 * 1.4422495703074083 * dVar161) / 18.0;
  dVar162 = (double)(local_5f08 < 1e-10);
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_5f08 = 1e-10;
  }
  dVar163 = (double)(1.35 <= local_5f08);
  dVar164 = (double)(1.35 < local_5f08);
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_5f10 = local_5f08;
  }
  else {
    local_5f10 = 1.35;
  }
  dVar165 = local_5f10 * local_5f10;
  dVar166 = dVar165 * dVar165;
  dVar167 = 1.0 / dVar166;
  dVar168 = 1.0 / (dVar166 * dVar165);
  dVar169 = dVar166 * dVar166;
  dVar170 = 1.0 / dVar169;
  dVar171 = (1.0 / dVar169) / dVar165;
  dVar172 = (1.0 / dVar169) / dVar166;
  dVar173 = (1.0 / dVar169) / (dVar166 * dVar165);
  dVar174 = dVar169 * dVar169;
  dVar175 = 1.0 / dVar174;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_5f18 = 1.35;
  }
  else {
    local_5f18 = local_5f08;
  }
  dVar176 = 1.0 / local_5f18;
  dVar177 = erf(dVar176 / 2.0);
  dVar178 = local_5f18 * local_5f18;
  dVar179 = 1.0 / dVar178;
  dVar180 = exp(-dVar179 / 4.0);
  dVar181 = dVar180 - 1.0;
  dVar182 = -(dVar178 * 2.0) * dVar181 + (dVar180 - 1.5);
  dVar177 = dVar51 * dVar177 + local_5f18 * 2.0 * dVar182;
  if ((dVar163 != 0.0) || (NAN(dVar163))) {
    local_5f20 = (((((((1.0 / dVar165) / 36.0 - dVar167 / 960.0) + dVar168 / 26880.0) -
                    dVar170 / 829440.0) + dVar171 / 28385280.0) - dVar172 / 1073479680.0) +
                 dVar173 / 44590694400.0) - dVar175 / 2021444812800.0;
  }
  else {
    local_5f20 = -(local_5f18 * 2.6666666666666665) * dVar177 + 1.0;
  }
  dVar183 = pow(dVar156,0.2);
  dVar184 = 1.0 / dVar183;
  dVar185 = (double)(0.27 <= local_5f08);
  dVar186 = (double)(0.27 < local_5f08);
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_5f28 = local_5f08;
  }
  else {
    local_5f28 = 0.27;
  }
  dVar187 = local_5f28 * local_5f28;
  dVar188 = dVar187 * dVar187;
  dVar189 = dVar188 * dVar188;
  dVar190 = dVar189 * dVar188;
  dVar191 = dVar189 * dVar189;
  dVar192 = dVar191 * dVar191;
  dVar193 = (1.0 / dVar192) / dVar190;
  dVar194 = dVar188 * dVar187;
  dVar195 = dVar189 * dVar194;
  dVar196 = (1.0 / dVar192) / dVar195;
  dVar197 = 1.0 / dVar194;
  dVar198 = 1.0 / dVar189;
  dVar199 = dVar189 * dVar187;
  dVar200 = 1.0 / dVar199;
  dVar201 = 1.0 / dVar190;
  dVar202 = 1.0 / dVar195;
  dVar203 = 1.0 / dVar191;
  dVar204 = 1.0 / (dVar191 * dVar187);
  dVar205 = (1.0 / dVar191) / dVar188;
  dVar206 = (1.0 / dVar191) / dVar194;
  dVar207 = (1.0 / dVar191) / dVar189;
  dVar208 = (1.0 / dVar191) / dVar199;
  dVar190 = (1.0 / dVar191) / dVar190;
  dVar195 = (1.0 / dVar191) / dVar195;
  dVar209 = 1.0 / dVar192;
  dVar210 = (1.0 / dVar192) / dVar187;
  dVar211 = (1.0 / dVar192) / dVar188;
  dVar194 = (1.0 / dVar192) / dVar194;
  dVar212 = (1.0 / dVar192) / dVar189;
  dVar199 = (1.0 / dVar192) / dVar199;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_5f30 = 0.27;
  }
  else {
    local_5f30 = local_5f08;
  }
  dVar213 = local_5f30 * local_5f30;
  dVar214 = dVar213 * dVar213;
  dVar215 = dVar213 * 20.0 + -(dVar214 * 64.0);
  dVar216 = exp((-1.0 / dVar213) / 4.0);
  dVar217 = erf((1.0 / local_5f30) / 2.0);
  dVar218 = (dVar213 * -36.0 + dVar51 * 10.0 * local_5f30 * dVar217 + dVar215 * dVar216 +
            dVar214 * 64.0) - 3.0;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_5f38 = ((((((dVar198 * 3.804788961038961e-06 +
                      (((dVar193 / 3.3929038000650147e+37 - dVar196 / 3.511556992918352e+39) +
                       0.0013392857142857143 / dVar188) - dVar197 / 11520.0)) - dVar200 / 7454720.0)
                    + dVar201 / 247726080.0) - dVar202 / 9358540800.0) + dVar203 / 394474291200.0) -
                 dVar204 / 18311911833600.0) + dVar205 / 927028425523200.0 +
                 ((((((((((-dVar206 / 5.0785035485184e+16 + dVar207 / 2.991700272218112e+18) -
                         dVar208 / 1.88514051721003e+20) + dVar190 / 1.2648942844388573e+22) -
                       dVar195 / 9.002316741416457e+23) + dVar209 / 6.772652029299977e+25) -
                     dVar210 / 5.36974553751641e+27) + dVar211 / 4.474731034888079e+29) -
                   dVar194 / 3.909716563474291e+31) + dVar212 / 3.5738523369945735e+33) -
                 dVar199 / 3.410951160703658e+35);
  }
  else {
    local_5f38 = dVar213 * 24.0 * dVar218 + 1.0;
  }
  dVar219 = (1.0 / dVar150) / in_RDX[1];
  dVar16 = dVar152 * 0.04229627833333333 + in_R9[1] * -0.14554132 * dVar219 + dVar16;
  dVar220 = local_5f38 * dVar16;
  dVar221 = dVar183 * dVar183;
  dVar222 = 1.0 / dVar221;
  dVar223 = dVar18 * dVar222;
  dVar224 = (double)(0.32 <= local_5f08);
  dVar225 = (double)(0.32 < local_5f08);
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_5f40 = local_5f08;
  }
  else {
    local_5f40 = 0.32;
  }
  dVar226 = local_5f40 * local_5f40;
  dVar227 = dVar226 * dVar226;
  dVar228 = dVar227 * dVar226;
  dVar229 = 1.0 / dVar228;
  dVar230 = dVar227 * dVar227;
  dVar231 = 1.0 / dVar230;
  dVar232 = 1.0 / (dVar230 * dVar226);
  dVar233 = 1.0 / (dVar230 * dVar227);
  dVar234 = 1.0 / (dVar230 * dVar228);
  dVar235 = dVar230 * dVar230;
  dVar236 = 1.0 / dVar235;
  dVar237 = (1.0 / dVar235) / dVar226;
  dVar238 = (1.0 / dVar235) / dVar227;
  dVar239 = (1.0 / dVar235) / dVar228;
  dVar240 = (1.0 / dVar235) / dVar230;
  dVar241 = (1.0 / dVar235) / (dVar230 * dVar226);
  dVar242 = (1.0 / dVar235) / (dVar230 * dVar227);
  dVar243 = (1.0 / dVar235) / (dVar230 * dVar228);
  dVar244 = dVar235 * dVar235;
  dVar245 = 1.0 / dVar244;
  dVar246 = (1.0 / dVar244) / dVar226;
  dVar247 = (1.0 / dVar244) / dVar227;
  dVar228 = (1.0 / dVar244) / dVar228;
  local_5f50 = (((((((((((((((dVar231 * 5.871587902837903e-07 +
                             (0.0003826530612244898 / dVar227 - dVar229 / 56448.0)) -
                            dVar232 / 61501440.0) + dVar233 / 2530344960.0) -
                          dVar234 / 115811942400.0) + dVar236 / 5811921223680.0) -
                        dVar237 / 316612955602944.0) + dVar238 / 1.85827061661696e+16) -
                      dVar239 / 1.168055816159232e+18) + dVar240 / 7.824446865801216e+19) -
                    dVar241 / 5.562511054710453e+21) + dVar242 / 4.181740504354862e+23) -
                  dVar243 / 3.3139778504339334e+25) + dVar245 / 2.7608516801793436e+27) -
                dVar246 / 2.4119107039344544e+29) + dVar247 / 2.2046293272414373e+31) -
               dVar228 / 2.1042094544618633e+33;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_5f48 = 0.32;
  }
  else {
    local_5f48 = local_5f08;
  }
  dVar248 = local_5f48 * local_5f48;
  dVar249 = dVar248 * local_5f48;
  dVar250 = dVar248 * dVar248;
  dVar251 = dVar250 * local_5f48;
  dVar252 = dVar250 * dVar249;
  dVar253 = dVar250 * dVar250;
  dVar254 = dVar253 * local_5f48 * -122880.0 +
            dVar252 * 3840.0 + dVar251 * -576.0 + local_5f48 * -8.0 + dVar249 * 256.0;
  dVar255 = 1.0 / dVar248;
  dVar256 = exp(-dVar255 / 4.0);
  dVar257 = dVar250 * dVar248;
  dVar258 = dVar257 * 5120.0 + dVar250 * -1440.0 + dVar248 * 224.0 + -35.0;
  dVar259 = dVar248 * 60.0 + -2.0;
  dVar260 = 1.0 / local_5f48;
  dVar261 = erf(dVar260 / 2.0);
  dVar262 = dVar254 * dVar256 + dVar51 * 2.0 * dVar259 * dVar261 + dVar249 * 24.0 * dVar258;
  if ((dVar224 == 0.0) && (!NAN(dVar224))) {
    local_5f50 = local_5f48 * 1.1428571428571428 * dVar262 + 1.0;
  }
  dVar263 = local_5f50 * 1.8171205928321397;
  dVar264 = dVar263 * dVar17;
  dVar265 = dVar152 * dVar222;
  dVar266 = dVar264 * 0.026329605555555555 * dVar265 +
            local_5f20 * dVar184 + dVar220 * 0.43209876543209874 * dVar223;
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_5f58 = 0.0;
  }
  else {
    local_5f58 = dVar147 * -0.36927938319101117 * dVar266;
  }
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_5ed0 + local_5f58 + *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  dVar267 = __x * __x;
  dVar268 = 1.0 / dVar267;
  local_6008 = local_6100 - dVar7 * dVar268;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_5f60 = 0.0;
  }
  else {
    if ((dVar6 != 0.0) || (local_5f68 = local_6008, NAN(dVar6))) {
      local_5f68 = 0.0;
    }
    local_5f60 = local_5f68;
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_5f70 = 0.0;
  }
  else {
    local_5f70 = dVar10 * 1.3333333333333333 * local_5f60;
  }
  dVar269 = local_5f70 * dVar11;
  dVar270 = 1.0 / (dVar11 * dVar11);
  dVar271 = local_5e60 * dVar270;
  dVar272 = (dVar271 * 0.9847450218426964 * dVar143) / 8.0;
  dVar273 = dVar40 * local_5e88;
  dVar274 = 1.0 / dVar273;
  dVar275 = (1.0 / dVar11) / __x;
  dVar276 = (dVar14 * dVar275 * 1.4422495703074083 * dVar36) / 54.0;
  dVar1 = (double)in_RDI[4];
  dVar277 = dVar13 * dVar1 * 1.4422495703074083;
  dVar278 = (1.0 / dVar29) / dVar28;
  dVar279 = dVar15 * dVar278;
  dVar519 = *in_RDX;
  dVar280 = (1.0 / dVar21) / (dVar19 * dVar519);
  dVar281 = *in_RCX * dVar280;
  dVar282 = (1.0 / dVar20) / (dVar26 * dVar19);
  dVar283 = dVar18 * -0.40121303703703703 * dVar281 +
            -(dVar24 * 0.014346394913206906 * dVar25 * dVar282);
  dVar284 = dVar15 * dVar30;
  dVar285 = 1.0 / (local_5e78 * local_5e78);
  dVar286 = 1.0 / (dVar34 * dVar34);
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    local_5f78 = 0.0;
  }
  else {
    if ((dVar32 != 0.0) || (local_5f80 = local_6008, NAN(dVar32))) {
      local_5f80 = 0.0;
    }
    local_5f78 = local_5f80;
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    local_5f88 = 0.0;
  }
  else {
    local_5f88 = (dVar286 * local_5f78) / 3.0;
  }
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_5f90 = 0.0;
  }
  else {
    local_5f90 = (-dVar276 - (dVar277 * dVar279 * dVar35 * dVar283) / 180.0) -
                 (dVar277 * dVar284 * dVar285 * local_5f88) / 18.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_5f98 = local_5f90;
  }
  else {
    local_5f98 = 0.0;
  }
  dVar287 = 1.0 / (dVar41 * local_5e88);
  dVar288 = 1.0 / (dVar41 * dVar273);
  dVar289 = (1.0 / dVar44) / local_5e88;
  dVar290 = (1.0 / dVar44) / dVar273;
  dVar291 = (1.0 / dVar44) / (dVar41 * local_5e88);
  dVar41 = (1.0 / dVar44) / (dVar41 * dVar273);
  local_5e88 = (1.0 / dVar49) / local_5e88;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_5fa0 = 0.0;
  }
  else {
    local_5fa0 = local_5f90;
  }
  dVar44 = dVar56 * dVar55;
  dVar273 = 1.0 / (dVar54 * local_5e90);
  dVar292 = local_5e90 * dVar57;
  dVar293 = -(dVar52 * local_5fa0) * dVar56 +
            -(dVar292 * 4.0) * local_5fa0 + (dVar273 * local_5fa0 * dVar56) / 2.0;
  dVar294 = -local_5fa0 * dVar44 + local_5e90 * 2.0 * dVar293 + dVar58 * 2.0 * local_5fa0;
  if ((dVar38 != 0.0) || (NAN(dVar38))) {
    local_5fa8 = (((((((-dVar274 * local_5f98) / 18.0 + (dVar287 * local_5f98) / 240.0) -
                     (dVar288 * local_5f98) / 4480.0) + (dVar289 * local_5f98) / 103680.0) -
                   (dVar290 * local_5f98) / 2838528.0) + (dVar291 * local_5f98) / 89456640.0) -
                 (dVar41 * local_5f98) / 3185049600.0) + (local_5e88 * local_5f98) / 126340300800.0;
  }
  else {
    local_5fa8 = local_5e90 * -2.6666666666666665 * dVar294 +
                 -(local_5fa0 * 2.6666666666666665 * dVar53);
  }
  dVar295 = (1.0 / dVar59) / dVar28;
  dVar296 = local_5e98 * dVar295;
  dVar297 = dVar64 * local_5ea0;
  dVar298 = dVar65 * dVar297;
  dVar299 = (1.0 / dVar68) / dVar298;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_5fb0 = local_5f90;
  }
  else {
    local_5fb0 = 0.0;
  }
  dVar63 = dVar63 * local_5ea0;
  dVar64 = dVar64 * dVar63;
  dVar300 = dVar65 * dVar64;
  dVar301 = (1.0 / dVar68) / dVar300;
  dVar302 = 1.0 / dVar297;
  dVar303 = 1.0 / dVar64;
  dVar304 = dVar65 * local_5ea0;
  dVar305 = 1.0 / dVar304;
  dVar65 = dVar65 * dVar63;
  dVar306 = 1.0 / dVar65;
  dVar307 = 1.0 / dVar298;
  dVar308 = 1.0 / dVar300;
  dVar309 = 1.0 / (dVar67 * local_5ea0);
  dVar310 = (1.0 / dVar67) / dVar63;
  dVar311 = (1.0 / dVar67) / dVar297;
  dVar312 = (1.0 / dVar67) / dVar64;
  dVar313 = (1.0 / dVar67) / dVar304;
  dVar314 = (1.0 / dVar67) / dVar65;
  dVar298 = (1.0 / dVar67) / dVar298;
  dVar300 = (1.0 / dVar67) / dVar300;
  local_5ea0 = (1.0 / dVar68) / local_5ea0;
  dVar63 = (1.0 / dVar68) / dVar63;
  dVar297 = (1.0 / dVar68) / dVar297;
  dVar64 = (1.0 / dVar68) / dVar64;
  dVar304 = (1.0 / dVar68) / dVar304;
  dVar65 = (1.0 / dVar68) / dVar65;
  dVar315 = local_5ea8 * dVar94;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_5fb8 = 0.0;
  }
  else {
    local_5fb8 = local_5f90;
  }
  dVar316 = dVar89 * local_5ea8;
  dVar317 = dVar316 * 256.0 * local_5fb8;
  dVar318 = local_5ea8 * local_5fb8 * 40.0 + -dVar317;
  dVar319 = 1.0 / dVar316;
  dVar320 = dVar91 * dVar319;
  dVar321 = local_5fb8 * dVar92;
  dVar322 = (1.0 / local_5ea8) * dVar92;
  dVar317 = -(dVar322 * 10.0) * local_5fb8 +
            local_5fb8 * 10.0 * dVar51 * dVar93 +
            local_5ea8 * local_5fb8 * -72.0 + dVar318 * dVar92 + (dVar320 * dVar321) / 2.0 + dVar317
  ;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_5fc0 = ((((((-(dVar305 * 3.0438311688311688e-05) * local_5fb0 +
                       -(dVar302 * 0.005357142857142857) * local_5fb0 +
                       (-dVar299 * local_5fb0) / 7.71114500014776e+35 +
                       (dVar301 * local_5fb0) / 7.633819549822504e+37 +
                       (dVar303 * local_5fb0) / 1920.0 + (dVar306 * local_5fb0) / 745472.0) -
                     (dVar307 * local_5fb0) / 20643840.0) + (dVar308 * local_5fb0) / 668467200.0) -
                   (dVar309 * local_5fb0) / 24654643200.0) +
                  (dVar310 * local_5fb0) / 1017328435200.0) -
                 (dVar311 * local_5fb0) / 46351421276160.0) +
                 ((((((((((dVar312 * local_5fb0) / 2.308410703872e+15 -
                         (dVar313 * local_5fb0) / 1.24654178009088e+17) +
                        (dVar314 * local_5fb0) / 7.250540450807808e+18) -
                       (dVar298 * local_5fb0) / 4.517479587281633e+20) +
                      (dVar300 * local_5fb0) / 3.000772247138819e+22) -
                     (local_5ea0 * local_5fb0) / 2.116453759156243e+24) +
                    (dVar63 * local_5fb0) / 1.5793369227989443e+26) -
                   (dVar297 * local_5fb0) / 1.2429808430244664e+28) +
                  (dVar64 * local_5fb0) / 1.0288727798616555e+30) -
                 (dVar304 * local_5fb0) / 8.934630842486435e+31) +
                 (dVar65 * local_5fb0) / 8.121312287389663e+33;
  }
  else {
    local_5fc0 = dVar89 * 24.0 * dVar317 + dVar315 * 48.0 * local_5fb8;
  }
  dVar323 = *in_R9 * 0.24256886666666666 * dVar22 + -(dVar281 * 0.11279007555555555);
  dVar324 = dVar97 * 1.8171205928321397;
  dVar325 = (1.0 / dVar98) / dVar28;
  dVar326 = dVar17 * dVar325;
  dVar327 = dVar326 * dVar283;
  dVar328 = dVar104 * local_5eb8;
  dVar329 = 1.0 / dVar328;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_5fc8 = local_5f90;
  }
  else {
    local_5fc8 = 0.0;
  }
  dVar103 = dVar103 * local_5eb8;
  dVar104 = dVar104 * dVar103;
  dVar330 = 1.0 / dVar104;
  dVar331 = 1.0 / (dVar107 * local_5eb8);
  dVar332 = 1.0 / (dVar107 * dVar103);
  dVar333 = 1.0 / (dVar107 * dVar328);
  dVar334 = 1.0 / (dVar107 * dVar104);
  dVar335 = (1.0 / dVar112) / local_5eb8;
  dVar336 = (1.0 / dVar112) / dVar103;
  dVar337 = (1.0 / dVar112) / dVar328;
  dVar338 = (1.0 / dVar112) / dVar104;
  dVar339 = (1.0 / dVar112) / (dVar107 * local_5eb8);
  dVar340 = (1.0 / dVar112) / (dVar107 * dVar103);
  dVar341 = (1.0 / dVar112) / (dVar107 * dVar328);
  dVar112 = (1.0 / dVar112) / (dVar107 * dVar104);
  local_5eb8 = (1.0 / dVar121) / local_5eb8;
  dVar103 = (1.0 / dVar121) / dVar103;
  dVar328 = (1.0 / dVar121) / dVar328;
  dVar104 = (1.0 / dVar121) / dVar104;
  local_5fd8 = ((((((((((((((-(dVar331 * 4.6972703222703225e-06) * local_5fc8 +
                             dVar329 * -0.001530612244897959 * local_5fc8 +
                             (dVar330 * local_5fc8) / 9408.0 + (dVar332 * local_5fc8) / 6150144.0) -
                           (dVar333 * local_5fc8) / 210862080.0) +
                          (dVar334 * local_5fc8) / 8272281600.0) -
                         (dVar335 * local_5fc8) / 363245076480.0) +
                        (dVar336 * local_5fc8) / 17589608644608.0) -
                       (dVar337 * local_5fc8) / 929135308308480.0) +
                      (dVar338 * local_5fc8) / 5.3093446189056e+16) -
                     (dVar339 * local_5fc8) / 3.26018619408384e+18) +
                    (dVar340 * local_5fc8) / 2.1394273287347896e+20) -
                   (dVar341 * local_5fc8) / 1.493478751555308e+22) +
                  (dVar112 * local_5fc8) / 1.1046592834779778e+24) -
                 (local_5eb8 * local_5fc8) / 8.627661500560449e+25) +
                (dVar103 * local_5fc8) / 7.093855011571925e+27) -
               (dVar328 * local_5fc8) / 6.123970353448437e+29) +
               (dVar104 * local_5fc8) / 5.53739330121543e+31;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_5fd0 = 0.0;
  }
  else {
    local_5fd0 = local_5f90;
  }
  dVar342 = dVar125 * local_5fd0 * 768.0 +
            local_5fd0 * -8.0 +
            dVar127 * local_5fd0 * -2880.0 +
            dVar130 * -1105920.0 * local_5fd0 + dVar134 * 26880.0 * local_5fd0;
  dVar343 = 1.0 / dVar126;
  dVar344 = dVar131 * dVar343;
  dVar345 = local_5fd0 * dVar133;
  dVar346 = dVar125 * dVar135;
  dVar347 = dVar128 * local_5fd0 * 30720.0 +
            local_5ec0 * local_5fd0 * 448.0 + -(dVar126 * local_5fd0 * 5760.0);
  dVar348 = dVar51 * local_5ec0;
  dVar349 = dVar136 * dVar133;
  dVar350 = -(dVar349 * 2.0) * dVar132 * local_5fd0 +
            dVar348 * 240.0 * local_5fd0 * dVar138 +
            dVar126 * 24.0 * dVar347 +
            dVar346 * 72.0 * local_5fd0 + dVar342 * dVar133 + (dVar344 * dVar345) / 2.0;
  if ((dVar101 == 0.0) && (!NAN(dVar101))) {
    local_5fd8 = local_5ec0 * 1.1428571428571428 * dVar350 +
                 local_5fd0 * 1.1428571428571428 * dVar139;
  }
  dVar351 = local_5fd8 * 1.8171205928321397 * dVar17;
  dVar352 = dVar281 * dVar99;
  dVar353 = dVar23 * dVar325 * dVar283;
  dVar354 = -(dVar141 * 0.010531842222222223) * dVar353 +
            -(dVar141 * 0.07021228148148148) * dVar352 +
            dVar351 * 0.026329605555555555 * dVar142 +
            -(dVar324 * 0.1728395061728395) * dVar327 +
            local_5eb0 * dVar323 * 0.43209876543209874 * dVar100 +
            local_5fc0 * dVar96 * 0.43209876543209874 * dVar100 +
            local_5fa8 * dVar60 + -((dVar296 * dVar283) / 5.0);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_5fe0 = 0.0;
  }
  else {
    local_5fe0 = -(dVar12 * 0.36927938319101117) * dVar354 +
                 dVar269 * -0.36927938319101117 * dVar143 + -dVar272;
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_5fe8 = 0.0;
  }
  else {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_5ff0 = 0.0;
    }
    else {
      local_5ff0 = -local_6100 - dVar2 * dVar268;
    }
    local_5fe8 = local_5ff0;
  }
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_5ff8 = 0.0;
  }
  else {
    local_5ff8 = dVar146 * 1.3333333333333333 * local_5fe8;
  }
  dVar355 = local_5ff8 * dVar11;
  dVar356 = local_5ee8 * dVar270;
  dVar357 = (dVar356 * 0.9847450218426964 * dVar266) / 8.0;
  dVar358 = dVar165 * local_5f10;
  dVar359 = 1.0 / dVar358;
  dVar360 = (dVar14 * dVar275 * 1.4422495703074083 * dVar161) / 54.0;
  dVar361 = dVar15 * dVar158;
  dVar362 = 1.0 / (local_5f00 * local_5f00);
  dVar363 = 1.0 / (dVar159 * dVar159);
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    local_6000 = 0.0;
  }
  else {
    if ((dVar31 != 0.0) || (NAN(dVar31))) {
      local_6008 = 0.0;
    }
    else {
      local_6008 = -local_6008;
    }
    local_6000 = local_6008;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_6010 = 0.0;
  }
  else {
    local_6010 = (dVar363 * local_6000) / 3.0;
  }
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6018 = 0.0;
  }
  else {
    local_6018 = -dVar360 - (dVar277 * dVar361 * dVar362 * local_6010) / 18.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6020 = local_6018;
  }
  else {
    local_6020 = 0.0;
  }
  dVar364 = 1.0 / (dVar166 * local_5f10);
  dVar365 = 1.0 / (dVar166 * dVar358);
  dVar366 = (1.0 / dVar169) / local_5f10;
  dVar367 = (1.0 / dVar169) / dVar358;
  dVar368 = (1.0 / dVar169) / (dVar166 * local_5f10);
  dVar166 = (1.0 / dVar169) / (dVar166 * dVar358);
  local_5f10 = (1.0 / dVar174) / local_5f10;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6028 = 0.0;
  }
  else {
    local_6028 = local_6018;
  }
  dVar169 = dVar180 * dVar179;
  dVar358 = 1.0 / (dVar178 * local_5f18);
  dVar369 = local_5f18 * dVar181;
  dVar370 = -(dVar176 * local_6028) * dVar180 +
            -(dVar369 * 4.0) * local_6028 + (dVar358 * local_6028 * dVar180) / 2.0;
  dVar371 = dVar370 * 2.0 * local_5f18 + -local_6028 * dVar169 + local_6028 * 2.0 * dVar182;
  if ((dVar163 != 0.0) || (NAN(dVar163))) {
    local_6030 = (((((((-dVar359 * local_6020) / 18.0 + (dVar364 * local_6020) / 240.0) -
                     (dVar365 * local_6020) / 4480.0) + (dVar366 * local_6020) / 103680.0) -
                   (dVar367 * local_6020) / 2838528.0) + (dVar368 * local_6020) / 89456640.0) -
                 (dVar166 * local_6020) / 3185049600.0) + (local_5f10 * local_6020) / 126340300800.0
    ;
  }
  else {
    local_6030 = local_6028 * -2.6666666666666665 * dVar177 +
                 -(local_5f18 * 2.6666666666666665 * dVar371);
  }
  dVar372 = dVar188 * local_5f28;
  dVar373 = dVar189 * dVar372;
  dVar374 = (1.0 / dVar192) / dVar373;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6038 = local_6018;
  }
  else {
    local_6038 = 0.0;
  }
  dVar187 = dVar187 * local_5f28;
  dVar188 = dVar188 * dVar187;
  dVar375 = dVar189 * dVar188;
  dVar376 = (1.0 / dVar192) / dVar375;
  dVar377 = 1.0 / dVar372;
  dVar378 = 1.0 / dVar188;
  dVar379 = dVar189 * local_5f28;
  dVar380 = 1.0 / dVar379;
  dVar189 = dVar189 * dVar187;
  dVar381 = 1.0 / dVar189;
  dVar382 = 1.0 / dVar373;
  dVar383 = 1.0 / dVar375;
  dVar384 = 1.0 / (dVar191 * local_5f28);
  dVar385 = (1.0 / dVar191) / dVar187;
  dVar386 = (1.0 / dVar191) / dVar372;
  dVar387 = (1.0 / dVar191) / dVar188;
  dVar388 = (1.0 / dVar191) / dVar379;
  dVar389 = (1.0 / dVar191) / dVar189;
  dVar373 = (1.0 / dVar191) / dVar373;
  dVar375 = (1.0 / dVar191) / dVar375;
  local_5f28 = (1.0 / dVar192) / local_5f28;
  dVar187 = (1.0 / dVar192) / dVar187;
  dVar372 = (1.0 / dVar192) / dVar372;
  dVar188 = (1.0 / dVar192) / dVar188;
  dVar379 = (1.0 / dVar192) / dVar379;
  dVar189 = (1.0 / dVar192) / dVar189;
  dVar390 = local_5f30 * dVar218;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6040 = 0.0;
  }
  else {
    local_6040 = local_6018;
  }
  dVar391 = dVar213 * local_5f30;
  dVar392 = dVar391 * 256.0 * local_6040;
  dVar393 = local_5f30 * local_6040 * 40.0 + -dVar392;
  dVar394 = 1.0 / dVar391;
  dVar395 = dVar215 * dVar394;
  dVar396 = local_6040 * dVar216;
  dVar397 = (1.0 / local_5f30) * dVar216;
  dVar392 = -(dVar397 * 10.0) * local_6040 +
            local_6040 * 10.0 * dVar51 * dVar217 +
            local_5f30 * local_6040 * -72.0 + dVar393 * dVar216 + (dVar395 * dVar396) / 2.0 +
            dVar392;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6048 = ((((((-(dVar380 * 3.0438311688311688e-05) * local_6038 +
                       -(dVar377 * 0.005357142857142857) * local_6038 +
                       (-dVar374 * local_6038) / 7.71114500014776e+35 +
                       (dVar376 * local_6038) / 7.633819549822504e+37 +
                       (dVar378 * local_6038) / 1920.0 + (dVar381 * local_6038) / 745472.0) -
                     (dVar382 * local_6038) / 20643840.0) + (dVar383 * local_6038) / 668467200.0) -
                   (dVar384 * local_6038) / 24654643200.0) +
                  (dVar385 * local_6038) / 1017328435200.0) -
                 (dVar386 * local_6038) / 46351421276160.0) +
                 ((((((((((dVar387 * local_6038) / 2.308410703872e+15 -
                         (dVar388 * local_6038) / 1.24654178009088e+17) +
                        (dVar389 * local_6038) / 7.250540450807808e+18) -
                       (dVar373 * local_6038) / 4.517479587281633e+20) +
                      (dVar375 * local_6038) / 3.000772247138819e+22) -
                     (local_5f28 * local_6038) / 2.116453759156243e+24) +
                    (dVar187 * local_6038) / 1.5793369227989443e+26) -
                   (dVar372 * local_6038) / 1.2429808430244664e+28) +
                  (dVar188 * local_6038) / 1.0288727798616555e+30) -
                 (dVar379 * local_6038) / 8.934630842486435e+31) +
                 (dVar189 * local_6038) / 8.121312287389663e+33;
  }
  else {
    local_6048 = dVar390 * 48.0 * local_6040 + dVar392 * 24.0 * dVar213;
  }
  dVar398 = dVar227 * local_5f40;
  dVar399 = 1.0 / dVar398;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6050 = local_6018;
  }
  else {
    local_6050 = 0.0;
  }
  dVar226 = dVar226 * local_5f40;
  dVar227 = dVar227 * dVar226;
  dVar400 = 1.0 / dVar227;
  dVar401 = 1.0 / (dVar230 * local_5f40);
  dVar402 = 1.0 / (dVar230 * dVar226);
  dVar403 = 1.0 / (dVar230 * dVar398);
  dVar404 = 1.0 / (dVar230 * dVar227);
  dVar405 = (1.0 / dVar235) / local_5f40;
  dVar406 = (1.0 / dVar235) / dVar226;
  dVar407 = (1.0 / dVar235) / dVar398;
  dVar408 = (1.0 / dVar235) / dVar227;
  dVar409 = (1.0 / dVar235) / (dVar230 * local_5f40);
  dVar410 = (1.0 / dVar235) / (dVar230 * dVar226);
  dVar411 = (1.0 / dVar235) / (dVar230 * dVar398);
  dVar235 = (1.0 / dVar235) / (dVar230 * dVar227);
  local_5f40 = (1.0 / dVar244) / local_5f40;
  dVar226 = (1.0 / dVar244) / dVar226;
  dVar398 = (1.0 / dVar244) / dVar398;
  dVar227 = (1.0 / dVar244) / dVar227;
  local_6060 = ((((((((((((((-(dVar401 * 4.6972703222703225e-06) * local_6050 +
                             dVar399 * -0.001530612244897959 * local_6050 +
                             (dVar400 * local_6050) / 9408.0 + (dVar402 * local_6050) / 6150144.0) -
                           (dVar403 * local_6050) / 210862080.0) +
                          (dVar404 * local_6050) / 8272281600.0) -
                         (dVar405 * local_6050) / 363245076480.0) +
                        (dVar406 * local_6050) / 17589608644608.0) -
                       (dVar407 * local_6050) / 929135308308480.0) +
                      (dVar408 * local_6050) / 5.3093446189056e+16) -
                     (dVar409 * local_6050) / 3.26018619408384e+18) +
                    (dVar410 * local_6050) / 2.1394273287347896e+20) -
                   (dVar411 * local_6050) / 1.493478751555308e+22) +
                  (dVar235 * local_6050) / 1.1046592834779778e+24) -
                 (local_5f40 * local_6050) / 8.627661500560449e+25) +
                (dVar226 * local_6050) / 7.093855011571925e+27) -
               (dVar398 * local_6050) / 6.123970353448437e+29) +
               (dVar227 * local_6050) / 5.53739330121543e+31;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6058 = 0.0;
  }
  else {
    local_6058 = local_6018;
  }
  dVar412 = dVar250 * local_6058 * -2880.0 +
            dVar248 * local_6058 * 768.0 +
            local_6058 * -8.0 + local_6058 * -1105920.0 * dVar253 + local_6058 * 26880.0 * dVar257;
  dVar413 = 1.0 / dVar249;
  dVar414 = dVar254 * dVar413;
  dVar415 = local_6058 * dVar256;
  dVar416 = dVar248 * dVar258;
  dVar417 = dVar251 * local_6058 * 30720.0 +
            local_5f48 * local_6058 * 448.0 + -(dVar249 * local_6058 * 5760.0);
  dVar418 = dVar51 * local_5f48;
  dVar419 = dVar259 * dVar256;
  dVar420 = -(dVar419 * 2.0) * dVar255 * local_6058 +
            dVar418 * 240.0 * local_6058 * dVar261 +
            dVar249 * 24.0 * dVar417 +
            dVar416 * 72.0 * local_6058 + dVar412 * dVar256 + (dVar414 * dVar415) / 2.0;
  if ((dVar224 == 0.0) && (!NAN(dVar224))) {
    local_6060 = local_6058 * 1.1428571428571428 * dVar262 +
                 local_5f48 * 1.1428571428571428 * dVar420;
  }
  dVar421 = local_6060 * 1.8171205928321397 * dVar17;
  dVar422 = dVar421 * 0.026329605555555555 * dVar265 +
            local_6030 * dVar184 + local_6048 * dVar16 * 0.43209876543209874 * dVar223;
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6068 = 0.0;
  }
  else {
    local_6068 = -(dVar147 * 0.36927938319101117) * dVar422 +
                 dVar355 * -0.36927938319101117 * dVar266 + -dVar357;
  }
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar3 * 8) =
         __x * (local_5fe0 + local_6068) + local_5ed0 + local_5f58 +
         *(double *)(in_stack_00000008[1] + lVar3 * 8);
  }
  local_6118 = -local_6100 - dVar7 * dVar268;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_6070 = 0.0;
  }
  else {
    if ((dVar6 != 0.0) || (local_6078 = local_6118, NAN(dVar6))) {
      local_6078 = 0.0;
    }
    local_6070 = local_6078;
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_6080 = 0.0;
  }
  else {
    local_6080 = dVar10 * 1.3333333333333333 * local_6070;
  }
  dVar423 = local_6080 * dVar11;
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    local_6088 = 0.0;
  }
  else {
    if ((dVar32 != 0.0) || (local_6090 = local_6118, NAN(dVar32))) {
      local_6090 = 0.0;
    }
    local_6088 = local_6090;
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    local_6098 = 0.0;
  }
  else {
    local_6098 = (dVar286 * local_6088) / 3.0;
  }
  dVar424 = dVar285 * local_6098;
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_60a0 = 0.0;
  }
  else {
    local_60a0 = -dVar276 - (dVar277 * dVar284 * dVar424) / 18.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_60a8 = local_60a0;
  }
  else {
    local_60a8 = 0.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_60b0 = 0.0;
  }
  else {
    local_60b0 = local_60a0;
  }
  dVar276 = -(dVar52 * local_60b0) * dVar56 +
            -(dVar292 * 4.0) * local_60b0 + (dVar273 * local_60b0 * dVar56) / 2.0;
  dVar425 = -local_60b0 * dVar44 + local_5e90 * 2.0 * dVar276 + dVar58 * 2.0 * local_60b0;
  if ((dVar38 != 0.0) || (NAN(dVar38))) {
    local_60b8 = (((((((-dVar274 * local_60a8) / 18.0 + (dVar287 * local_60a8) / 240.0) -
                     (dVar288 * local_60a8) / 4480.0) + (dVar289 * local_60a8) / 103680.0) -
                   (dVar290 * local_60a8) / 2838528.0) + (dVar291 * local_60a8) / 89456640.0) -
                 (dVar41 * local_60a8) / 3185049600.0) + (local_5e88 * local_60a8) / 126340300800.0;
  }
  else {
    local_60b8 = local_5e90 * -2.6666666666666665 * dVar425 +
                 -(local_60b0 * 2.6666666666666665 * dVar53);
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_60c0 = local_60a0;
  }
  else {
    local_60c0 = 0.0;
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_60c8 = 0.0;
  }
  else {
    local_60c8 = local_60a0;
  }
  dVar426 = dVar316 * 256.0 * local_60c8;
  dVar427 = local_5ea8 * local_60c8 * 40.0 + -dVar426;
  dVar428 = local_60c8 * dVar92;
  dVar426 = -(dVar322 * 10.0) * local_60c8 +
            local_60c8 * 10.0 * dVar51 * dVar93 +
            local_5ea8 * local_60c8 * -72.0 + dVar427 * dVar92 + (dVar320 * dVar428) / 2.0 + dVar426
  ;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_60d0 = ((((((dVar305 * local_60c0 * -3.0438311688311688e-05 +
                       -(dVar302 * 0.005357142857142857) * local_60c0 +
                       -(dVar299 * local_60c0) / 7.71114500014776e+35 +
                       (dVar301 * local_60c0) / 7.633819549822504e+37 +
                       (dVar303 * local_60c0) / 1920.0 + (dVar306 * local_60c0) / 745472.0) -
                     (dVar307 * local_60c0) / 20643840.0) + (dVar308 * local_60c0) / 668467200.0) -
                   (dVar309 * local_60c0) / 24654643200.0) +
                  (dVar310 * local_60c0) / 1017328435200.0) -
                 (dVar311 * local_60c0) / 46351421276160.0) +
                 ((((((((((dVar312 * local_60c0) / 2.308410703872e+15 -
                         (dVar313 * local_60c0) / 1.24654178009088e+17) +
                        (dVar314 * local_60c0) / 7.250540450807808e+18) -
                       (dVar298 * local_60c0) / 4.517479587281633e+20) +
                      (dVar300 * local_60c0) / 3.000772247138819e+22) -
                     (local_5ea0 * local_60c0) / 2.116453759156243e+24) +
                    (dVar63 * local_60c0) / 1.5793369227989443e+26) -
                   (dVar297 * local_60c0) / 1.2429808430244664e+28) +
                  (dVar64 * local_60c0) / 1.0288727798616555e+30) -
                 (dVar304 * local_60c0) / 8.934630842486435e+31) +
                 (dVar65 * local_60c0) / 8.121312287389663e+33;
  }
  else {
    local_60d0 = local_60c8 * 48.0 * dVar315 + dVar426 * 24.0 * dVar89;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_60d8 = local_60a0;
  }
  else {
    local_60d8 = 0.0;
  }
  local_60e8 = ((((((((((((((dVar331 * local_60d8 * -4.6972703222703225e-06 +
                             dVar329 * -0.001530612244897959 * local_60d8 +
                             (dVar330 * local_60d8) / 9408.0 + (dVar332 * local_60d8) / 6150144.0) -
                           (dVar333 * local_60d8) / 210862080.0) +
                          (dVar334 * local_60d8) / 8272281600.0) -
                         (dVar335 * local_60d8) / 363245076480.0) +
                        (dVar336 * local_60d8) / 17589608644608.0) -
                       (dVar337 * local_60d8) / 929135308308480.0) +
                      (dVar338 * local_60d8) / 5.3093446189056e+16) -
                     (dVar339 * local_60d8) / 3.26018619408384e+18) +
                    (dVar340 * local_60d8) / 2.1394273287347896e+20) -
                   (dVar341 * local_60d8) / 1.493478751555308e+22) +
                  (dVar112 * local_60d8) / 1.1046592834779778e+24) -
                 (local_5eb8 * local_60d8) / 8.627661500560449e+25) +
                (dVar103 * local_60d8) / 7.093855011571925e+27) -
               (dVar328 * local_60d8) / 6.123970353448437e+29) +
               (dVar104 * local_60d8) / 5.53739330121543e+31;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_60e0 = 0.0;
  }
  else {
    local_60e0 = local_60a0;
  }
  dVar429 = dVar134 * local_60e0 * 26880.0 +
            dVar127 * local_60e0 * -2880.0 +
            dVar125 * local_60e0 * 768.0 + local_60e0 * -1105920.0 * dVar130 + -(local_60e0 * 8.0);
  dVar430 = local_60e0 * dVar133;
  dVar431 = dVar128 * local_60e0 * 30720.0 +
            local_5ec0 * local_60e0 * 448.0 + -(dVar126 * local_60e0 * 5760.0);
  dVar432 = -(dVar349 * 2.0) * dVar132 * local_60e0 +
            dVar348 * 240.0 * local_60e0 * dVar138 +
            dVar126 * 24.0 * dVar431 +
            dVar346 * 72.0 * local_60e0 + dVar429 * dVar133 + (dVar344 * dVar430) / 2.0;
  if ((dVar101 == 0.0) && (!NAN(dVar101))) {
    local_60e8 = local_60e0 * 1.1428571428571428 * dVar139 +
                 local_5ec0 * 1.1428571428571428 * dVar432;
  }
  dVar433 = local_60e8 * 1.8171205928321397 * dVar17;
  dVar434 = dVar433 * 0.026329605555555555 * dVar142 +
            local_60b8 * dVar60 + local_60d0 * dVar96 * 0.43209876543209874 * dVar100;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_60f0 = 0.0;
  }
  else {
    local_60f0 = -(dVar12 * 0.36927938319101117) * dVar434 +
                 dVar423 * -0.36927938319101117 * dVar143 + -dVar272;
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_60f8 = 0.0;
  }
  else {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_6100 = 0.0;
    }
    else {
      local_6100 = local_6100 - dVar2 * dVar268;
    }
    local_60f8 = local_6100;
  }
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_6108 = 0.0;
  }
  else {
    local_6108 = dVar146 * 1.3333333333333333 * local_60f8;
  }
  dVar435 = local_6108 * dVar11;
  dVar436 = (1.0 / dVar157) / dVar156;
  dVar437 = dVar15 * dVar436;
  dVar272 = in_RDX[1];
  dVar438 = (1.0 / dVar150) / (dVar148 * dVar272);
  dVar439 = in_RCX[2] * dVar438;
  dVar440 = (1.0 / dVar149) / (dVar154 * dVar148);
  dVar441 = dVar18 * -0.40121303703703703 * dVar439 +
            -(dVar24 * 0.014346394913206906 * dVar153 * dVar440);
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    local_6110 = 0.0;
  }
  else {
    if ((dVar31 != 0.0) || (NAN(dVar31))) {
      local_6118 = 0.0;
    }
    else {
      local_6118 = -local_6118;
    }
    local_6110 = local_6118;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_6120 = 0.0;
  }
  else {
    local_6120 = (dVar363 * local_6110) / 3.0;
  }
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6128 = 0.0;
  }
  else {
    local_6128 = (-dVar360 - (dVar277 * dVar437 * dVar160 * dVar441) / 180.0) -
                 (dVar277 * dVar361 * dVar362 * local_6120) / 18.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6130 = local_6128;
  }
  else {
    local_6130 = 0.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6138 = 0.0;
  }
  else {
    local_6138 = local_6128;
  }
  dVar360 = -(dVar176 * local_6138) * dVar180 +
            -(dVar369 * 4.0) * local_6138 + (dVar358 * local_6138 * dVar180) / 2.0;
  dVar442 = dVar360 * 2.0 * local_5f18 + -dVar169 * local_6138 + local_6138 * 2.0 * dVar182;
  if ((dVar163 != 0.0) || (NAN(dVar163))) {
    local_6140 = (((((((-dVar359 * local_6130) / 18.0 + (dVar364 * local_6130) / 240.0) -
                     (dVar365 * local_6130) / 4480.0) + (dVar366 * local_6130) / 103680.0) -
                   (dVar367 * local_6130) / 2838528.0) + (dVar368 * local_6130) / 89456640.0) -
                 (dVar166 * local_6130) / 3185049600.0) + (local_5f10 * local_6130) / 126340300800.0
    ;
  }
  else {
    local_6140 = local_6138 * -2.6666666666666665 * dVar177 +
                 -(local_5f18 * 2.6666666666666665 * dVar442);
  }
  dVar443 = (1.0 / dVar183) / dVar156;
  dVar444 = local_5f20 * dVar443;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6148 = local_6128;
  }
  else {
    local_6148 = 0.0;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6150 = 0.0;
  }
  else {
    local_6150 = local_6128;
  }
  dVar445 = dVar391 * 256.0 * local_6150;
  dVar446 = local_5f30 * local_6150 * 40.0 + -dVar445;
  dVar447 = local_6150 * dVar216;
  dVar445 = -(dVar397 * 10.0) * local_6150 +
            local_6150 * 10.0 * dVar51 * dVar217 +
            local_5f30 * local_6150 * -72.0 + dVar446 * dVar216 + (dVar395 * dVar447) / 2.0 +
            dVar445;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6158 = ((((((dVar380 * local_6148 * -3.0438311688311688e-05 +
                       -(dVar377 * 0.005357142857142857) * local_6148 +
                       -(dVar374 * local_6148) / 7.71114500014776e+35 +
                       (dVar376 * local_6148) / 7.633819549822504e+37 +
                       (dVar378 * local_6148) / 1920.0 + (dVar381 * local_6148) / 745472.0) -
                     (dVar382 * local_6148) / 20643840.0) + (dVar383 * local_6148) / 668467200.0) -
                   (dVar384 * local_6148) / 24654643200.0) +
                  (dVar385 * local_6148) / 1017328435200.0) -
                 (dVar386 * local_6148) / 46351421276160.0) +
                 ((((((((((dVar387 * local_6148) / 2.308410703872e+15 -
                         (dVar388 * local_6148) / 1.24654178009088e+17) +
                        (dVar389 * local_6148) / 7.250540450807808e+18) -
                       (dVar373 * local_6148) / 4.517479587281633e+20) +
                      (dVar375 * local_6148) / 3.000772247138819e+22) -
                     (local_5f28 * local_6148) / 2.116453759156243e+24) +
                    (dVar187 * local_6148) / 1.5793369227989443e+26) -
                   (dVar372 * local_6148) / 1.2429808430244664e+28) +
                  (dVar188 * local_6148) / 1.0288727798616555e+30) -
                 (dVar379 * local_6148) / 8.934630842486435e+31) +
                 (dVar189 * local_6148) / 8.121312287389663e+33;
  }
  else {
    local_6158 = dVar390 * 48.0 * local_6150 + dVar445 * 24.0 * dVar213;
  }
  dVar448 = in_R9[1] * 0.24256886666666666 * dVar151 + -(dVar439 * 0.11279007555555555);
  dVar449 = dVar220 * 1.8171205928321397;
  dVar450 = (1.0 / dVar221) / dVar156;
  dVar451 = dVar17 * dVar450;
  dVar452 = dVar451 * dVar441;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6160 = local_6128;
  }
  else {
    local_6160 = 0.0;
  }
  local_6170 = ((((((((((((((dVar401 * local_6160 * -4.6972703222703225e-06 +
                             dVar399 * -0.001530612244897959 * local_6160 +
                             (dVar400 * local_6160) / 9408.0 + (dVar402 * local_6160) / 6150144.0) -
                           (dVar403 * local_6160) / 210862080.0) +
                          (dVar404 * local_6160) / 8272281600.0) -
                         (dVar405 * local_6160) / 363245076480.0) +
                        (dVar406 * local_6160) / 17589608644608.0) -
                       (dVar407 * local_6160) / 929135308308480.0) +
                      (dVar408 * local_6160) / 5.3093446189056e+16) -
                     (dVar409 * local_6160) / 3.26018619408384e+18) +
                    (dVar410 * local_6160) / 2.1394273287347896e+20) -
                   (dVar411 * local_6160) / 1.493478751555308e+22) +
                  (dVar235 * local_6160) / 1.1046592834779778e+24) -
                 (local_5f40 * local_6160) / 8.627661500560449e+25) +
                (dVar226 * local_6160) / 7.093855011571925e+27) -
               (dVar398 * local_6160) / 6.123970353448437e+29) +
               (dVar227 * local_6160) / 5.53739330121543e+31;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6168 = 0.0;
  }
  else {
    local_6168 = local_6128;
  }
  dVar453 = dVar257 * local_6168 * 26880.0 +
            dVar250 * local_6168 * -2880.0 +
            dVar248 * local_6168 * 768.0 + local_6168 * -1105920.0 * dVar253 + -(local_6168 * 8.0);
  dVar454 = local_6168 * dVar256;
  dVar455 = dVar251 * local_6168 * 30720.0 +
            local_5f48 * local_6168 * 448.0 + -(dVar249 * local_6168 * 5760.0);
  dVar456 = -(dVar419 * 2.0) * dVar255 * local_6168 +
            dVar418 * 240.0 * local_6168 * dVar261 +
            dVar249 * 24.0 * dVar455 +
            dVar416 * 72.0 * local_6168 + dVar453 * dVar256 + (dVar414 * dVar454) / 2.0;
  if ((dVar224 == 0.0) && (!NAN(dVar224))) {
    local_6170 = local_6168 * 1.1428571428571428 * dVar262 +
                 local_5f48 * 1.1428571428571428 * dVar456;
  }
  dVar457 = local_6170 * 1.8171205928321397 * dVar17;
  dVar458 = dVar439 * dVar222;
  dVar459 = dVar152 * dVar450 * dVar441;
  dVar460 = -(dVar264 * 0.010531842222222223) * dVar459 +
            -(dVar264 * 0.07021228148148148) * dVar458 +
            dVar457 * 0.026329605555555555 * dVar265 +
            -(dVar449 * 0.1728395061728395) * dVar452 +
            local_5f38 * dVar448 * 0.43209876543209874 * dVar223 +
            local_6158 * dVar16 * 0.43209876543209874 * dVar223 +
            local_6140 * dVar184 + -((dVar444 * dVar441) / 5.0);
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6178 = 0.0;
  }
  else {
    local_6178 = -(dVar147 * 0.36927938319101117) * dVar460 +
                 dVar435 * -0.36927938319101117 * dVar266 + -dVar357;
  }
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + 8 + lVar3 * 8) =
         __x * (local_60f0 + local_6178) + local_5ed0 + local_5f58 +
         *(double *)(in_stack_00000008[1] + 8 + lVar3 * 8);
  }
  dVar357 = dVar18 * 0.1504548888888889 * dVar22 + dVar24 * 0.00537989809245259 * *in_RCX * dVar27;
  dVar461 = dVar35 * dVar357;
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6180 = 0.0;
  }
  else {
    local_6180 = (-dVar277 * dVar279 * dVar461) / 180.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6188 = local_6180;
  }
  else {
    local_6188 = 0.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6190 = 0.0;
  }
  else {
    local_6190 = local_6180;
  }
  dVar462 = -(dVar52 * local_6190) * dVar56 +
            -(dVar292 * 4.0) * local_6190 + (dVar273 * local_6190 * dVar56) / 2.0;
  dVar463 = -local_6190 * dVar44 + local_5e90 * 2.0 * dVar462 + dVar58 * 2.0 * local_6190;
  if ((dVar38 != 0.0) || (NAN(dVar38))) {
    local_6198 = (((((((-dVar274 * local_6188) / 18.0 + (dVar287 * local_6188) / 240.0) -
                     (dVar288 * local_6188) / 4480.0) + (dVar289 * local_6188) / 103680.0) -
                   (dVar290 * local_6188) / 2838528.0) + (dVar291 * local_6188) / 89456640.0) -
                 (dVar41 * local_6188) / 3185049600.0) + (local_5e88 * local_6188) / 126340300800.0;
  }
  else {
    local_6198 = local_5e90 * -2.6666666666666665 * dVar463 +
                 -(local_6190 * 2.6666666666666665 * dVar53);
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_61a0 = local_6180;
  }
  else {
    local_61a0 = 0.0;
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_61a8 = 0.0;
  }
  else {
    local_61a8 = local_6180;
  }
  dVar464 = dVar316 * 256.0 * local_61a8;
  dVar465 = local_5ea8 * local_61a8 * 40.0 + -dVar464;
  dVar466 = local_61a8 * dVar92;
  dVar464 = -(dVar322 * 10.0) * local_61a8 +
            local_61a8 * 10.0 * dVar51 * dVar93 +
            local_5ea8 * local_61a8 * -72.0 + dVar465 * dVar92 + (dVar320 * dVar466) / 2.0 + dVar464
  ;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_61b0 = ((((((dVar305 * local_61a0 * -3.0438311688311688e-05 +
                       -(dVar302 * 0.005357142857142857) * local_61a0 +
                       -(dVar299 * local_61a0) / 7.71114500014776e+35 +
                       (dVar301 * local_61a0) / 7.633819549822504e+37 +
                       (dVar303 * local_61a0) / 1920.0 + (dVar306 * local_61a0) / 745472.0) -
                     (dVar307 * local_61a0) / 20643840.0) + (dVar308 * local_61a0) / 668467200.0) -
                   (dVar309 * local_61a0) / 24654643200.0) +
                  (dVar310 * local_61a0) / 1017328435200.0) -
                 (dVar311 * local_61a0) / 46351421276160.0) +
                 ((((((((((dVar312 * local_61a0) / 2.308410703872e+15 -
                         (dVar313 * local_61a0) / 1.24654178009088e+17) +
                        (dVar314 * local_61a0) / 7.250540450807808e+18) -
                       (dVar298 * local_61a0) / 4.517479587281633e+20) +
                      (dVar300 * local_61a0) / 3.000772247138819e+22) -
                     (local_5ea0 * local_61a0) / 2.116453759156243e+24) +
                    (dVar63 * local_61a0) / 1.5793369227989443e+26) -
                   (dVar297 * local_61a0) / 1.2429808430244664e+28) +
                  (dVar64 * local_61a0) / 1.0288727798616555e+30) -
                 (dVar304 * local_61a0) / 8.934630842486435e+31) +
                 (dVar65 * local_61a0) / 8.121312287389663e+33;
  }
  else {
    local_61b0 = local_61a8 * 48.0 * dVar315 + dVar464 * 24.0 * dVar89;
  }
  dVar467 = dVar326 * dVar357;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_61b8 = local_6180;
  }
  else {
    local_61b8 = 0.0;
  }
  local_61c8 = ((((((((((((((dVar331 * local_61b8 * -4.6972703222703225e-06 +
                             dVar329 * -0.001530612244897959 * local_61b8 +
                             (dVar330 * local_61b8) / 9408.0 + (dVar332 * local_61b8) / 6150144.0) -
                           (dVar333 * local_61b8) / 210862080.0) +
                          (dVar334 * local_61b8) / 8272281600.0) -
                         (dVar335 * local_61b8) / 363245076480.0) +
                        (dVar336 * local_61b8) / 17589608644608.0) -
                       (dVar337 * local_61b8) / 929135308308480.0) +
                      (dVar338 * local_61b8) / 5.3093446189056e+16) -
                     (dVar339 * local_61b8) / 3.26018619408384e+18) +
                    (dVar340 * local_61b8) / 2.1394273287347896e+20) -
                   (dVar341 * local_61b8) / 1.493478751555308e+22) +
                  (dVar112 * local_61b8) / 1.1046592834779778e+24) -
                 (local_5eb8 * local_61b8) / 8.627661500560449e+25) +
                (dVar103 * local_61b8) / 7.093855011571925e+27) -
               (dVar328 * local_61b8) / 6.123970353448437e+29) +
               (dVar104 * local_61b8) / 5.53739330121543e+31;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_61c0 = 0.0;
  }
  else {
    local_61c0 = local_6180;
  }
  dVar468 = dVar125 * local_61c0;
  dVar469 = dVar127 * local_61c0;
  dVar470 = dVar134 * local_61c0 * 26880.0 +
            dVar469 * -2880.0 +
            dVar468 * 768.0 + local_61c0 * -1105920.0 * dVar130 + -(local_61c0 * 8.0);
  dVar471 = local_61c0 * dVar133;
  dVar472 = local_5ec0 * local_61c0;
  dVar473 = dVar126 * local_61c0;
  dVar474 = dVar128 * local_61c0;
  dVar475 = dVar474 * 30720.0 + dVar472 * 448.0 + -(dVar473 * 5760.0);
  dVar476 = local_61c0 * dVar138;
  dVar477 = -(dVar349 * 2.0) * dVar132 * local_61c0 +
            dVar348 * 240.0 * dVar476 +
            dVar126 * 24.0 * dVar475 +
            dVar346 * 72.0 * local_61c0 + dVar470 * dVar133 + (dVar344 * dVar471) / 2.0;
  if ((dVar101 == 0.0) && (!NAN(dVar101))) {
    local_61c8 = local_61c0 * 1.1428571428571428 * dVar139 +
                 local_5ec0 * 1.1428571428571428 * dVar477;
  }
  dVar478 = local_61c8 * 1.8171205928321397 * dVar17;
  dVar479 = dVar17 * dVar22 * dVar99;
  dVar480 = dVar23 * dVar325 * dVar357;
  dVar481 = -(dVar141 * 0.010531842222222223) * dVar480 +
            dVar140 * 0.026329605555555555 * dVar479 +
            dVar478 * 0.026329605555555555 * dVar142 +
            -(dVar324 * 0.1728395061728395) * dVar467 +
            local_5eb0 * dVar22 * 0.018276169650205763 * dVar100 +
            local_61b0 * dVar96 * 0.43209876543209874 * dVar100 +
            local_6198 * dVar60 + -((dVar296 * dVar357) / 5.0);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_61d0 = 0.0;
  }
  else {
    local_61d0 = dVar12 * -0.36927938319101117 * dVar481;
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar3 * 8) =
         __x * local_61d0 + *(double *)(in_stack_00000008[2] + lVar3 * 8);
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[2] + 8 + lVar3 * 8) + 0.0;
  }
  dVar482 = dVar18 * 0.1504548888888889 * dVar151 +
            dVar24 * 0.00537989809245259 * in_RCX[2] * dVar155;
  dVar483 = dVar160 * dVar482;
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_61d8 = 0.0;
  }
  else {
    local_61d8 = (-dVar277 * dVar437 * dVar483) / 180.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_61e0 = local_61d8;
  }
  else {
    local_61e0 = 0.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_61e8 = 0.0;
  }
  else {
    local_61e8 = local_61d8;
  }
  dVar484 = -(dVar176 * local_61e8) * dVar180 +
            -(dVar369 * 4.0) * local_61e8 + (dVar358 * local_61e8 * dVar180) / 2.0;
  dVar485 = dVar484 * 2.0 * local_5f18 + -dVar169 * local_61e8 + local_61e8 * 2.0 * dVar182;
  if ((dVar163 != 0.0) || (NAN(dVar163))) {
    local_61f0 = (((((((-dVar359 * local_61e0) / 18.0 + (dVar364 * local_61e0) / 240.0) -
                     (dVar365 * local_61e0) / 4480.0) + (dVar366 * local_61e0) / 103680.0) -
                   (dVar367 * local_61e0) / 2838528.0) + (dVar368 * local_61e0) / 89456640.0) -
                 (dVar166 * local_61e0) / 3185049600.0) + (local_5f10 * local_61e0) / 126340300800.0
    ;
  }
  else {
    local_61f0 = local_61e8 * -2.6666666666666665 * dVar177 +
                 -(local_5f18 * 2.6666666666666665 * dVar485);
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_61f8 = local_61d8;
  }
  else {
    local_61f8 = 0.0;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6200 = 0.0;
  }
  else {
    local_6200 = local_61d8;
  }
  dVar486 = dVar391 * 256.0 * local_6200;
  dVar487 = local_5f30 * local_6200 * 40.0 + -dVar486;
  dVar488 = local_6200 * dVar216;
  dVar486 = -(dVar397 * 10.0) * local_6200 +
            local_6200 * 10.0 * dVar51 * dVar217 +
            local_5f30 * local_6200 * -72.0 + dVar487 * dVar216 + (dVar395 * dVar488) / 2.0 +
            dVar486;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6208 = ((((((dVar380 * local_61f8 * -3.0438311688311688e-05 +
                       -(dVar377 * 0.005357142857142857) * local_61f8 +
                       -(dVar374 * local_61f8) / 7.71114500014776e+35 +
                       (dVar376 * local_61f8) / 7.633819549822504e+37 +
                       (dVar378 * local_61f8) / 1920.0 + (dVar381 * local_61f8) / 745472.0) -
                     (dVar382 * local_61f8) / 20643840.0) + (dVar383 * local_61f8) / 668467200.0) -
                   (dVar384 * local_61f8) / 24654643200.0) +
                  (dVar385 * local_61f8) / 1017328435200.0) -
                 (dVar386 * local_61f8) / 46351421276160.0) +
                 ((((((((((dVar387 * local_61f8) / 2.308410703872e+15 -
                         (dVar388 * local_61f8) / 1.24654178009088e+17) +
                        (dVar389 * local_61f8) / 7.250540450807808e+18) -
                       (dVar373 * local_61f8) / 4.517479587281633e+20) +
                      (dVar375 * local_61f8) / 3.000772247138819e+22) -
                     (local_5f28 * local_61f8) / 2.116453759156243e+24) +
                    (dVar187 * local_61f8) / 1.5793369227989443e+26) -
                   (dVar372 * local_61f8) / 1.2429808430244664e+28) +
                  (dVar188 * local_61f8) / 1.0288727798616555e+30) -
                 (dVar379 * local_61f8) / 8.934630842486435e+31) +
                 (dVar189 * local_61f8) / 8.121312287389663e+33;
  }
  else {
    local_6208 = dVar390 * 48.0 * local_6200 + dVar486 * 24.0 * dVar213;
  }
  dVar489 = dVar451 * dVar482;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6210 = local_61d8;
  }
  else {
    local_6210 = 0.0;
  }
  local_6220 = ((((((((((((((dVar401 * local_6210 * -4.6972703222703225e-06 +
                             dVar399 * -0.001530612244897959 * local_6210 +
                             (dVar400 * local_6210) / 9408.0 + (dVar402 * local_6210) / 6150144.0) -
                           (dVar403 * local_6210) / 210862080.0) +
                          (dVar404 * local_6210) / 8272281600.0) -
                         (dVar405 * local_6210) / 363245076480.0) +
                        (dVar406 * local_6210) / 17589608644608.0) -
                       (dVar407 * local_6210) / 929135308308480.0) +
                      (dVar408 * local_6210) / 5.3093446189056e+16) -
                     (dVar409 * local_6210) / 3.26018619408384e+18) +
                    (dVar410 * local_6210) / 2.1394273287347896e+20) -
                   (dVar411 * local_6210) / 1.493478751555308e+22) +
                  (dVar235 * local_6210) / 1.1046592834779778e+24) -
                 (local_5f40 * local_6210) / 8.627661500560449e+25) +
                (dVar226 * local_6210) / 7.093855011571925e+27) -
               (dVar398 * local_6210) / 6.123970353448437e+29) +
               (dVar227 * local_6210) / 5.53739330121543e+31;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6218 = 0.0;
  }
  else {
    local_6218 = local_61d8;
  }
  dVar490 = dVar248 * local_6218;
  dVar491 = dVar250 * local_6218;
  dVar492 = dVar257 * local_6218 * 26880.0 +
            dVar491 * -2880.0 +
            dVar490 * 768.0 + local_6218 * -1105920.0 * dVar253 + -(local_6218 * 8.0);
  dVar493 = local_6218 * dVar256;
  dVar494 = local_5f48 * local_6218;
  dVar495 = dVar249 * local_6218;
  dVar496 = dVar251 * local_6218;
  dVar497 = dVar496 * 30720.0 + dVar494 * 448.0 + -(dVar495 * 5760.0);
  dVar498 = local_6218 * dVar261;
  dVar499 = -(dVar419 * 2.0) * dVar255 * local_6218 +
            dVar418 * 240.0 * dVar498 +
            dVar249 * 24.0 * dVar497 +
            dVar416 * 72.0 * local_6218 + dVar492 * dVar256 + (dVar414 * dVar493) / 2.0;
  if ((dVar224 == 0.0) && (!NAN(dVar224))) {
    local_6220 = local_6218 * 1.1428571428571428 * dVar262 +
                 local_5f48 * 1.1428571428571428 * dVar499;
  }
  dVar500 = local_6220 * 1.8171205928321397 * dVar17;
  dVar501 = dVar17 * dVar151 * dVar222;
  dVar502 = dVar152 * dVar450 * dVar482;
  dVar503 = -(dVar264 * 0.010531842222222223) * dVar502 +
            dVar263 * 0.026329605555555555 * dVar501 +
            dVar500 * 0.026329605555555555 * dVar265 +
            -(dVar449 * 0.1728395061728395) * dVar489 +
            local_5f38 * dVar151 * 0.018276169650205763 * dVar223 +
            local_6208 * dVar16 * 0.43209876543209874 * dVar223 +
            local_61f0 * dVar184 + -((dVar444 * dVar482) / 5.0);
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6228 = 0.0;
  }
  else {
    local_6228 = dVar147 * -0.36927938319101117 * dVar503;
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 0x10 + lVar3 * 8) =
         __x * local_6228 + *(double *)(in_stack_00000008[2] + 0x10 + lVar3 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar3 * 8) =
         *(double *)(in_stack_00000008[3] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[3] + 8 + lVar3 * 8) + 0.0;
  }
  dVar504 = local_5e60 * 1.4422495703074083;
  dVar505 = dVar11 * local_5eb0;
  dVar506 = dVar504 * dVar505;
  dVar95 = dVar95 * 1.8171205928321397;
  dVar507 = dVar95 * dVar17 * dVar99;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_6230 = 0.0;
  }
  else {
    local_6230 = dVar506 * 0.01610215409462904 * dVar507;
  }
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar3 * 8) =
         __x * local_6230 + *(double *)(in_stack_00000008[4] + lVar3 * 8);
  }
  dVar508 = local_5ee8 * 1.4422495703074083;
  dVar509 = dVar11 * local_5f38;
  dVar510 = dVar508 * dVar509;
  dVar219 = dVar219 * 1.8171205928321397;
  dVar511 = dVar219 * dVar17 * dVar222;
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6238 = 0.0;
  }
  else {
    local_6238 = dVar510 * 0.01610215409462904 * dVar511;
  }
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + 8 + lVar3 * 8) =
         __x * local_6238 + *(double *)(in_stack_00000008[4] + 8 + lVar3 * 8);
  }
  dVar512 = 1.0 / (dVar10 * dVar10);
  dVar513 = 1.0 / (dVar267 * __x);
  dVar7 = dVar7 * dVar513;
  local_62e8 = dVar7 * 2.0 - (dVar268 + dVar268);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_6240 = 0.0;
  }
  else {
    if ((dVar6 != 0.0) || (local_6248 = local_62e8, NAN(dVar6))) {
      local_6248 = 0.0;
    }
    local_6240 = local_6248;
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_6250 = 0.0;
  }
  else {
    local_6250 = dVar512 * 0.4444444444444444 * local_5f60 * local_5f60 +
                 dVar10 * 1.3333333333333333 * local_6240;
  }
  dVar514 = local_5f70 * dVar270 * 0.9847450218426964 * dVar143;
  dVar515 = (1.0 / (dVar11 * dVar11)) / __x;
  dVar516 = (local_5e60 * dVar515 * 0.9847450218426964 * dVar143) / 12.0;
  dVar517 = dVar271 * 0.9847450218426964 * dVar354;
  dVar28 = dVar28 * dVar28;
  dVar98 = (1.0 / dVar98) / dVar28;
  dVar518 = dVar283 * dVar283;
  dVar21 = *in_RCX * ((1.0 / dVar21) / dVar26);
  dVar19 = dVar18 * 1.4711144691358025 * dVar21 +
           dVar24 * 0.09086050111697706 * dVar25 * ((1.0 / dVar20) / (dVar26 * dVar19 * dVar519));
  dVar20 = dVar17 * dVar98;
  dVar25 = local_5f98 * local_5f98;
  dVar267 = ((1.0 / dVar11) / dVar267) * 1.4422495703074083;
  dVar36 = dVar14 * 0.024691358024691357 * dVar267 * dVar36;
  dVar519 = dVar277 * dVar275 * dVar278 * dVar35 * dVar283;
  dVar520 = dVar277 * dVar275 * dVar30 * dVar285 * local_5f88;
  dVar29 = dVar15 * ((1.0 / dVar29) / dVar28);
  local_5e78 = (1.0 / (local_5e78 * local_5e78)) / local_5e78;
  local_5e68 = (1.0 / (dVar34 * dVar34)) / local_5e68;
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    local_6258 = 0.0;
  }
  else {
    if ((dVar32 != 0.0) || (local_6260 = local_62e8, NAN(dVar32))) {
      local_6260 = 0.0;
    }
    local_6258 = local_6260;
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    local_6268 = 0.0;
  }
  else {
    local_6268 = local_5e68 * -0.2222222222222222 * local_5f78 * local_5f78 +
                 (dVar286 * local_6258) / 3.0;
  }
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6270 = 0.0;
  }
  else {
    local_6270 = (((dVar277 * 0.006111111111111111 * dVar29 * dVar35 * dVar518 +
                    dVar36 + dVar519 / 270.0 + dVar520 / 27.0 +
                   (dVar277 * dVar279 * dVar285 * dVar283 * local_5f88) / 90.0) -
                  (dVar277 * dVar279 * dVar35 * dVar19) / 180.0) +
                 (dVar277 * dVar284 * local_5e78 * local_5f88 * local_5f88) / 9.0) -
                 (dVar277 * dVar284 * dVar285 * local_6268) / 18.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6278 = local_6270;
  }
  else {
    local_6278 = 0.0;
  }
  dVar40 = (1.0 / dVar49) / dVar40;
  local_6288 = ((((((((((((dVar42 * dVar25) / 6.0 - (dVar274 * local_6278) / 18.0) -
                        (dVar43 * dVar25) / 48.0) + (dVar287 * local_6278) / 240.0 +
                       (dVar45 * dVar25) / 640.0) - (dVar288 * local_6278) / 4480.0) -
                     (dVar46 * dVar25) / 11520.0) + (dVar289 * local_6278) / 103680.0 +
                    (dVar47 * dVar25) / 258048.0) - (dVar290 * local_6278) / 2838528.0) -
                  (dVar48 * dVar25) / 6881280.0) + (dVar291 * local_6278) / 89456640.0 +
                 (dVar50 * dVar25) / 212336640.0) - (dVar41 * local_6278) / 3185049600.0) -
               (dVar40 * dVar25) / 7431782400.0) + (local_5e88 * local_6278) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6280 = 0.0;
  }
  else {
    local_6280 = local_6270;
  }
  dVar25 = dVar54 * dVar54;
  dVar34 = (1.0 / dVar25) / local_5e90;
  dVar49 = local_5fa0 * local_5fa0;
  dVar521 = dVar56 * dVar273;
  dVar522 = 1.0 / dVar25;
  dVar54 = (1.0 / dVar25) / dVar54;
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_6288 = -(local_5e90 * 2.6666666666666665) *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_6280) * dVar56 +
                  -(dVar292 * 4.0) * local_6280 +
                  -(dVar55 * dVar49) * dVar56 +
                  -(dVar49 * 4.0) * dVar57 +
                  dVar522 * -2.0 * dVar49 * dVar56 + (dVar273 * local_6280 * dVar56) / 2.0 +
                  (dVar54 * dVar49 * dVar56) / 4.0) +
                 local_5fa0 * 4.0 * dVar293 +
                 local_6280 * 2.0 * dVar58 +
                 -dVar44 * local_6280 + dVar521 * 2.0 * dVar49 + (-(dVar34 * dVar49) * dVar56) / 2.0
                 ) + local_6280 * -2.6666666666666665 * dVar53 +
                     -(local_5fa0 * 5.333333333333333 * dVar294);
  }
  local_5e98 = local_5e98 * ((1.0 / dVar59) / dVar28);
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6290 = local_6270;
  }
  else {
    local_6290 = 0.0;
  }
  dVar25 = local_5fb0 * local_5fb0;
  dVar67 = (1.0 / dVar68) / dVar67;
  dVar28 = local_5fb8 * local_5fb8;
  dVar317 = local_5ea8 * dVar317;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6298 = 0.0;
  }
  else {
    local_6298 = local_6270;
  }
  dVar49 = dVar89 * 768.0 * dVar28;
  dVar59 = dVar316 * 256.0 * local_6298;
  dVar318 = dVar318 * dVar319;
  dVar68 = 1.0 / dVar90;
  dVar523 = dVar91 * dVar68;
  dVar91 = dVar91 * ((1.0 / dVar90) / dVar89);
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_62a0 = ((-(dVar83 * 9.963564958965524e-15) * dVar25 +
                   -(dVar69 * 5.2947108149957596e-33) * dVar25 +
                   dVar75 * 4.588885732696935e-31 * dVar25 +
                   ((dVar70 * 2.9767152251494278e-27 * dVar25 +
                    ((-(dVar299 * local_6290) / 7.71114500014776e+35 +
                     (dVar86 * dVar25) / 6.413496239867403e+22) -
                    (dVar87 * dVar25) / 4.5123912079969836e+24)) -
                   (dVar88 * dVar25) / 2.638135332978604e+28) + (dVar82 * dVar25) / 2207210536960.0
                  + (dVar84 * dVar25) / 4.98616712036352e+15) -
                 (dVar66 * dVar25) / 2.68538535215104e+17) +
                 dVar73 * 0.026785714285714284 * dVar25 +
                 -(dVar67 * 6.156813072833613e-37) * dVar25 +
                 -(dVar81 * 1.8676367771303596e-11) * dVar25 +
                 dVar80 * 6.895252899056353e-10 * dVar25 +
                 ((dVar78 * 6.297278025793651e-07 * dVar25 +
                  -(dVar77 * 1.475575206043956e-05) * dVar25 +
                  dVar76 * 0.0002739448051948052 * dVar25 +
                  dVar71 * 6.419508807886076e-20 * dVar25 +
                  -(dVar85 * 1.0330674055506187e-21 * dVar25)) - (dVar79 * dVar25) / 44564480.0) +
                 (dVar72 * dVar25) / 1.7135877778106135e+34 +
                 ((((((((dVar74 * -0.0036458333333333334 * dVar25 +
                         -((dVar304 * local_6290) / 8.934630842486435e+31) +
                        (dVar65 * local_6290) / 8.121312287389663e+33) -
                       (dVar297 * local_6290) / 1.2429808430244664e+28) +
                      (dVar64 * local_6290) / 1.0288727798616555e+30) -
                     (local_5ea0 * local_6290) / 2.116453759156243e+24) +
                    (dVar63 * local_6290) / 1.5793369227989443e+26) -
                   (dVar298 * local_6290) / 4.517479587281633e+20) +
                  (dVar300 * local_6290) / 3.000772247138819e+22) -
                 (dVar313 * local_6290) / 1.24654178009088e+17) +
                 (dVar314 * local_6290) / 7.250540450807808e+18 +
                 -(dVar302 * 0.005357142857142857) * local_6290 +
                 dVar305 * local_6290 * -3.0438311688311688e-05 +
                 ((((-(dVar311 * local_6290) / 46351421276160.0 +
                    (dVar312 * local_6290) / 2.308410703872e+15) -
                   (dVar309 * local_6290) / 24654643200.0) +
                  (dVar310 * local_6290) / 1017328435200.0) - (dVar307 * local_6290) / 20643840.0) +
                 (dVar308 * local_6290) / 668467200.0 + (dVar306 * local_6290) / 745472.0 +
                 (dVar303 * local_6290) / 1920.0 + (dVar301 * local_6290) / 7.633819549822504e+37;
  }
  else {
    local_62a0 = local_6298 * 48.0 * dVar315 +
                 dVar317 * 96.0 * local_5fb8 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_6298 +
                 -(dVar68 * 5.0 * dVar28) * dVar92 +
                 local_6298 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_6298 * -72.0 +
                 dVar28 * -72.0 +
                 -(dVar523 * 1.5) * dVar28 * dVar92 +
                 (((dVar28 * 40.0 + local_5ea8 * local_6298 * 40.0) - dVar49) - dVar59) * dVar92 +
                 dVar318 * dVar321 + (dVar320 * local_6298 * dVar92) / 2.0 +
                 (dVar91 * dVar28 * dVar92) / 4.0 + dVar49 + dVar59) + dVar94 * 48.0 * dVar28;
  }
  dVar25 = local_5fc0 * dVar96 * 1.8171205928321397;
  dVar28 = local_5eb0 * dVar323 * 1.8171205928321397;
  dVar49 = local_5fc8 * local_5fc8;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_62a8 = local_6270;
  }
  else {
    local_62a8 = 0.0;
  }
  dVar107 = (1.0 / dVar121) / dVar107;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_62b0 = 0.0;
  }
  else {
    local_62b0 = local_6270;
  }
  dVar59 = local_5fd0 * local_5fd0;
  dVar342 = dVar342 * dVar343;
  dVar90 = dVar131 * (1.0 / dVar127);
  dVar121 = dVar59 * dVar133;
  dVar131 = dVar131 * (1.0 / dVar134);
  dVar135 = local_5ec0 * dVar135;
  dVar347 = dVar125 * dVar347;
  dVar136 = dVar136 * (1.0 / dVar128);
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_62b8 = dVar331 * local_62a8 * -4.6972703222703225e-06 +
                 (((((((((((((((dVar118 * dVar49) / 1.304074477633536e+17 -
                              (dVar119 * dVar49) / 7.923804921239962e+18) -
                             (dVar328 * local_62a8) / 6.123970353448437e+29) +
                            (dVar104 * local_62a8) / 5.53739330121543e+31) -
                           (local_5eb8 * local_62a8) / 8.627661500560449e+25) +
                          (dVar103 * local_62a8) / 7.093855011571925e+27) -
                         (dVar341 * local_62a8) / 1.493478751555308e+22) +
                        (dVar112 * local_62a8) / 1.1046592834779778e+24) -
                       (dVar339 * local_62a8) / 3.26018619408384e+18) +
                      (dVar340 * local_62a8) / 2.1394273287347896e+20) -
                     (dVar337 * local_62a8) / 929135308308480.0) +
                    (dVar338 * local_62a8) / 5.3093446189056e+16) -
                   (dVar335 * local_62a8) / 363245076480.0) +
                  (dVar336 * local_62a8) / 17589608644608.0) - (dVar333 * local_62a8) / 210862080.0)
                 + (dVar334 * local_62a8) / 8272281600.0 + (dVar332 * local_62a8) / 6150144.0 +
                 ((((((((((((((dVar109 * 4.22754329004329e-05 * dVar49 +
                              ((dVar106 * 0.007653061224489796 * dVar49 +
                               dVar329 * -0.001530612244897959 * local_62a8 +
                               (dVar330 * local_62a8) / 9408.0) - (dVar108 * dVar49) / 1344.0)) -
                             (dVar110 * dVar49) / 559104.0) + (dVar111 * dVar49) / 16220160.0) -
                           (dVar113 * dVar49) / 551485440.0) +
                          (dVar120 * dVar49) / 5.149926729501062e+20) -
                         (dVar122 * dVar49) / 3.5634170434773477e+22) +
                        (dVar123 * dVar49) / 2.614442878957712e+24) -
                       (dVar124 * dVar49) / 2.0268157175919785e+26) +
                      (dVar105 * dVar49) / 1.6551271225536316e+28) -
                     (dVar107 * dVar49) / 1.4198444362090846e+30) +
                    (dVar114 * dVar49) / 21367357440.0) - (dVar115 * dVar49) / 925768876032.0) +
                  (dVar116 * dVar49) / 44244538490880.0) - (dVar117 * dVar49) / 2.308410703872e+15);
  }
  else {
    local_62b8 = local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_62b0 +
                 dVar349 * 4.0 * dVar343 * dVar59 +
                 -dVar136 * dVar121 +
                 -(dVar137 * 480.0 * dVar59) * dVar133 +
                 dVar348 * 240.0 * local_62b0 * dVar138 +
                 dVar51 * 240.0 * dVar59 * dVar138 +
                 dVar126 * 24.0 *
                 (dVar127 * dVar59 * 153600.0 +
                 dVar125 * dVar59 * -17280.0 +
                 dVar59 * 448.0 +
                 local_62b0 * 30720.0 * dVar128 +
                 local_62b0 * 448.0 * local_5ec0 + -(local_62b0 * 5760.0 * dVar126)) +
                 dVar346 * 72.0 * local_62b0 +
                 dVar347 * 144.0 * local_5fd0 +
                 dVar135 * 144.0 * dVar59 +
                 -(dVar90 * 1.5) * dVar121 +
                 (dVar126 * dVar59 * -11520.0 +
                 local_5ec0 * dVar59 * 1536.0 +
                 local_62b0 * -8.0 +
                 -(dVar59 * 8847360.0) * dVar129 +
                 dVar59 * 161280.0 * dVar128 +
                 local_62b0 * 26880.0 * dVar134 +
                 -(local_62b0 * 1105920.0) * dVar130 +
                 local_62b0 * 768.0 * dVar125 + -(local_62b0 * 2880.0 * dVar127)) * dVar133 +
                 dVar342 * dVar345 + (dVar344 * local_62b0 * dVar133) / 2.0 +
                 (dVar131 * dVar121) / 4.0) +
                 local_62b0 * 1.1428571428571428 * dVar139 +
                 local_5fd0 * 2.2857142857142856 * dVar350;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_62c0 = 0.0;
  }
  else {
    local_62c0 = -(dVar12 * 0.36927938319101117) *
                 (local_62b8 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 -(dVar324 * 0.1728395061728395) * dVar326 * dVar19 +
                 -(dVar28 * 0.345679012345679) * dVar327 +
                 -(dVar25 * 0.345679012345679) * dVar327 +
                 local_5eb0 *
                 (*in_R9 * -0.6468503111111111 * dVar280 + dVar21 * 0.41356361037037037) *
                 0.43209876543209874 * dVar100 +
                 local_5fc0 * dVar323 * 0.8641975308641975 * dVar100 +
                 local_62a0 * dVar96 * 0.43209876543209874 * dVar100 +
                 local_5e98 * 0.24 * dVar518 +
                 local_6288 * dVar60 +
                 dVar324 * 0.2419753086419753 * dVar20 * dVar518 +
                 -(local_5fa8 * dVar295 * 0.4) * dVar283 +
                 ((-(dVar351 * 0.021063684444444446) * dVar353 +
                  -(dVar351 * 0.14042456296296296) * dVar352 +
                  dVar141 * 0.056169825185185186 * dVar281 * dVar325 * dVar283 +
                  dVar141 * 0.25744503209876546 * dVar21 * dVar99 +
                  dVar141 * 0.01474457911111111 * dVar23 * dVar98 * dVar518 +
                  -(dVar141 * 0.010531842222222223 * dVar23 * dVar325 * dVar19)) -
                 (dVar296 * dVar19) / 5.0)) +
                 ((-(dVar269 * 0.7385587663820223) * dVar354 +
                   local_6250 * dVar11 * -0.36927938319101117 * dVar143 + -(dVar514 / 4.0) + dVar516
                  ) - dVar517 / 4.0);
  }
  dVar19 = 1.0 / (dVar146 * dVar146);
  dVar2 = dVar2 * dVar513;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_62c8 = 0.0;
  }
  else {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_62d0 = 0.0;
    }
    else {
      local_62d0 = dVar268 + dVar268 + dVar2 * 2.0;
    }
    local_62c8 = local_62d0;
  }
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_62d8 = 0.0;
  }
  else {
    local_62d8 = dVar19 * 0.4444444444444444 * local_5fe8 * local_5fe8 +
                 dVar146 * 1.3333333333333333 * local_62c8;
  }
  dVar21 = local_5ff8 * dVar270 * 0.9847450218426964 * dVar266;
  dVar49 = (local_5ee8 * dVar515 * 0.9847450218426964 * dVar266) / 12.0;
  dVar59 = dVar356 * 0.9847450218426964 * dVar422;
  dVar121 = local_6020 * local_6020;
  dVar161 = dVar14 * 0.024691358024691357 * dVar267 * dVar161;
  dVar14 = dVar277 * dVar275 * dVar158 * dVar362 * local_6010;
  local_5f00 = (1.0 / (local_5f00 * local_5f00)) / local_5f00;
  local_5ef0 = (1.0 / (dVar159 * dVar159)) / local_5ef0;
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    local_62e0 = 0.0;
  }
  else {
    if ((dVar31 != 0.0) || (NAN(dVar31))) {
      local_62e8 = 0.0;
    }
    else {
      local_62e8 = -local_62e8;
    }
    local_62e0 = local_62e8;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_62f0 = 0.0;
  }
  else {
    local_62f0 = local_5ef0 * -0.2222222222222222 * local_6000 * local_6000 +
                 (dVar363 * local_62e0) / 3.0;
  }
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_62f8 = 0.0;
  }
  else {
    local_62f8 = (dVar161 + dVar14 / 27.0 +
                 (dVar277 * dVar361 * local_5f00 * local_6010 * local_6010) / 9.0) -
                 (dVar277 * dVar361 * dVar362 * local_62f0) / 18.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6300 = local_62f8;
  }
  else {
    local_6300 = 0.0;
  }
  dVar165 = (1.0 / dVar174) / dVar165;
  local_6310 = ((((((((((((dVar167 * dVar121) / 6.0 - (dVar359 * local_6300) / 18.0) -
                        (dVar168 * dVar121) / 48.0) + (dVar364 * local_6300) / 240.0 +
                       (dVar170 * dVar121) / 640.0) - (dVar365 * local_6300) / 4480.0) -
                     (dVar171 * dVar121) / 11520.0) + (dVar366 * local_6300) / 103680.0 +
                    (dVar172 * dVar121) / 258048.0) - (dVar367 * local_6300) / 2838528.0) -
                  (dVar173 * dVar121) / 6881280.0) + (dVar368 * local_6300) / 89456640.0 +
                 (dVar175 * dVar121) / 212336640.0) - (dVar166 * local_6300) / 3185049600.0) -
               (dVar165 * dVar121) / 7431782400.0) + (local_5f10 * local_6300) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6308 = 0.0;
  }
  else {
    local_6308 = local_62f8;
  }
  dVar121 = dVar178 * dVar178;
  dVar159 = (1.0 / dVar121) / local_5f18;
  dVar174 = local_6028 * local_6028;
  dVar267 = dVar180 * dVar358;
  dVar513 = 1.0 / dVar121;
  dVar178 = (1.0 / dVar121) / dVar178;
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_6310 = -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_6308) * dVar180 +
                  -(dVar369 * 4.0) * local_6308 +
                  -(dVar179 * dVar174) * dVar180 +
                  -(dVar174 * 4.0) * dVar181 +
                  dVar513 * -2.0 * dVar174 * dVar180 + (dVar358 * local_6308 * dVar180) / 2.0 +
                  (dVar178 * dVar174 * dVar180) / 4.0) +
                 local_6028 * 4.0 * dVar370 +
                 local_6308 * 2.0 * dVar182 +
                 -dVar169 * local_6308 +
                 dVar267 * 2.0 * dVar174 + (-(dVar159 * dVar174) * dVar180) / 2.0) +
                 local_6308 * -2.6666666666666665 * dVar177 +
                 -(local_6028 * 5.333333333333333 * dVar371);
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6318 = local_62f8;
  }
  else {
    local_6318 = 0.0;
  }
  dVar121 = local_6038 * local_6038;
  dVar191 = (1.0 / dVar192) / dVar191;
  dVar174 = local_6040 * local_6040;
  dVar392 = local_5f30 * dVar392;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6320 = 0.0;
  }
  else {
    local_6320 = local_62f8;
  }
  dVar192 = dVar213 * 768.0 * dVar174;
  dVar515 = dVar391 * 256.0 * local_6320;
  dVar393 = dVar393 * dVar394;
  dVar518 = 1.0 / dVar214;
  dVar524 = dVar215 * dVar518;
  dVar215 = dVar215 * ((1.0 / dVar214) / dVar213);
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6328 = ((((((((((dVar187 * local_6318) / 1.5793369227989443e+26 -
                         (dVar372 * local_6318) / 1.2429808430244664e+28) +
                        (dVar188 * local_6318) / 1.0288727798616555e+30) -
                       (dVar379 * local_6318) / 8.934630842486435e+31) +
                       (dVar189 * local_6318) / 8.121312287389663e+33 +
                      (dVar385 * local_6318) / 1017328435200.0) -
                     (dVar386 * local_6318) / 46351421276160.0) +
                    (dVar387 * local_6318) / 2.308410703872e+15) -
                   (dVar388 * local_6318) / 1.24654178009088e+17) +
                  (dVar389 * local_6318) / 7.250540450807808e+18) -
                 (dVar373 * local_6318) / 4.517479587281633e+20) +
                 ((((dVar380 * local_6318 * -3.0438311688311688e-05 +
                     -(dVar377 * 0.005357142857142857) * local_6318 +
                     (((dVar375 * local_6318) / 3.000772247138819e+22 -
                      (local_5f28 * local_6318) / 2.116453759156243e+24) -
                     (dVar374 * local_6318) / 7.71114500014776e+35) +
                     (dVar376 * local_6318) / 7.633819549822504e+37 +
                     (dVar378 * local_6318) / 1920.0 + (dVar381 * local_6318) / 745472.0) -
                   (dVar382 * local_6318) / 20643840.0) + (dVar383 * local_6318) / 668467200.0) -
                 (dVar384 * local_6318) / 24654643200.0) +
                 -(dVar205 * 1.8676367771303596e-11) * dVar121 +
                 dVar204 * 6.895252899056353e-10 * dVar121 +
                 ((dVar202 * 6.297278025793651e-07 * dVar121 +
                  -(dVar201 * 1.475575206043956e-05) * dVar121 +
                  dVar200 * 0.0002739448051948052 * dVar121 +
                  -(dVar198 * 0.0036458333333333334) * dVar121 +
                  dVar197 * 0.026785714285714284 * dVar121 +
                  -(dVar191 * 6.156813072833613e-37) * dVar121 +
                  (dVar196 * dVar121) / 1.7135877778106135e+34) - (dVar203 * dVar121) / 44564480.0)
                 + (dVar206 * dVar121) / 2207210536960.0 +
                 -(dVar193 * 5.2947108149957596e-33) * dVar121 +
                 dVar199 * 4.588885732696935e-31 * dVar121 +
                 ((dVar194 * 2.9767152251494278e-27 * dVar121 +
                  ((-(dVar209 * 1.0330674055506187e-21) * dVar121 +
                    dVar195 * 6.419508807886076e-20 * dVar121 +
                    ((dVar207 * -9.963564958965524e-15 * dVar121 +
                     (dVar208 * dVar121) / 4.98616712036352e+15) -
                    (dVar190 * dVar121) / 2.68538535215104e+17) +
                   (dVar210 * dVar121) / 6.413496239867403e+22) -
                  (dVar211 * dVar121) / 4.5123912079969836e+24)) -
                 (dVar212 * dVar121) / 2.638135332978604e+28);
  }
  else {
    local_6328 = (-(dVar397 * 10.0) * local_6320 +
                 -(dVar518 * 5.0 * dVar174) * dVar216 +
                 local_6320 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_6320 * -72.0 +
                 dVar174 * -72.0 +
                 -(dVar524 * 1.5) * dVar174 * dVar216 +
                 (((dVar174 * 40.0 + local_5f30 * local_6320 * 40.0) - dVar192) - dVar515) * dVar216
                 + dVar393 * dVar396 + (dVar395 * local_6320 * dVar216) / 2.0 +
                 (dVar215 * dVar174 * dVar216) / 4.0 + dVar192 + dVar515) * 24.0 * dVar213 +
                 dVar174 * 48.0 * dVar218 +
                 dVar390 * 48.0 * local_6320 + local_6040 * 96.0 * dVar392;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6330 = local_62f8;
  }
  else {
    local_6330 = 0.0;
  }
  dVar121 = local_6050 * local_6050;
  dVar230 = (1.0 / dVar244) / dVar230;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6338 = 0.0;
  }
  else {
    local_6338 = local_62f8;
  }
  dVar174 = local_6058 * local_6058;
  dVar412 = dVar412 * dVar413;
  dVar192 = dVar254 * (1.0 / dVar250);
  dVar214 = dVar174 * dVar256;
  dVar254 = dVar254 * (1.0 / dVar257);
  dVar258 = local_5f48 * dVar258;
  dVar417 = dVar248 * dVar417;
  dVar259 = dVar259 * (1.0 / dVar251);
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6340 = dVar401 * local_6330 * -4.6972703222703225e-06 +
                 -(dVar399 * 0.001530612244897959) * local_6330 +
                 ((((((((((((((dVar235 * local_6330) / 1.1046592834779778e+24 -
                             (local_5f40 * local_6330) / 8.627661500560449e+25) +
                            (dVar226 * local_6330) / 7.093855011571925e+27) -
                           (dVar398 * local_6330) / 6.123970353448437e+29) +
                          (dVar227 * local_6330) / 5.53739330121543e+31) -
                         (dVar403 * local_6330) / 210862080.0) +
                        (dVar404 * local_6330) / 8272281600.0) -
                       (dVar405 * local_6330) / 363245076480.0) +
                      (dVar406 * local_6330) / 17589608644608.0) -
                     (dVar407 * local_6330) / 929135308308480.0) +
                    (dVar408 * local_6330) / 5.3093446189056e+16) -
                   (dVar409 * local_6330) / 3.26018619408384e+18) +
                  (dVar410 * local_6330) / 2.1394273287347896e+20) -
                 (dVar411 * local_6330) / 1.493478751555308e+22) + (dVar400 * local_6330) / 9408.0 +
                 (dVar402 * local_6330) / 6150144.0 +
                 ((((((((((((((((dVar232 * 4.22754329004329e-05 * dVar121 +
                                dVar229 * 0.007653061224489796 * dVar121 +
                                -((dVar231 * dVar121) / 1344.0)) - (dVar233 * dVar121) / 559104.0) +
                              (dVar234 * dVar121) / 16220160.0) - (dVar236 * dVar121) / 551485440.0)
                            + (dVar237 * dVar121) / 21367357440.0) -
                           (dVar238 * dVar121) / 925768876032.0) +
                          (dVar239 * dVar121) / 44244538490880.0) -
                         (dVar240 * dVar121) / 2.308410703872e+15) +
                        (dVar241 * dVar121) / 1.304074477633536e+17) -
                       (dVar242 * dVar121) / 7.923804921239962e+18) +
                      (dVar243 * dVar121) / 5.149926729501062e+20) -
                     (dVar245 * dVar121) / 3.5634170434773477e+22) +
                    (dVar246 * dVar121) / 2.614442878957712e+24) -
                   (dVar247 * dVar121) / 2.0268157175919785e+26) +
                  (dVar228 * dVar121) / 1.6551271225536316e+28) -
                 (dVar230 * dVar121) / 1.4198444362090846e+30);
  }
  else {
    local_6340 = local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6338 +
                 dVar419 * 4.0 * dVar413 * dVar174 +
                 -dVar259 * dVar214 +
                 -(dVar260 * 480.0 * dVar174) * dVar256 +
                 dVar418 * 240.0 * local_6338 * dVar261 +
                 dVar51 * 240.0 * dVar174 * dVar261 +
                 dVar249 * 24.0 *
                 (dVar250 * dVar174 * 153600.0 +
                 dVar248 * dVar174 * -17280.0 +
                 dVar174 * 448.0 +
                 local_6338 * 30720.0 * dVar251 +
                 local_6338 * 448.0 * local_5f48 + -(local_6338 * 5760.0 * dVar249)) +
                 dVar416 * 72.0 * local_6338 +
                 dVar417 * 144.0 * local_6058 +
                 dVar258 * 144.0 * dVar174 +
                 -(dVar192 * 1.5) * dVar214 +
                 (dVar249 * dVar174 * -11520.0 +
                 local_5f48 * dVar174 * 1536.0 +
                 local_6338 * -8.0 +
                 -(dVar174 * 8847360.0) * dVar252 +
                 dVar174 * 161280.0 * dVar251 +
                 local_6338 * 26880.0 * dVar257 +
                 -(local_6338 * 1105920.0) * dVar253 +
                 local_6338 * 768.0 * dVar248 + -(local_6338 * 2880.0 * dVar250)) * dVar256 +
                 dVar412 * dVar415 + (dVar414 * local_6338 * dVar256) / 2.0 +
                 (dVar254 * dVar214) / 4.0) +
                 local_6338 * 1.1428571428571428 * dVar262 +
                 local_6058 * 2.2857142857142856 * dVar420;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6348 = 0.0;
  }
  else {
    local_6348 = -(dVar147 * 0.36927938319101117) *
                 (local_6340 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265 +
                 local_6310 * dVar184 + local_6328 * dVar16 * 0.43209876543209874 * dVar223) +
                 ((-(dVar355 * 0.7385587663820223) * dVar422 +
                   local_62d8 * dVar11 * -0.36927938319101117 * dVar266 + -(dVar21 / 4.0) + dVar49)
                 - dVar59 / 4.0);
  }
  if ((in_stack_00000008[5] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x6c);
    *(double *)(in_stack_00000008[5] + lVar3 * 8) =
         __x * (local_62c0 + local_6348) + local_5fe0 + local_5fe0 + local_6068 * 2.0 +
         *(double *)(in_stack_00000008[5] + lVar3 * 8);
  }
  local_63f8 = dVar7 * 2.0;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_6350 = 0.0;
  }
  else {
    if ((dVar6 != 0.0) || (local_6358 = local_63f8, NAN(dVar6))) {
      local_6358 = 0.0;
    }
    local_6350 = local_6358;
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_6360 = 0.0;
  }
  else {
    local_6360 = dVar512 * local_6070 * 0.4444444444444444 * local_5f60 +
                 dVar10 * 1.3333333333333333 * local_6350;
  }
  dVar121 = local_6080 * dVar270 * 0.9847450218426964 * dVar143;
  dVar174 = dVar271 * 0.9847450218426964 * dVar434;
  dVar30 = dVar277 * dVar275 * dVar30 * dVar424;
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    local_6368 = 0.0;
  }
  else {
    if ((dVar32 != 0.0) || (local_6370 = local_63f8, NAN(dVar32))) {
      local_6370 = 0.0;
    }
    local_6368 = local_6370;
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    local_6378 = 0.0;
  }
  else {
    local_6378 = local_5e68 * local_6088 * -0.2222222222222222 * local_5f78 +
                 (dVar286 * local_6368) / 3.0;
  }
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6380 = 0.0;
  }
  else {
    local_6380 = (dVar36 + dVar519 / 540.0 + dVar520 / 54.0 + dVar30 / 54.0 +
                  (dVar277 * dVar279 * dVar424 * dVar283) / 180.0 +
                 (dVar277 * dVar284 * local_5e78 * local_6098 * local_5f88) / 9.0) -
                 (dVar277 * dVar284 * dVar285 * local_6378) / 18.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6388 = local_6380;
  }
  else {
    local_6388 = 0.0;
  }
  local_6398 = ((((((((((((dVar42 * local_60a8 * local_5f98) / 6.0 - (dVar274 * local_6388) / 18.0)
                        - (dVar43 * local_60a8 * local_5f98) / 48.0) +
                        (dVar287 * local_6388) / 240.0 + (dVar45 * local_60a8 * local_5f98) / 640.0)
                      - (dVar288 * local_6388) / 4480.0) -
                     (dVar46 * local_60a8 * local_5f98) / 11520.0) +
                     (dVar289 * local_6388) / 103680.0 +
                    (dVar47 * local_60a8 * local_5f98) / 258048.0) -
                   (dVar290 * local_6388) / 2838528.0) -
                  (dVar48 * local_60a8 * local_5f98) / 6881280.0) +
                  (dVar291 * local_6388) / 89456640.0 +
                 (dVar50 * local_60a8 * local_5f98) / 212336640.0) -
                (dVar41 * local_6388) / 3185049600.0) -
               (dVar40 * local_60a8 * local_5f98) / 7431782400.0) +
               (local_5e88 * local_6388) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6390 = 0.0;
  }
  else {
    local_6390 = local_6380;
  }
  dVar214 = dVar56 * local_60b0;
  dVar244 = dVar56 * local_5fa0;
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_6398 = -(local_5fa0 * 2.6666666666666665) * dVar425 +
                 -(local_60b0 * 2.6666666666666665) * dVar294 +
                 local_5e90 * -2.6666666666666665 *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_6390) * dVar56 +
                  -(dVar292 * 4.0) * local_6390 +
                  -(dVar55 * local_5fa0) * dVar214 +
                  -(local_5fa0 * dVar57 * 4.0) * local_60b0 +
                  dVar522 * local_60b0 * -2.0 * dVar244 + (dVar273 * local_6390 * dVar56) / 2.0 +
                  (dVar54 * local_60b0 * dVar244) / 4.0) +
                 local_5fa0 * 2.0 * dVar276 +
                 local_60b0 * 2.0 * dVar293 +
                 local_6390 * 2.0 * dVar58 +
                 -dVar44 * local_6390 +
                 dVar521 * 2.0 * local_60b0 * local_5fa0 + (-(dVar34 * local_5fa0) * dVar214) / 2.0)
                 + -(local_6390 * 2.6666666666666665 * dVar53);
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_63a0 = local_6380;
  }
  else {
    local_63a0 = 0.0;
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_63a8 = 0.0;
  }
  else {
    local_63a8 = local_6380;
  }
  dVar426 = local_5ea8 * dVar426;
  dVar519 = dVar89 * local_60c8 * 768.0 * local_5fb8;
  dVar424 = dVar316 * 256.0 * local_63a8;
  dVar427 = dVar427 * dVar319;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_63b0 = ((((((((dVar305 * local_63a0 * -3.0438311688311688e-05 +
                        dVar302 * -0.005357142857142857 * local_63a0 +
                        (dVar303 * local_63a0) / 1920.0) -
                       (dVar299 * local_63a0) / 7.71114500014776e+35) +
                      (dVar301 * local_63a0) / 7.633819549822504e+37) -
                     (dVar304 * local_63a0) / 8.934630842486435e+31) +
                     (dVar65 * local_63a0) / 8.121312287389663e+33 +
                    (dVar63 * local_63a0) / 1.5793369227989443e+26) -
                   (dVar297 * local_63a0) / 1.2429808430244664e+28) +
                  (dVar64 * local_63a0) / 1.0288727798616555e+30) -
                 (dVar298 * local_63a0) / 4.517479587281633e+20) +
                 ((((((((((dVar300 * local_63a0) / 3.000772247138819e+22 -
                         (local_5ea0 * local_63a0) / 2.116453759156243e+24) +
                        (dVar312 * local_63a0) / 2.308410703872e+15) -
                       (dVar313 * local_63a0) / 1.24654178009088e+17) +
                      (dVar314 * local_63a0) / 7.250540450807808e+18) -
                     (dVar309 * local_63a0) / 24654643200.0) +
                    (dVar310 * local_63a0) / 1017328435200.0) -
                   (dVar311 * local_63a0) / 46351421276160.0) + (dVar306 * local_63a0) / 745472.0) -
                 (dVar307 * local_63a0) / 20643840.0) + (dVar308 * local_63a0) / 668467200.0 +
                 -(dVar77 * local_60c0 * 1.475575206043956e-05) * local_5fb0 +
                 dVar76 * local_60c0 * 0.0002739448051948052 * local_5fb0 +
                 -(dVar69 * local_60c0 * 5.2947108149957596e-33) * local_5fb0 +
                 dVar75 * local_60c0 * 4.588885732696935e-31 * local_5fb0 +
                 ((dVar70 * local_60c0 * 2.9767152251494278e-27 * local_5fb0 +
                  ((-(dVar85 * local_60c0 * 1.0330674055506187e-21) * local_5fb0 +
                    dVar71 * local_60c0 * 6.419508807886076e-20 * local_5fb0 +
                    (-(dVar66 * local_60c0) * local_5fb0) / 2.68538535215104e+17 +
                   (dVar86 * local_60c0 * local_5fb0) / 6.413496239867403e+22) -
                  (dVar87 * local_60c0 * local_5fb0) / 4.5123912079969836e+24)) -
                 (dVar88 * local_60c0 * local_5fb0) / 2.638135332978604e+28) +
                 -(dVar74 * local_60c0 * 0.0036458333333333334) * local_5fb0 +
                 dVar73 * local_60c0 * 0.026785714285714284 * local_5fb0 +
                 -(dVar67 * local_60c0 * 6.156813072833613e-37) * local_5fb0 +
                 -(dVar83 * local_60c0 * 9.963564958965524e-15) * local_5fb0 +
                 -(dVar81 * local_60c0 * 1.8676367771303596e-11) * local_5fb0 +
                 dVar80 * local_60c0 * 6.895252899056353e-10 * local_5fb0 +
                 dVar78 * local_60c0 * 6.297278025793651e-07 * local_5fb0 +
                 -((dVar79 * local_60c0 * local_5fb0) / 44564480.0) +
                 (dVar82 * local_60c0 * local_5fb0) / 2207210536960.0 +
                 (dVar84 * local_60c0 * local_5fb0) / 4.98616712036352e+15 +
                 (dVar72 * local_60c0 * local_5fb0) / 1.7135877778106135e+34;
  }
  else {
    local_63b0 = dVar426 * 48.0 * local_5fb8 +
                 local_63a8 * 48.0 * dVar315 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_63a8 +
                 -(dVar68 * local_5fb8 * 5.0) * dVar428 +
                 local_63a8 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_63a8 * -72.0 +
                 local_5fb8 * local_60c8 * -72.0 +
                 -(dVar523 * 1.5) * dVar428 * local_5fb8 +
                 (((local_5fb8 * local_60c8 * 40.0 + local_5ea8 * local_63a8 * 40.0) - dVar519) -
                 dVar424) * dVar92 + (dVar427 * dVar321) / 2.0 + (dVar318 * dVar428) / 2.0 +
                 (dVar320 * local_63a8 * dVar92) / 2.0 + (dVar91 * dVar428 * local_5fb8) / 4.0 +
                 dVar519 + dVar424) +
                 local_60c8 * 48.0 * dVar317 + local_60c8 * 48.0 * local_5fb8 * dVar94;
  }
  dVar519 = local_60d0 * dVar96 * 1.8171205928321397;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_63b8 = local_6380;
  }
  else {
    local_63b8 = 0.0;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_63c0 = 0.0;
  }
  else {
    local_63c0 = local_6380;
  }
  dVar429 = dVar429 * dVar343;
  dVar424 = dVar430 * local_5fd0;
  dVar431 = dVar125 * dVar431;
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_63c8 = -(dVar329 * 0.001530612244897959) * local_63b8 +
                 dVar331 * local_63b8 * -4.6972703222703225e-06 +
                 ((((((((((((-(dVar328 * local_63b8) / 6.123970353448437e+29 +
                             (dVar104 * local_63b8) / 5.53739330121543e+31 +
                            (dVar112 * local_63b8) / 1.1046592834779778e+24) -
                           (local_5eb8 * local_63b8) / 8.627661500560449e+25) +
                          (dVar103 * local_63b8) / 7.093855011571925e+27) -
                         (dVar339 * local_63b8) / 3.26018619408384e+18) +
                        (dVar340 * local_63b8) / 2.1394273287347896e+20) -
                       (dVar341 * local_63b8) / 1.493478751555308e+22) +
                      (dVar336 * local_63b8) / 17589608644608.0) -
                     (dVar337 * local_63b8) / 929135308308480.0) +
                    (dVar338 * local_63b8) / 5.3093446189056e+16) -
                   (dVar333 * local_63b8) / 210862080.0) + (dVar334 * local_63b8) / 8272281600.0) -
                 (dVar335 * local_63b8) / 363245076480.0) + (dVar332 * local_63b8) / 6150144.0 +
                 (dVar330 * local_63b8) / 9408.0 +
                 ((dVar106 * local_60d8 * 0.007653061224489796 * local_5fc8 +
                  ((((((((dVar109 * local_60d8 * 4.22754329004329e-05 * local_5fc8 +
                         (((((((-(dVar119 * local_60d8) * local_5fc8) / 7.923804921239962e+18 +
                              (dVar120 * local_60d8 * local_5fc8) / 5.149926729501062e+20) -
                             (dVar122 * local_60d8 * local_5fc8) / 3.5634170434773477e+22) +
                            (dVar123 * local_60d8 * local_5fc8) / 2.614442878957712e+24) -
                           (dVar124 * local_60d8 * local_5fc8) / 2.0268157175919785e+26) +
                          (dVar105 * local_60d8 * local_5fc8) / 1.6551271225536316e+28) -
                         (dVar107 * local_60d8 * local_5fc8) / 1.4198444362090846e+30)) -
                        (dVar110 * local_60d8 * local_5fc8) / 559104.0) +
                       (dVar111 * local_60d8 * local_5fc8) / 16220160.0) -
                      (dVar113 * local_60d8 * local_5fc8) / 551485440.0) +
                     (dVar114 * local_60d8 * local_5fc8) / 21367357440.0) -
                    (dVar115 * local_60d8 * local_5fc8) / 925768876032.0) +
                   (dVar116 * local_60d8 * local_5fc8) / 44244538490880.0) -
                  (dVar117 * local_60d8 * local_5fc8) / 2.308410703872e+15) +
                  (dVar118 * local_60d8 * local_5fc8) / 1.304074477633536e+17) -
                 (dVar108 * local_60d8 * local_5fc8) / 1344.0);
  }
  else {
    local_63c8 = local_63c0 * 1.1428571428571428 * dVar139 +
                 local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_63c0 +
                 dVar349 * 4.0 * dVar343 * local_60e0 * local_5fd0 +
                 -dVar136 * dVar424 +
                 -(dVar137 * local_60e0 * 480.0) * dVar345 +
                 dVar348 * 240.0 * local_63c0 * dVar138 +
                 dVar51 * local_5fd0 * 240.0 * local_60e0 * dVar138 +
                 dVar126 * 24.0 *
                 (dVar128 * local_63c0 * 30720.0 +
                 dVar126 * local_63c0 * -5760.0 +
                 local_5ec0 * local_63c0 * 448.0 +
                 local_5fd0 * local_60e0 * 448.0 +
                 dVar125 * local_60e0 * -17280.0 * local_5fd0 +
                 dVar127 * local_60e0 * 153600.0 * local_5fd0) +
                 dVar431 * 72.0 * local_5fd0 +
                 dVar346 * 72.0 * local_63c0 +
                 dVar347 * 72.0 * local_60e0 +
                 dVar135 * 144.0 * local_5fd0 * local_60e0 +
                 -(dVar90 * 1.5) * dVar424 +
                 (dVar134 * local_63c0 * 26880.0 +
                 dVar127 * local_63c0 * -2880.0 +
                 dVar125 * local_63c0 * 768.0 +
                 local_63c0 * -8.0 +
                 -(dVar129 * local_60e0 * 8847360.0) * local_5fd0 +
                 -(dVar130 * 1105920.0) * local_63c0 +
                 dVar128 * local_60e0 * 161280.0 * local_5fd0 +
                 local_5ec0 * local_60e0 * 1536.0 * local_5fd0 +
                 -(dVar126 * local_60e0 * 11520.0 * local_5fd0)) * dVar133 +
                 (dVar429 * dVar345) / 2.0 + (dVar342 * dVar430) / 2.0 +
                 (dVar344 * local_63c0 * dVar133) / 2.0 + (dVar131 * dVar424) / 4.0) +
                 local_60e0 * 1.1428571428571428 * dVar350 +
                 local_5fd0 * 1.1428571428571428 * dVar432;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_63d0 = 0.0;
  }
  else {
    local_63d0 = -(dVar12 * 0.36927938319101117) *
                 (-(dVar433 * 0.010531842222222223) * dVar353 +
                 -(dVar433 * 0.07021228148148148) * dVar352 +
                 local_63c8 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 -(dVar519 * 0.1728395061728395) * dVar327 +
                 local_60d0 * dVar323 * 0.43209876543209874 * dVar100 +
                 local_63b0 * dVar96 * 0.43209876543209874 * dVar100 +
                 local_6398 * dVar60 + -((local_60b8 * dVar295 * dVar283) / 5.0)) +
                 ((-(dVar269 * 0.36927938319101117) * dVar434 +
                  ((((-(dVar423 * 0.36927938319101117) * dVar354 +
                     local_6360 * dVar11 * -0.36927938319101117 * dVar143 + -(dVar121 / 8.0)) -
                    dVar514 / 8.0) + dVar516) - dVar517 / 8.0)) - dVar174 / 8.0);
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_63d8 = 0.0;
  }
  else {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_63e0 = 0.0;
    }
    else {
      local_63e0 = dVar2 * 2.0;
    }
    local_63d8 = local_63e0;
  }
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_63e8 = 0.0;
  }
  else {
    local_63e8 = dVar19 * local_60f8 * 0.4444444444444444 * local_5fe8 +
                 dVar146 * 1.3333333333333333 * local_63d8;
  }
  dVar354 = local_6108 * dVar270 * 0.9847450218426964 * dVar266;
  dVar424 = dVar356 * 0.9847450218426964 * dVar460;
  dVar514 = dVar277 * dVar275 * dVar436 * dVar160 * dVar441;
  dVar158 = dVar277 * dVar275 * dVar158 * dVar362 * local_6120;
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    local_63f0 = 0.0;
  }
  else {
    if ((dVar31 != 0.0) || (NAN(dVar31))) {
      local_63f8 = 0.0;
    }
    else {
      local_63f8 = -local_63f8;
    }
    local_63f0 = local_63f8;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_6400 = 0.0;
  }
  else {
    local_6400 = local_5ef0 * local_6110 * -0.2222222222222222 * local_6000 +
                 (dVar363 * local_63f0) / 3.0;
  }
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6408 = 0.0;
  }
  else {
    local_6408 = (dVar161 + dVar14 / 54.0 + dVar514 / 540.0 +
                  (dVar277 * dVar437 * dVar362 * dVar441 * local_6010) / 180.0 + dVar158 / 54.0 +
                 (dVar277 * dVar361 * local_5f00 * local_6120 * local_6010) / 9.0) -
                 (dVar277 * dVar361 * dVar362 * local_6400) / 18.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6410 = local_6408;
  }
  else {
    local_6410 = 0.0;
  }
  local_6420 = ((((((((((((dVar167 * local_6130 * local_6020) / 6.0 - (dVar359 * local_6410) / 18.0)
                        - (dVar168 * local_6130 * local_6020) / 48.0) +
                        (dVar364 * local_6410) / 240.0 + (dVar170 * local_6130 * local_6020) / 640.0
                       ) - (dVar365 * local_6410) / 4480.0) -
                     (dVar171 * local_6130 * local_6020) / 11520.0) +
                     (dVar366 * local_6410) / 103680.0 +
                    (dVar172 * local_6130 * local_6020) / 258048.0) -
                   (dVar367 * local_6410) / 2838528.0) -
                  (dVar173 * local_6130 * local_6020) / 6881280.0) +
                  (dVar368 * local_6410) / 89456640.0 +
                 (dVar175 * local_6130 * local_6020) / 212336640.0) -
                (dVar166 * local_6410) / 3185049600.0) -
               (dVar165 * local_6130 * local_6020) / 7431782400.0) +
               (local_5f10 * local_6410) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6418 = 0.0;
  }
  else {
    local_6418 = local_6408;
  }
  dVar14 = dVar180 * local_6138;
  dVar515 = dVar180 * local_6028;
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_6420 = -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_6418) * dVar180 +
                  -(dVar369 * 4.0) * local_6418 +
                  -(dVar179 * local_6028) * dVar14 +
                  -(local_6028 * dVar181 * 4.0) * local_6138 +
                  dVar513 * local_6138 * -2.0 * dVar515 + (dVar358 * local_6418 * dVar180) / 2.0 +
                  (dVar178 * local_6138 * dVar515) / 4.0) +
                 local_6028 * 2.0 * dVar360 +
                 local_6138 * 2.0 * dVar370 +
                 local_6418 * 2.0 * dVar182 +
                 -dVar169 * local_6418 +
                 dVar267 * 2.0 * local_6138 * local_6028 + (-(dVar159 * local_6028) * dVar14) / 2.0)
                 + -(local_6418 * 2.6666666666666665) * dVar177 +
                   local_6028 * -2.6666666666666665 * dVar442 +
                   -(local_6138 * 2.6666666666666665 * dVar371);
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6428 = local_6408;
  }
  else {
    local_6428 = 0.0;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6430 = 0.0;
  }
  else {
    local_6430 = local_6408;
  }
  dVar445 = local_5f30 * dVar445;
  dVar517 = dVar213 * local_6150 * 768.0 * local_6040;
  dVar520 = dVar391 * 256.0 * local_6430;
  dVar446 = dVar446 * dVar394;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6438 = ((((((((((dVar187 * local_6428) / 1.5793369227989443e+26 -
                         (dVar372 * local_6428) / 1.2429808430244664e+28) +
                        (dVar188 * local_6428) / 1.0288727798616555e+30) -
                       (dVar379 * local_6428) / 8.934630842486435e+31) +
                       (dVar189 * local_6428) / 8.121312287389663e+33 +
                      (dVar385 * local_6428) / 1017328435200.0) -
                     (dVar386 * local_6428) / 46351421276160.0) +
                    (dVar387 * local_6428) / 2.308410703872e+15) -
                   (dVar388 * local_6428) / 1.24654178009088e+17) +
                  (dVar389 * local_6428) / 7.250540450807808e+18) -
                 (dVar373 * local_6428) / 4.517479587281633e+20) +
                 ((((dVar380 * local_6428 * -3.0438311688311688e-05 +
                     -(dVar377 * 0.005357142857142857) * local_6428 +
                     (((dVar375 * local_6428) / 3.000772247138819e+22 -
                      (local_5f28 * local_6428) / 2.116453759156243e+24) -
                     (dVar374 * local_6428) / 7.71114500014776e+35) +
                     (dVar376 * local_6428) / 7.633819549822504e+37 +
                     (dVar378 * local_6428) / 1920.0 + (dVar381 * local_6428) / 745472.0) -
                   (dVar382 * local_6428) / 20643840.0) + (dVar383 * local_6428) / 668467200.0) -
                 (dVar384 * local_6428) / 24654643200.0) +
                 -(dVar209 * local_6148 * 1.0330674055506187e-21) * local_6038 +
                 dVar195 * local_6148 * 6.419508807886076e-20 * local_6038 +
                 ((dVar202 * local_6148 * 6.297278025793651e-07 * local_6038 +
                  -(dVar201 * local_6148 * 1.475575206043956e-05) * local_6038 +
                  dVar200 * local_6148 * 0.0002739448051948052 * local_6038 +
                  -(dVar198 * local_6148 * 0.0036458333333333334) * local_6038 +
                  dVar197 * local_6148 * 0.026785714285714284 * local_6038 +
                  -(dVar191 * local_6148 * 6.156813072833613e-37) * local_6038 +
                  (dVar196 * local_6148 * local_6038) / 1.7135877778106135e+34) -
                 (dVar203 * local_6148 * local_6038) / 44564480.0) +
                 (dVar210 * local_6148 * local_6038) / 6.413496239867403e+22 +
                 ((-(dVar207 * local_6148 * 9.963564958965524e-15) * local_6038 +
                   -(dVar205 * local_6148 * 1.8676367771303596e-11) * local_6038 +
                   dVar204 * local_6148 * 6.895252899056353e-10 * local_6038 +
                   -(dVar193 * local_6148 * 5.2947108149957596e-33) * local_6038 +
                   dVar199 * local_6148 * 4.588885732696935e-31 * local_6038 +
                   ((dVar194 * local_6148 * 2.9767152251494278e-27 * local_6038 +
                    (-(dVar211 * local_6148) * local_6038) / 4.5123912079969836e+24) -
                   (dVar212 * local_6148 * local_6038) / 2.638135332978604e+28) +
                   (dVar206 * local_6148 * local_6038) / 2207210536960.0 +
                  (dVar208 * local_6148 * local_6038) / 4.98616712036352e+15) -
                 (dVar190 * local_6148 * local_6038) / 2.68538535215104e+17);
  }
  else {
    local_6438 = (-(dVar397 * 10.0) * local_6430 +
                 -(dVar518 * local_6040 * 5.0) * dVar447 +
                 local_6430 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_6430 * -72.0 +
                 local_6040 * local_6150 * -72.0 +
                 -(dVar524 * 1.5) * dVar447 * local_6040 +
                 (((local_6040 * local_6150 * 40.0 + local_5f30 * local_6430 * 40.0) - dVar517) -
                 dVar520) * dVar216 + (dVar446 * dVar396) / 2.0 + (dVar393 * dVar447) / 2.0 +
                 (dVar395 * local_6430 * dVar216) / 2.0 + (dVar215 * dVar447 * local_6040) / 4.0 +
                 dVar517 + dVar520) * 24.0 * dVar213 +
                 local_6150 * 48.0 * local_6040 * dVar218 +
                 local_6150 * 48.0 * dVar392 +
                 dVar390 * 48.0 * local_6430 + local_6040 * 48.0 * dVar445;
  }
  dVar517 = local_6048 * dVar16 * 1.8171205928321397;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6440 = local_6408;
  }
  else {
    local_6440 = 0.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6448 = 0.0;
  }
  else {
    local_6448 = local_6408;
  }
  dVar453 = dVar453 * dVar413;
  dVar520 = dVar454 * local_6058;
  dVar455 = dVar248 * dVar455;
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6450 = -(dVar399 * 0.001530612244897959) * local_6440 +
                 ((((((dVar401 * local_6440 * -4.6972703222703225e-06 +
                       ((((((-(dVar409 * local_6440) / 3.26018619408384e+18 +
                            (dVar410 * local_6440) / 2.1394273287347896e+20) -
                           (dVar411 * local_6440) / 1.493478751555308e+22) +
                          (dVar235 * local_6440) / 1.1046592834779778e+24) -
                         (local_5f40 * local_6440) / 8.627661500560449e+25) +
                        (dVar226 * local_6440) / 7.093855011571925e+27) -
                       (dVar398 * local_6440) / 6.123970353448437e+29) +
                       (dVar227 * local_6440) / 5.53739330121543e+31 +
                       (dVar400 * local_6440) / 9408.0 + (dVar402 * local_6440) / 6150144.0) -
                     (dVar403 * local_6440) / 210862080.0) + (dVar404 * local_6440) / 8272281600.0)
                   - (dVar405 * local_6440) / 363245076480.0) +
                  (dVar406 * local_6440) / 17589608644608.0) -
                 (dVar407 * local_6440) / 929135308308480.0) +
                 (dVar408 * local_6440) / 5.3093446189056e+16 +
                 dVar229 * local_6160 * 0.007653061224489796 * local_6050 +
                 ((((dVar232 * local_6160 * 4.22754329004329e-05 * local_6050 +
                    ((((((((((((-(dVar238 * local_6160) * local_6050) / 925768876032.0 +
                              (dVar239 * local_6160 * local_6050) / 44244538490880.0) -
                             (dVar240 * local_6160 * local_6050) / 2.308410703872e+15) +
                            (dVar241 * local_6160 * local_6050) / 1.304074477633536e+17) -
                           (dVar242 * local_6160 * local_6050) / 7.923804921239962e+18) +
                          (dVar243 * local_6160 * local_6050) / 5.149926729501062e+20) -
                         (dVar245 * local_6160 * local_6050) / 3.5634170434773477e+22) +
                        (dVar246 * local_6160 * local_6050) / 2.614442878957712e+24) -
                       (dVar247 * local_6160 * local_6050) / 2.0268157175919785e+26) +
                      (dVar228 * local_6160 * local_6050) / 1.6551271225536316e+28) -
                     (dVar230 * local_6160 * local_6050) / 1.4198444362090846e+30) -
                    (dVar231 * local_6160 * local_6050) / 1344.0)) -
                   (dVar233 * local_6160 * local_6050) / 559104.0) +
                  (dVar234 * local_6160 * local_6050) / 16220160.0) -
                 (dVar236 * local_6160 * local_6050) / 551485440.0) +
                 (dVar237 * local_6160 * local_6050) / 21367357440.0;
  }
  else {
    local_6450 = local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6448 +
                 dVar419 * 4.0 * dVar413 * local_6168 * local_6058 +
                 -dVar259 * dVar520 +
                 -(dVar260 * local_6168 * 480.0) * dVar415 +
                 dVar418 * 240.0 * local_6448 * dVar261 +
                 dVar51 * local_6058 * 240.0 * local_6168 * dVar261 +
                 dVar249 * 24.0 *
                 (dVar251 * local_6448 * 30720.0 +
                 dVar249 * local_6448 * -5760.0 +
                 local_5f48 * local_6448 * 448.0 +
                 local_6058 * local_6168 * 448.0 +
                 local_6058 * -17280.0 * dVar248 * local_6168 +
                 local_6058 * 153600.0 * dVar250 * local_6168) +
                 dVar455 * 72.0 * local_6058 +
                 dVar416 * 72.0 * local_6448 +
                 dVar417 * 72.0 * local_6168 +
                 dVar258 * 144.0 * local_6058 * local_6168 +
                 -(dVar192 * 1.5) * dVar520 +
                 (dVar257 * local_6448 * 26880.0 +
                 dVar250 * local_6448 * -2880.0 +
                 dVar248 * local_6448 * 768.0 +
                 local_6448 * -8.0 +
                 -(local_6448 * 1105920.0) * dVar253 +
                 -(local_6058 * 8847360.0) * dVar252 * local_6168 +
                 local_6058 * 161280.0 * dVar251 * local_6168 +
                 local_6058 * 1536.0 * local_5f48 * local_6168 +
                 -(local_6058 * 11520.0 * dVar249 * local_6168)) * dVar256 +
                 (dVar453 * dVar415) / 2.0 + (dVar412 * dVar454) / 2.0 +
                 (dVar414 * local_6448 * dVar256) / 2.0 + (dVar254 * dVar520) / 4.0) +
                 local_6448 * 1.1428571428571428 * dVar262 +
                 local_6058 * 1.1428571428571428 * dVar456 +
                 local_6168 * 1.1428571428571428 * dVar420;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6458 = 0.0;
  }
  else {
    local_6458 = -(dVar147 * 0.36927938319101117) *
                 (-(dVar421 * 0.010531842222222223) * dVar459 +
                 -(dVar421 * 0.07021228148148148) * dVar458 +
                 local_6450 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265 +
                 -(dVar517 * 0.1728395061728395) * dVar452 +
                 local_6048 * dVar448 * 0.43209876543209874 * dVar223 +
                 local_6438 * dVar16 * 0.43209876543209874 * dVar223 +
                 local_6420 * dVar184 + -((local_6030 * dVar443 * dVar441) / 5.0)) +
                 ((-(dVar355 * 0.36927938319101117) * dVar460 +
                  ((((-(dVar435 * 0.36927938319101117) * dVar422 +
                     local_63e8 * dVar11 * -0.36927938319101117 * dVar266 + -(dVar354 / 8.0)) -
                    dVar21 / 8.0) + dVar49) - dVar59 / 8.0)) - dVar424 / 8.0);
  }
  if ((in_stack_00000008[5] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x6c);
    *(double *)(in_stack_00000008[5] + 8 + lVar3 * 8) =
         __x * (local_63d0 + local_6458) + local_5fe0 + local_6068 + local_60f0 + local_6178 +
         *(double *)(in_stack_00000008[5] + 8 + lVar3 * 8);
  }
  local_6508 = dVar268 + dVar268 + dVar7 * 2.0;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_6460 = 0.0;
  }
  else {
    if ((dVar6 != 0.0) || (local_6468 = local_6508, NAN(dVar6))) {
      local_6468 = 0.0;
    }
    local_6460 = local_6468;
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_6470 = 0.0;
  }
  else {
    local_6470 = dVar512 * 0.4444444444444444 * local_6070 * local_6070 +
                 dVar10 * 1.3333333333333333 * local_6460;
  }
  dVar7 = local_60a8 * local_60a8;
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    local_6478 = 0.0;
  }
  else {
    if ((dVar32 != 0.0) || (local_6480 = local_6508, NAN(dVar32))) {
      local_6480 = 0.0;
    }
    local_6478 = local_6480;
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    local_6488 = 0.0;
  }
  else {
    local_6488 = local_5e68 * -0.2222222222222222 * local_6088 * local_6088 +
                 (dVar286 * local_6478) / 3.0;
  }
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6490 = 0.0;
  }
  else {
    local_6490 = (dVar36 + dVar30 / 27.0 +
                 (dVar277 * dVar284 * local_5e78 * local_6098 * local_6098) / 9.0) -
                 (dVar277 * dVar284 * dVar285 * local_6488) / 18.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6498 = local_6490;
  }
  else {
    local_6498 = 0.0;
  }
  local_64a8 = ((((((((((((dVar42 * dVar7) / 6.0 - (dVar274 * local_6498) / 18.0) -
                        (dVar43 * dVar7) / 48.0) + (dVar287 * local_6498) / 240.0 +
                       (dVar45 * dVar7) / 640.0) - (dVar288 * local_6498) / 4480.0) -
                     (dVar46 * dVar7) / 11520.0) + (dVar289 * local_6498) / 103680.0 +
                    (dVar47 * dVar7) / 258048.0) - (dVar290 * local_6498) / 2838528.0) -
                  (dVar48 * dVar7) / 6881280.0) + (dVar291 * local_6498) / 89456640.0 +
                 (dVar50 * dVar7) / 212336640.0) - (dVar41 * local_6498) / 3185049600.0) -
               (dVar40 * dVar7) / 7431782400.0) + (local_5e88 * local_6498) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_64a0 = 0.0;
  }
  else {
    local_64a0 = local_6490;
  }
  dVar7 = local_60b0 * local_60b0;
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_64a8 = -(local_5e90 * 2.6666666666666665) *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_64a0) * dVar56 +
                  -(dVar292 * 4.0) * local_64a0 +
                  -(dVar55 * dVar7) * dVar56 +
                  -(dVar7 * 4.0) * dVar57 +
                  dVar522 * -2.0 * dVar7 * dVar56 + (dVar273 * local_64a0 * dVar56) / 2.0 +
                  (dVar54 * dVar7 * dVar56) / 4.0) +
                 local_60b0 * 4.0 * dVar276 +
                 local_64a0 * 2.0 * dVar58 +
                 -dVar44 * local_64a0 + dVar521 * 2.0 * dVar7 + (-(dVar34 * dVar7) * dVar56) / 2.0)
                 + local_64a0 * -2.6666666666666665 * dVar53 +
                   -(local_60b0 * 5.333333333333333 * dVar425);
  }
  dVar7 = local_60c0 * local_60c0;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_64b0 = local_6490;
  }
  else {
    local_64b0 = 0.0;
  }
  dVar9 = local_60c8 * local_60c8;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_64b8 = 0.0;
  }
  else {
    local_64b8 = local_6490;
  }
  dVar10 = dVar89 * 768.0 * dVar9;
  dVar21 = dVar316 * 256.0 * local_64b8;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_64c0 = ((((((dVar77 * dVar7 * -1.475575206043956e-05 +
                       dVar76 * dVar7 * 0.0002739448051948052 +
                       dVar73 * 0.026785714285714284 * dVar7 +
                       -(dVar74 * dVar7 * 0.0036458333333333334) +
                      (dVar63 * local_64b0) / 1.5793369227989443e+26) -
                     (dVar297 * local_64b0) / 1.2429808430244664e+28) +
                    (dVar64 * local_64b0) / 1.0288727798616555e+30) -
                   (dVar304 * local_64b0) / 8.934630842486435e+31) +
                   (dVar65 * local_64b0) / 8.121312287389663e+33 +
                  (dVar310 * local_64b0) / 1017328435200.0) -
                 (dVar311 * local_64b0) / 46351421276160.0) +
                 ((dVar305 * local_64b0 * -3.0438311688311688e-05 +
                   -(dVar302 * 0.005357142857142857) * local_64b0 +
                   ((((((dVar312 * local_64b0) / 2.308410703872e+15 -
                       (dVar313 * local_64b0) / 1.24654178009088e+17) +
                      (dVar314 * local_64b0) / 7.250540450807808e+18) -
                     (dVar298 * local_64b0) / 4.517479587281633e+20) +
                    (dVar300 * local_64b0) / 3.000772247138819e+22) -
                   (local_5ea0 * local_64b0) / 2.116453759156243e+24) +
                   (dVar303 * local_64b0) / 1920.0 + (dVar306 * local_64b0) / 745472.0) -
                 (dVar307 * local_64b0) / 20643840.0) +
                 dVar75 * dVar7 * 4.588885732696935e-31 +
                 ((dVar70 * dVar7 * 2.9767152251494278e-27 +
                  ((dVar85 * dVar7 * -1.0330674055506187e-21 +
                    dVar71 * dVar7 * 6.419508807886076e-20 +
                    (((dVar308 * local_64b0) / 668467200.0 - (dVar309 * local_64b0) / 24654643200.0)
                    - (dVar299 * local_64b0) / 7.71114500014776e+35) +
                    (dVar301 * local_64b0) / 7.633819549822504e+37 +
                   (dVar86 * dVar7) / 6.413496239867403e+22) -
                  (dVar87 * dVar7) / 4.5123912079969836e+24)) -
                 (dVar88 * dVar7) / 2.638135332978604e+28) +
                 dVar67 * dVar7 * -6.156813072833613e-37 +
                 ((dVar78 * dVar7 * 6.297278025793651e-07 +
                  ((dVar83 * dVar7 * -9.963564958965524e-15 +
                    dVar81 * dVar7 * -1.8676367771303596e-11 +
                    dVar69 * dVar7 * -5.2947108149957596e-33 +
                    dVar80 * dVar7 * 6.895252899056353e-10 + (dVar82 * dVar7) / 2207210536960.0 +
                   (dVar84 * dVar7) / 4.98616712036352e+15) -
                  (dVar66 * dVar7) / 2.68538535215104e+17)) - (dVar79 * dVar7) / 44564480.0) +
                 (dVar72 * dVar7) / 1.7135877778106135e+34;
  }
  else {
    local_64c0 = local_64b8 * 48.0 * dVar315 +
                 dVar94 * 48.0 * dVar9 +
                 local_60c8 * 96.0 * dVar426 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_64b8 +
                 -(dVar68 * 5.0 * dVar9) * dVar92 +
                 local_64b8 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_64b8 * -72.0 +
                 dVar9 * -72.0 +
                 -(dVar523 * 1.5) * dVar9 * dVar92 +
                 (((dVar9 * 40.0 + local_5ea8 * local_64b8 * 40.0) - dVar10) - dVar21) * dVar92 +
                 dVar427 * dVar428 + (dVar320 * local_64b8 * dVar92) / 2.0 +
                 (dVar91 * dVar9 * dVar92) / 4.0 + dVar10 + dVar21);
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_64c8 = local_6490;
  }
  else {
    local_64c8 = 0.0;
  }
  dVar7 = local_60d8 * local_60d8;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_64d0 = 0.0;
  }
  else {
    local_64d0 = local_6490;
  }
  dVar9 = local_60e0 * local_60e0;
  dVar10 = dVar9 * dVar133;
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_64d8 = -(dVar329 * 0.001530612244897959) * local_64c8 +
                 ((((((dVar331 * local_64c8 * -4.6972703222703225e-06 +
                       ((((((-(dVar328 * local_64c8) / 6.123970353448437e+29 +
                             (dVar104 * local_64c8) / 5.53739330121543e+31 +
                            (dVar338 * local_64c8) / 5.3093446189056e+16) -
                           (dVar339 * local_64c8) / 3.26018619408384e+18) +
                          (dVar340 * local_64c8) / 2.1394273287347896e+20) -
                         (dVar341 * local_64c8) / 1.493478751555308e+22) +
                        (dVar112 * local_64c8) / 1.1046592834779778e+24) -
                       (local_5eb8 * local_64c8) / 8.627661500560449e+25) +
                       (dVar103 * local_64c8) / 7.093855011571925e+27 +
                       (dVar330 * local_64c8) / 9408.0 + (dVar332 * local_64c8) / 6150144.0) -
                     (dVar333 * local_64c8) / 210862080.0) + (dVar334 * local_64c8) / 8272281600.0)
                   - (dVar335 * local_64c8) / 363245076480.0) +
                  (dVar336 * local_64c8) / 17589608644608.0) -
                 (dVar337 * local_64c8) / 929135308308480.0) +
                 ((((((dVar109 * dVar7 * 4.22754329004329e-05 +
                      ((dVar106 * 0.007653061224489796 * dVar7 +
                       ((((((((((dVar116 * dVar7) / 44244538490880.0 -
                               (dVar117 * dVar7) / 2.308410703872e+15) +
                              (dVar118 * dVar7) / 1.304074477633536e+17) -
                             (dVar119 * dVar7) / 7.923804921239962e+18) +
                            (dVar120 * dVar7) / 5.149926729501062e+20) -
                           (dVar122 * dVar7) / 3.5634170434773477e+22) +
                          (dVar123 * dVar7) / 2.614442878957712e+24) -
                         (dVar124 * dVar7) / 2.0268157175919785e+26) +
                        (dVar105 * dVar7) / 1.6551271225536316e+28) -
                       (dVar107 * dVar7) / 1.4198444362090846e+30)) - (dVar108 * dVar7) / 1344.0)) -
                     (dVar110 * dVar7) / 559104.0) + (dVar111 * dVar7) / 16220160.0) -
                   (dVar113 * dVar7) / 551485440.0) + (dVar114 * dVar7) / 21367357440.0) -
                 (dVar115 * dVar7) / 925768876032.0);
  }
  else {
    local_64d8 = local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_64d0 +
                 dVar349 * 4.0 * dVar343 * dVar9 +
                 -dVar136 * dVar10 +
                 -(dVar137 * 480.0 * dVar9) * dVar133 +
                 dVar348 * 240.0 * local_64d0 * dVar138 +
                 dVar51 * 240.0 * dVar9 * dVar138 +
                 dVar126 * 24.0 *
                 (dVar128 * local_64d0 * 30720.0 +
                 dVar127 * dVar9 * 153600.0 +
                 dVar126 * local_64d0 * -5760.0 +
                 dVar125 * dVar9 * -17280.0 + dVar9 * 448.0 + local_5ec0 * local_64d0 * 448.0) +
                 dVar346 * 72.0 * local_64d0 +
                 dVar431 * 144.0 * local_60e0 +
                 dVar135 * 144.0 * dVar9 +
                 -(dVar90 * 1.5) * dVar10 +
                 (dVar134 * local_64d0 * 26880.0 +
                 dVar128 * dVar9 * 161280.0 +
                 dVar127 * local_64d0 * -2880.0 +
                 dVar126 * dVar9 * -11520.0 +
                 dVar125 * local_64d0 * 768.0 +
                 local_5ec0 * dVar9 * 1536.0 +
                 local_64d0 * -8.0 +
                 dVar129 * -8847360.0 * dVar9 + -(dVar130 * 1105920.0 * local_64d0)) * dVar133 +
                 dVar429 * dVar430 + (dVar344 * local_64d0 * dVar133) / 2.0 +
                 (dVar131 * dVar10) / 4.0) +
                 local_64d0 * 1.1428571428571428 * dVar139 +
                 local_60e0 * 2.2857142857142856 * dVar432;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_64e0 = 0.0;
  }
  else {
    local_64e0 = -(dVar12 * 0.36927938319101117) *
                 (local_64d8 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 local_64a8 * dVar60 + local_64c0 * dVar96 * 0.43209876543209874 * dVar100) +
                 ((-(dVar423 * 0.7385587663820223) * dVar434 +
                   local_6470 * dVar11 * -0.36927938319101117 * dVar143 + -(dVar121 / 4.0) + dVar516
                  ) - dVar174 / 4.0);
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_64e8 = 0.0;
  }
  else {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_64f0 = 0.0;
    }
    else {
      local_64f0 = dVar2 * 2.0 - (dVar268 + dVar268);
    }
    local_64e8 = local_64f0;
  }
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_64f8 = 0.0;
  }
  else {
    local_64f8 = dVar19 * 0.4444444444444444 * local_60f8 * local_60f8 +
                 dVar146 * 1.3333333333333333 * local_64e8;
  }
  dVar5 = in_RCX[2] * ((1.0 / dVar150) / dVar154);
  dVar6 = dVar18 * 1.4711144691358025 * dVar5 +
          dVar24 * 0.09086050111697706 * dVar153 * ((1.0 / dVar149) / (dVar154 * dVar148 * dVar272))
  ;
  dVar156 = dVar156 * dVar156;
  dVar7 = dVar15 * ((1.0 / dVar157) / dVar156);
  dVar9 = dVar441 * dVar441;
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    local_6500 = 0.0;
  }
  else {
    if ((dVar31 != 0.0) || (NAN(dVar31))) {
      local_6508 = 0.0;
    }
    else {
      local_6508 = -local_6508;
    }
    local_6500 = local_6508;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_6510 = 0.0;
  }
  else {
    local_6510 = local_5ef0 * -0.2222222222222222 * local_6110 * local_6110 +
                 (dVar363 * local_6500) / 3.0;
  }
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6518 = 0.0;
  }
  else {
    local_6518 = (((dVar277 * 0.006111111111111111 * dVar7 * dVar160 * dVar9 +
                    dVar161 + dVar514 / 270.0 + dVar158 / 27.0 +
                   (dVar277 * dVar437 * dVar362 * dVar441 * local_6120) / 90.0) -
                  (dVar277 * dVar437 * dVar160 * dVar6) / 180.0) +
                 (dVar277 * dVar361 * local_5f00 * local_6120 * local_6120) / 9.0) -
                 (dVar277 * dVar361 * dVar362 * local_6510) / 18.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6520 = local_6518;
  }
  else {
    local_6520 = 0.0;
  }
  dVar8 = local_6160 * local_6160;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6528 = 0.0;
  }
  else {
    local_6528 = local_6518;
  }
  dVar10 = local_6168 * local_6168;
  dVar19 = dVar10 * dVar256;
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6530 = -(dVar399 * 0.001530612244897959) * local_6520 +
                 dVar401 * local_6520 * -4.6972703222703225e-06 +
                 ((((((((((((((dVar227 * local_6520) / 5.53739330121543e+31 +
                             (dVar226 * local_6520) / 7.093855011571925e+27) -
                            (dVar398 * local_6520) / 6.123970353448437e+29) +
                           (dVar235 * local_6520) / 1.1046592834779778e+24) -
                          (local_5f40 * local_6520) / 8.627661500560449e+25) +
                         (dVar410 * local_6520) / 2.1394273287347896e+20) -
                        (dVar411 * local_6520) / 1.493478751555308e+22) +
                       (dVar408 * local_6520) / 5.3093446189056e+16) -
                      (dVar409 * local_6520) / 3.26018619408384e+18) +
                     (dVar406 * local_6520) / 17589608644608.0) -
                    (dVar407 * local_6520) / 929135308308480.0) +
                   (dVar404 * local_6520) / 8272281600.0) - (dVar405 * local_6520) / 363245076480.0)
                 - (dVar403 * local_6520) / 210862080.0) + (dVar402 * local_6520) / 6150144.0 +
                 (dVar400 * local_6520) / 9408.0 +
                 ((dVar229 * 0.007653061224489796 * dVar8 +
                  ((((((dVar232 * dVar8 * 4.22754329004329e-05 +
                       (((((((-(dVar247 * dVar8) / 2.0268157175919785e+26 +
                             (dVar228 * dVar8) / 1.6551271225536316e+28) -
                            (dVar230 * dVar8) / 1.4198444362090846e+30) -
                           (dVar242 * dVar8) / 7.923804921239962e+18) +
                          (dVar243 * dVar8) / 5.149926729501062e+20) -
                         (dVar245 * dVar8) / 3.5634170434773477e+22) +
                         (dVar246 * dVar8) / 2.614442878957712e+24 +
                        (dVar239 * dVar8) / 44244538490880.0) -
                       (dVar240 * dVar8) / 2.308410703872e+15) +
                       (dVar241 * dVar8) / 1.304074477633536e+17) - (dVar233 * dVar8) / 559104.0) +
                     (dVar234 * dVar8) / 16220160.0) - (dVar236 * dVar8) / 551485440.0) +
                   (dVar237 * dVar8) / 21367357440.0) - (dVar238 * dVar8) / 925768876032.0)) -
                 (dVar231 * dVar8) / 1344.0);
  }
  else {
    local_6530 = local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6528 +
                 dVar419 * 4.0 * dVar413 * dVar10 +
                 -dVar259 * dVar19 +
                 -(dVar260 * 480.0 * dVar10) * dVar256 +
                 dVar418 * 240.0 * local_6528 * dVar261 +
                 dVar51 * 240.0 * dVar10 * dVar261 +
                 dVar249 * 24.0 *
                 (dVar251 * local_6528 * 30720.0 +
                 dVar250 * dVar10 * 153600.0 +
                 dVar249 * local_6528 * -5760.0 +
                 dVar248 * dVar10 * -17280.0 + dVar10 * 448.0 + local_5f48 * local_6528 * 448.0) +
                 dVar416 * 72.0 * local_6528 +
                 dVar455 * 144.0 * local_6168 +
                 dVar258 * 144.0 * dVar10 +
                 -(dVar192 * 1.5) * dVar19 +
                 (dVar257 * local_6528 * 26880.0 +
                 dVar251 * dVar10 * 161280.0 +
                 dVar250 * local_6528 * -2880.0 +
                 dVar249 * dVar10 * -11520.0 +
                 dVar248 * local_6528 * 768.0 +
                 local_5f48 * dVar10 * 1536.0 +
                 local_6528 * -8.0 +
                 local_6528 * -1105920.0 * dVar253 + -(dVar10 * 8847360.0 * dVar252)) * dVar256 +
                 dVar453 * dVar454 + (dVar414 * local_6528 * dVar256) / 2.0 +
                 (dVar254 * dVar19) / 4.0) +
                 local_6528 * 1.1428571428571428 * dVar262 +
                 local_6168 * 2.2857142857142856 * dVar456;
  }
  dVar8 = local_6158 * dVar16 * 1.8171205928321397;
  dVar10 = local_5f38 * dVar448 * 1.8171205928321397;
  dVar19 = (1.0 / dVar221) / dVar156;
  dVar21 = dVar17 * dVar19;
  dVar30 = local_6130 * local_6130;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6538 = local_6518;
  }
  else {
    local_6538 = 0.0;
  }
  local_6548 = ((((((((((((dVar167 * dVar30) / 6.0 - (dVar359 * local_6538) / 18.0) -
                        (dVar168 * dVar30) / 48.0) + (dVar364 * local_6538) / 240.0 +
                       (dVar170 * dVar30) / 640.0) - (dVar365 * local_6538) / 4480.0) -
                     (dVar171 * dVar30) / 11520.0) + (dVar366 * local_6538) / 103680.0 +
                    (dVar172 * dVar30) / 258048.0) - (dVar367 * local_6538) / 2838528.0) -
                  (dVar173 * dVar30) / 6881280.0) + (dVar368 * local_6538) / 89456640.0 +
                 (dVar175 * dVar30) / 212336640.0) - (dVar166 * local_6538) / 3185049600.0) -
               (dVar165 * dVar30) / 7431782400.0) + (local_5f10 * local_6538) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6540 = 0.0;
  }
  else {
    local_6540 = local_6518;
  }
  dVar30 = local_6138 * local_6138;
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_6548 = -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_6540) * dVar180 +
                  -(dVar369 * 4.0) * local_6540 +
                  -(dVar179 * dVar30) * dVar180 +
                  -(dVar30 * 4.0) * dVar181 +
                  dVar513 * -2.0 * dVar30 * dVar180 + (dVar358 * local_6540 * dVar180) / 2.0 +
                  (dVar178 * dVar30 * dVar180) / 4.0) +
                 local_6138 * 4.0 * dVar360 +
                 local_6540 * 2.0 * dVar182 +
                 -dVar169 * local_6540 +
                 dVar267 * 2.0 * dVar30 + (-(dVar159 * dVar30) * dVar180) / 2.0) +
                 local_6540 * -2.6666666666666665 * dVar177 +
                 -(local_6138 * 5.333333333333333 * dVar442);
  }
  local_5f20 = local_5f20 * ((1.0 / dVar183) / dVar156);
  dVar30 = local_6148 * local_6148;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6550 = local_6518;
  }
  else {
    local_6550 = 0.0;
  }
  dVar31 = local_6150 * local_6150;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6558 = 0.0;
  }
  else {
    local_6558 = local_6518;
  }
  dVar32 = dVar213 * 768.0 * dVar31;
  dVar33 = dVar391 * 256.0 * local_6558;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6560 = (((((((((dVar196 * dVar30) / 1.7135877778106135e+34 +
                         (dVar189 * local_6550) / 8.121312287389663e+33 +
                        (dVar188 * local_6550) / 1.0288727798616555e+30) -
                       (dVar379 * local_6550) / 8.934630842486435e+31) +
                      (dVar187 * local_6550) / 1.5793369227989443e+26) -
                     (dVar372 * local_6550) / 1.2429808430244664e+28) +
                    (dVar375 * local_6550) / 3.000772247138819e+22) -
                   (local_5f28 * local_6550) / 2.116453759156243e+24) +
                  (dVar389 * local_6550) / 7.250540450807808e+18) -
                 (dVar373 * local_6550) / 4.517479587281633e+20) +
                 (dVar387 * local_6550) / 2.308410703872e+15 +
                 -(dVar377 * 0.005357142857142857) * local_6550 +
                 dVar380 * local_6550 * -3.0438311688311688e-05 +
                 ((((((-(dVar388 * local_6550) / 1.24654178009088e+17 +
                      (dVar385 * local_6550) / 1017328435200.0) -
                     (dVar386 * local_6550) / 46351421276160.0) +
                    (dVar383 * local_6550) / 668467200.0) - (dVar384 * local_6550) / 24654643200.0)
                  + (dVar381 * local_6550) / 745472.0) - (dVar382 * local_6550) / 20643840.0) +
                 (dVar378 * local_6550) / 1920.0 + (dVar376 * local_6550) / 7.633819549822504e+37 +
                 dVar209 * dVar30 * -1.0330674055506187e-21 +
                 dVar195 * dVar30 * 6.419508807886076e-20 +
                 ((dVar193 * dVar30 * -5.2947108149957596e-33 +
                   dVar199 * dVar30 * 4.588885732696935e-31 +
                   ((dVar194 * dVar30 * 2.9767152251494278e-27 +
                    ((-(dVar374 * local_6550) / 7.71114500014776e+35 +
                     (dVar210 * dVar30) / 6.413496239867403e+22) -
                    (dVar211 * dVar30) / 4.5123912079969836e+24)) -
                   (dVar212 * dVar30) / 2.638135332978604e+28) +
                  (dVar208 * dVar30) / 4.98616712036352e+15) -
                 (dVar190 * dVar30) / 2.68538535215104e+17) +
                 dVar202 * dVar30 * 6.297278025793651e-07 +
                 dVar201 * dVar30 * -1.475575206043956e-05 +
                 dVar200 * dVar30 * 0.0002739448051948052 +
                 dVar198 * dVar30 * -0.0036458333333333334 +
                 dVar197 * 0.026785714285714284 * dVar30 +
                 dVar191 * dVar30 * -6.156813072833613e-37 +
                 dVar205 * dVar30 * -1.8676367771303596e-11 +
                 dVar204 * dVar30 * 6.895252899056353e-10 +
                 ((dVar207 * dVar30 * -9.963564958965524e-15 + (dVar206 * dVar30) / 2207210536960.0)
                 - (dVar203 * dVar30) / 44564480.0);
  }
  else {
    local_6560 = dVar31 * 48.0 * dVar218 +
                 dVar213 * 24.0 *
                 (-(dVar397 * 10.0) * local_6558 +
                 -(dVar518 * 5.0 * dVar31) * dVar216 +
                 local_6558 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_6558 * -72.0 +
                 dVar31 * -72.0 +
                 -(dVar524 * 1.5) * dVar31 * dVar216 +
                 (((dVar31 * 40.0 + local_5f30 * local_6558 * 40.0) - dVar32) - dVar33) * dVar216 +
                 dVar446 * dVar447 + (dVar395 * local_6558 * dVar216) / 2.0 +
                 (dVar215 * dVar31 * dVar216) / 4.0 + dVar32 + dVar33) +
                 dVar390 * 48.0 * local_6558 + local_6150 * 96.0 * dVar445;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6568 = 0.0;
  }
  else {
    local_6568 = -(dVar147 * 0.36927938319101117) *
                 (local_6158 * dVar448 * 0.8641975308641975 * dVar223 +
                 local_6560 * dVar16 * 0.43209876543209874 * dVar223 +
                 local_5f38 *
                 (in_R9[1] * -0.6468503111111111 * dVar438 + dVar5 * 0.41356361037037037) *
                 0.43209876543209874 * dVar223 +
                 -(local_6140 * dVar443 * 0.4) * dVar441 +
                 ((local_5f20 * 0.24 * dVar9 +
                  local_6548 * dVar184 +
                  dVar449 * 0.2419753086419753 * dVar21 * dVar9 +
                  -(dVar457 * 0.021063684444444446) * dVar459 +
                  -(dVar457 * 0.14042456296296296) * dVar458 +
                  dVar264 * 0.056169825185185186 * dVar439 * dVar450 * dVar441 +
                  dVar264 * 0.25744503209876546 * dVar5 * dVar222 +
                  -(dVar264 * 0.010531842222222223) * dVar152 * dVar450 * dVar6 +
                  dVar264 * 0.01474457911111111 * dVar152 * dVar19 * dVar9 +
                  -(dVar10 * 0.345679012345679) * dVar452 +
                  -(dVar8 * 0.345679012345679) * dVar452 +
                  dVar449 * -0.1728395061728395 * dVar451 * dVar6 +
                  local_6530 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265) -
                 (dVar444 * dVar6) / 5.0)) +
                 ((-(dVar435 * 0.7385587663820223) * dVar460 +
                   local_64f8 * dVar11 * -0.36927938319101117 * dVar266 + -(dVar354 / 4.0) + dVar49)
                 - dVar424 / 4.0);
  }
  if ((in_stack_00000008[5] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x6c);
    *(double *)(in_stack_00000008[5] + 0x10 + lVar3 * 8) =
         __x * (local_64e0 + local_6568) + local_60f0 + local_60f0 + local_6178 * 2.0 +
         *(double *)(in_stack_00000008[5] + 0x10 + lVar3 * 8);
  }
  dVar5 = (dVar271 * 0.9847450218426964 * dVar481) / 8.0;
  dVar6 = dVar357 * dVar283;
  local_6620 = (dVar277 * dVar275 * dVar278 * dVar461) / 540.0;
  dVar9 = dVar18 * -0.40121303703703703 * dVar280 +
          -(dVar24 * 0.028692789826413812 * *in_RCX * dVar282);
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6570 = 0.0;
  }
  else {
    local_6570 = (dVar277 * 0.006111111111111111 * dVar29 * dVar461 * dVar283 + local_6620 +
                 (dVar277 * dVar279 * dVar285 * dVar357 * local_5f88) / 180.0) -
                 (dVar277 * dVar279 * dVar35 * dVar9) / 180.0;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6578 = local_6570;
  }
  else {
    local_6578 = 0.0;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6580 = 0.0;
  }
  else {
    local_6580 = local_6570;
  }
  dVar470 = dVar470 * dVar343;
  dVar30 = dVar471 * local_5fd0;
  dVar475 = dVar125 * dVar475;
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_6588 = -(dVar329 * 0.001530612244897959) * local_6578 +
                 dVar331 * local_6578 * -4.6972703222703225e-06 +
                 ((((((((((((-(dVar328 * local_6578) / 6.123970353448437e+29 +
                             (dVar104 * local_6578) / 5.53739330121543e+31 +
                            (dVar112 * local_6578) / 1.1046592834779778e+24) -
                           (local_5eb8 * local_6578) / 8.627661500560449e+25) +
                          (dVar103 * local_6578) / 7.093855011571925e+27) -
                         (dVar339 * local_6578) / 3.26018619408384e+18) +
                        (dVar340 * local_6578) / 2.1394273287347896e+20) -
                       (dVar341 * local_6578) / 1.493478751555308e+22) +
                      (dVar336 * local_6578) / 17589608644608.0) -
                     (dVar337 * local_6578) / 929135308308480.0) +
                    (dVar338 * local_6578) / 5.3093446189056e+16) -
                   (dVar333 * local_6578) / 210862080.0) + (dVar334 * local_6578) / 8272281600.0) -
                 (dVar335 * local_6578) / 363245076480.0) + (dVar330 * local_6578) / 9408.0 +
                 (dVar332 * local_6578) / 6150144.0 +
                 ((((dVar109 * local_61b8 * 4.22754329004329e-05 * local_5fc8 +
                    ((dVar106 * local_61b8 * 0.007653061224489796 * local_5fc8 +
                     ((((((((((((dVar123 * local_61b8 * local_5fc8) / 2.614442878957712e+24 -
                               (dVar124 * local_61b8 * local_5fc8) / 2.0268157175919785e+26) +
                              (dVar105 * local_61b8 * local_5fc8) / 1.6551271225536316e+28) -
                             (dVar107 * local_61b8 * local_5fc8) / 1.4198444362090846e+30) +
                            (dVar114 * local_61b8 * local_5fc8) / 21367357440.0) -
                           (dVar115 * local_61b8 * local_5fc8) / 925768876032.0) +
                          (dVar116 * local_61b8 * local_5fc8) / 44244538490880.0) -
                         (dVar117 * local_61b8 * local_5fc8) / 2.308410703872e+15) +
                        (dVar118 * local_61b8 * local_5fc8) / 1.304074477633536e+17) -
                       (dVar119 * local_61b8 * local_5fc8) / 7.923804921239962e+18) +
                      (dVar120 * local_61b8 * local_5fc8) / 5.149926729501062e+20) -
                     (dVar122 * local_61b8 * local_5fc8) / 3.5634170434773477e+22)) -
                    (dVar108 * local_61b8 * local_5fc8) / 1344.0)) -
                   (dVar110 * local_61b8 * local_5fc8) / 559104.0) +
                  (dVar111 * local_61b8 * local_5fc8) / 16220160.0) -
                 (dVar113 * local_61b8 * local_5fc8) / 551485440.0);
  }
  else {
    local_6588 = local_6580 * 1.1428571428571428 * dVar139 +
                 local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_6580 +
                 dVar349 * 4.0 * dVar343 * local_61c0 * local_5fd0 +
                 -dVar136 * dVar30 +
                 -(dVar137 * local_61c0 * 480.0) * dVar345 +
                 dVar348 * 240.0 * local_6580 * dVar138 +
                 dVar51 * local_5fd0 * 240.0 * dVar476 +
                 dVar126 * 24.0 *
                 (dVar128 * local_6580 * 30720.0 +
                 dVar126 * local_6580 * -5760.0 +
                 local_5ec0 * local_6580 * 448.0 +
                 local_5fd0 * local_61c0 * 448.0 +
                 dVar468 * -17280.0 * local_5fd0 + dVar469 * 153600.0 * local_5fd0) +
                 dVar475 * 72.0 * local_5fd0 +
                 dVar346 * 72.0 * local_6580 +
                 dVar347 * 72.0 * local_61c0 +
                 dVar135 * 144.0 * local_5fd0 * local_61c0 +
                 -(dVar90 * 1.5) * dVar30 +
                 (dVar134 * local_6580 * 26880.0 +
                 dVar127 * local_6580 * -2880.0 +
                 dVar125 * local_6580 * 768.0 +
                 local_6580 * -8.0 +
                 -(dVar129 * local_61c0 * 8847360.0) * local_5fd0 +
                 -(dVar130 * 1105920.0) * local_6580 +
                 dVar474 * 161280.0 * local_5fd0 +
                 dVar472 * 1536.0 * local_5fd0 + -(dVar473 * 11520.0 * local_5fd0)) * dVar133 +
                 (dVar470 * dVar345) / 2.0 + (dVar342 * dVar471) / 2.0 +
                 (dVar344 * local_6580 * dVar133) / 2.0 + (dVar131 * dVar30) / 4.0) +
                 local_61c0 * 1.1428571428571428 * dVar350 +
                 local_5fd0 * 1.1428571428571428 * dVar477;
  }
  dVar30 = local_61b0 * dVar96 * 1.8171205928321397;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6590 = local_6570;
  }
  else {
    local_6590 = 0.0;
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6598 = 0.0;
  }
  else {
    local_6598 = local_6570;
  }
  dVar464 = local_5ea8 * dVar464;
  dVar31 = dVar89 * local_61a8 * 768.0 * local_5fb8;
  dVar32 = dVar316 * 256.0 * local_6598;
  dVar465 = dVar465 * dVar319;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_65a0 = -(dVar302 * 0.005357142857142857) * local_6590 +
                 ((dVar305 * local_6590 * -3.0438311688311688e-05 +
                   (((dVar310 * local_6590) / 1017328435200.0 -
                    (dVar311 * local_6590) / 46351421276160.0) - (dVar307 * local_6590) / 20643840.0
                   ) + (dVar308 * local_6590) / 668467200.0 + (dVar303 * local_6590) / 1920.0 +
                  (dVar306 * local_6590) / 745472.0) - (dVar299 * local_6590) / 7.71114500014776e+35
                 ) + (dVar301 * local_6590) / 7.633819549822504e+37 +
                 (dVar64 * local_6590) / 1.0288727798616555e+30 +
                 (((((((((-(dVar304 * local_6590) / 8.934630842486435e+31 +
                         (dVar65 * local_6590) / 8.121312287389663e+33) -
                        (local_5ea0 * local_6590) / 2.116453759156243e+24) +
                       (dVar63 * local_6590) / 1.5793369227989443e+26) -
                      (dVar297 * local_6590) / 1.2429808430244664e+28) -
                     (dVar298 * local_6590) / 4.517479587281633e+20) +
                     (dVar300 * local_6590) / 3.000772247138819e+22 +
                    (dVar312 * local_6590) / 2.308410703872e+15) -
                   (dVar313 * local_6590) / 1.24654178009088e+17) +
                  (dVar314 * local_6590) / 7.250540450807808e+18) -
                 (dVar309 * local_6590) / 24654643200.0) +
                 ((dVar70 * local_61a0 * 2.9767152251494278e-27 * local_5fb0 +
                  (((dVar78 * local_61a0 * 6.297278025793651e-07 * local_5fb0 +
                    -(dVar77 * local_61a0 * 1.475575206043956e-05) * local_5fb0 +
                    dVar76 * local_61a0 * 0.0002739448051948052 * local_5fb0 +
                    -(dVar74 * local_61a0 * 0.0036458333333333334) * local_5fb0 +
                    dVar73 * local_61a0 * 0.026785714285714284 * local_5fb0 +
                    -(dVar67 * local_61a0 * 6.156813072833613e-37) * local_5fb0 +
                    (dVar72 * local_61a0 * local_5fb0) / 1.7135877778106135e+34) -
                   (dVar79 * local_61a0 * local_5fb0) / 44564480.0) -
                  (dVar87 * local_61a0 * local_5fb0) / 4.5123912079969836e+24)) -
                 (dVar88 * local_61a0 * local_5fb0) / 2.638135332978604e+28) +
                 -(dVar85 * local_61a0 * 1.0330674055506187e-21) * local_5fb0 +
                 dVar71 * local_61a0 * 6.419508807886076e-20 * local_5fb0 +
                 ((-(dVar83 * local_61a0 * 9.963564958965524e-15) * local_5fb0 +
                   -(dVar81 * local_61a0 * 1.8676367771303596e-11) * local_5fb0 +
                   dVar80 * local_61a0 * 6.895252899056353e-10 * local_5fb0 +
                   dVar75 * local_61a0 * 4.588885732696935e-31 * local_5fb0 +
                   -(dVar69 * local_61a0 * 5.2947108149957596e-33 * local_5fb0) +
                   (dVar82 * local_61a0 * local_5fb0) / 2207210536960.0 +
                  (dVar84 * local_61a0 * local_5fb0) / 4.98616712036352e+15) -
                 (dVar66 * local_61a0 * local_5fb0) / 2.68538535215104e+17) +
                 (dVar86 * local_61a0 * local_5fb0) / 6.413496239867403e+22;
  }
  else {
    local_65a0 = dVar464 * 48.0 * local_5fb8 +
                 local_6598 * 48.0 * dVar315 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_6598 +
                 -(dVar68 * local_5fb8 * 5.0) * dVar466 +
                 local_6598 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_6598 * -72.0 +
                 local_5fb8 * local_61a8 * -72.0 +
                 -(dVar523 * 1.5) * dVar466 * local_5fb8 +
                 (((local_5fb8 * local_61a8 * 40.0 + local_5ea8 * local_6598 * 40.0) - dVar31) -
                 dVar32) * dVar92 + (dVar465 * dVar321) / 2.0 + (dVar318 * dVar466) / 2.0 +
                 (dVar320 * local_6598 * dVar92) / 2.0 + (dVar91 * dVar466 * local_5fb8) / 4.0 +
                 dVar31 + dVar32) +
                 local_61a8 * 48.0 * dVar317 + local_61a8 * 48.0 * local_5fb8 * dVar94;
  }
  dVar31 = local_5eb0 * dVar22 * 1.8171205928321397;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_65a8 = local_6570;
  }
  else {
    local_65a8 = 0.0;
  }
  local_65b8 = ((((((((((((dVar42 * local_6188 * local_5f98) / 6.0 - (dVar274 * local_65a8) / 18.0)
                        - (dVar43 * local_6188 * local_5f98) / 48.0) +
                        (dVar287 * local_65a8) / 240.0 + (dVar45 * local_6188 * local_5f98) / 640.0)
                      - (dVar288 * local_65a8) / 4480.0) -
                     (dVar46 * local_6188 * local_5f98) / 11520.0) +
                     (dVar289 * local_65a8) / 103680.0 +
                    (dVar47 * local_6188 * local_5f98) / 258048.0) -
                   (dVar290 * local_65a8) / 2838528.0) -
                  (dVar48 * local_6188 * local_5f98) / 6881280.0) +
                  (dVar291 * local_65a8) / 89456640.0 +
                 (dVar50 * local_6188 * local_5f98) / 212336640.0) -
                (dVar41 * local_65a8) / 3185049600.0) -
               (dVar40 * local_6188 * local_5f98) / 7431782400.0) +
               (local_5e88 * local_65a8) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_65b0 = 0.0;
  }
  else {
    local_65b0 = local_6570;
  }
  dVar32 = dVar56 * local_6190;
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_65b8 = -(local_5fa0 * 2.6666666666666665) * dVar463 +
                 -(local_6190 * 2.6666666666666665) * dVar294 +
                 local_5e90 * -2.6666666666666665 *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_65b0) * dVar56 +
                  -(dVar292 * 4.0) * local_65b0 +
                  -(dVar55 * local_5fa0) * dVar32 +
                  -(local_5fa0 * dVar57 * 4.0) * local_6190 +
                  dVar522 * local_6190 * -2.0 * dVar244 + (dVar273 * local_65b0 * dVar56) / 2.0 +
                  (dVar54 * local_6190 * dVar244) / 4.0) +
                 local_5fa0 * 2.0 * dVar462 +
                 local_6190 * 2.0 * dVar293 +
                 local_65b0 * 2.0 * dVar58 +
                 -dVar44 * local_65b0 +
                 dVar521 * 2.0 * local_6190 * local_5fa0 + (-(dVar34 * local_5fa0) * dVar32) / 2.0)
                 + -(local_65b0 * 2.6666666666666665 * dVar53);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_65c0 = 0.0;
  }
  else {
    local_65c0 = -(dVar12 * 0.36927938319101117) *
                 (-(dVar25 * 0.1728395061728395) * dVar467 +
                  -(dVar31 * 0.007310467860082304) * dVar327 +
                  local_5e98 * 0.24 * dVar6 +
                  -(local_5eb0 * dVar280 * 0.0487364524005487) * dVar100 +
                  local_61b0 * dVar323 * 0.43209876543209874 * dVar100 +
                  local_65a0 * dVar96 * 0.43209876543209874 * dVar100 +
                  local_5fd8 * 1.8171205928321397 * 0.026329605555555555 * dVar479 +
                  local_5fc0 * dVar22 * 0.018276169650205763 * dVar100 +
                  -(dVar30 * 0.1728395061728395) * dVar327 +
                  -(dVar141 * 0.010531842222222223) * dVar22 * dVar325 * dVar283 +
                  dVar140 * dVar17 * *in_RCX * 0.01474457911111111 * dVar22 * dVar98 * dVar6 +
                  local_6588 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 ((((-(dVar140 * 0.07021228148148148) * dVar17 * dVar280 * dVar99 +
                    -(dVar351 * 0.010531842222222223) * dVar480 +
                    dVar141 * 0.028084912592592593 * dVar281 * dVar325 * dVar357 +
                    -(dVar141 * 0.010531842222222223) * dVar23 * dVar325 * dVar9 +
                    local_65b8 * dVar60 +
                    dVar324 * 0.2419753086419753 * dVar20 * dVar6 +
                    -(dVar478 * 0.010531842222222223) * dVar353 +
                    -(dVar478 * 0.07021228148148148) * dVar352 +
                    dVar28 * -0.1728395061728395 * dVar467 +
                    -(dVar324 * 0.1728395061728395 * dVar326 * dVar9)) - (dVar296 * dVar9) / 5.0) -
                  (local_6198 * dVar295 * dVar283) / 5.0) - (local_5fa8 * dVar295 * dVar357) / 5.0))
                 + dVar269 * -0.36927938319101117 * dVar481 + -dVar5;
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + lVar3 * 8) =
         local_65c0 * __x + local_61d0 + *(double *)(in_stack_00000008[6] + lVar3 * 8);
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[6] + 8 + lVar3 * 8) + 0.0;
  }
  dVar6 = (dVar356 * 0.9847450218426964 * dVar503) / 8.0;
  dVar9 = (dVar277 * dVar275 * dVar436 * dVar483) / 540.0;
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_65c8 = 0.0;
  }
  else {
    local_65c8 = dVar9 + (dVar277 * dVar437 * dVar362 * dVar482 * local_6010) / 180.0;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_65d0 = local_65c8;
  }
  else {
    local_65d0 = 0.0;
  }
  local_65e0 = ((((((((((((dVar167 * local_61e0 * local_6020) / 6.0 - (dVar359 * local_65d0) / 18.0)
                        - (dVar168 * local_61e0 * local_6020) / 48.0) +
                        (dVar364 * local_65d0) / 240.0 + (dVar170 * local_61e0 * local_6020) / 640.0
                       ) - (dVar365 * local_65d0) / 4480.0) -
                     (dVar171 * local_61e0 * local_6020) / 11520.0) +
                     (dVar366 * local_65d0) / 103680.0 +
                    (dVar172 * local_61e0 * local_6020) / 258048.0) -
                   (dVar367 * local_65d0) / 2838528.0) -
                  (dVar173 * local_61e0 * local_6020) / 6881280.0) +
                  (dVar368 * local_65d0) / 89456640.0 +
                 (dVar175 * local_61e0 * local_6020) / 212336640.0) -
                (dVar166 * local_65d0) / 3185049600.0) -
               (dVar165 * local_61e0 * local_6020) / 7431782400.0) +
               (local_5f10 * local_65d0) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_65d8 = 0.0;
  }
  else {
    local_65d8 = local_65c8;
  }
  dVar25 = dVar180 * local_61e8;
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_65e0 = -(local_65d8 * 2.6666666666666665) * dVar177 +
                 -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_65d8) * dVar180 +
                  -(dVar369 * 4.0) * local_65d8 +
                  -(dVar179 * local_6028) * dVar25 +
                  -(local_6028 * dVar181 * 4.0) * local_61e8 +
                  dVar513 * local_61e8 * -2.0 * dVar515 + (dVar358 * local_65d8 * dVar180) / 2.0 +
                  (dVar178 * local_61e8 * dVar515) / 4.0) +
                 local_6028 * 2.0 * dVar484 +
                 local_61e8 * 2.0 * dVar370 +
                 local_65d8 * 2.0 * dVar182 +
                 -dVar169 * local_65d8 +
                 dVar267 * 2.0 * local_61e8 * local_6028 + (-(dVar159 * local_6028) * dVar25) / 2.0)
                 + local_6028 * -2.6666666666666665 * dVar485 +
                   -(local_61e8 * 2.6666666666666665 * dVar371);
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_65e8 = local_65c8;
  }
  else {
    local_65e8 = 0.0;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_65f0 = 0.0;
  }
  else {
    local_65f0 = local_65c8;
  }
  dVar486 = local_5f30 * dVar486;
  dVar28 = dVar213 * local_6200 * 768.0 * local_6040;
  dVar33 = dVar391 * 256.0 * local_65f0;
  dVar487 = dVar487 * dVar394;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_65f8 = ((((((((-(local_5f28 * local_65e8) / 2.116453759156243e+24 +
                        (dVar187 * local_65e8) / 1.5793369227989443e+26) -
                       (dVar372 * local_65e8) / 1.2429808430244664e+28) +
                      (dVar188 * local_65e8) / 1.0288727798616555e+30) -
                     (dVar379 * local_65e8) / 8.934630842486435e+31) +
                     (dVar189 * local_65e8) / 8.121312287389663e+33 +
                    (dVar383 * local_65e8) / 668467200.0) - (dVar384 * local_65e8) / 24654643200.0)
                  + (dVar385 * local_65e8) / 1017328435200.0) -
                 (dVar386 * local_65e8) / 46351421276160.0) +
                 (dVar387 * local_65e8) / 2.308410703872e+15 +
                 ((dVar380 * local_65e8 * -3.0438311688311688e-05 +
                   -(dVar377 * 0.005357142857142857) * local_65e8 +
                   ((((-(dVar388 * local_65e8) / 1.24654178009088e+17 +
                      (dVar389 * local_65e8) / 7.250540450807808e+18) -
                     (dVar373 * local_65e8) / 4.517479587281633e+20) +
                    (dVar375 * local_65e8) / 3.000772247138819e+22) -
                   (dVar374 * local_65e8) / 7.71114500014776e+35) +
                   (dVar376 * local_65e8) / 7.633819549822504e+37 + (dVar378 * local_65e8) / 1920.0
                  + (dVar381 * local_65e8) / 745472.0) - (dVar382 * local_65e8) / 20643840.0) +
                 -(dVar205 * local_61f8 * 1.8676367771303596e-11) * local_6038 +
                 dVar204 * local_61f8 * 6.895252899056353e-10 * local_6038 +
                 ((dVar202 * local_61f8 * 6.297278025793651e-07 * local_6038 +
                  -(dVar201 * local_61f8 * 1.475575206043956e-05) * local_6038 +
                  dVar200 * local_61f8 * 0.0002739448051948052 * local_6038 +
                  -(dVar198 * local_61f8 * 0.0036458333333333334) * local_6038 +
                  dVar197 * local_61f8 * 0.026785714285714284 * local_6038 +
                  -(dVar191 * local_61f8 * 6.156813072833613e-37) * local_6038 +
                  (dVar196 * local_61f8 * local_6038) / 1.7135877778106135e+34) -
                 (dVar203 * local_61f8 * local_6038) / 44564480.0) +
                 (dVar206 * local_61f8 * local_6038) / 2207210536960.0 +
                 -(dVar193 * local_61f8 * 5.2947108149957596e-33) * local_6038 +
                 dVar199 * local_61f8 * 4.588885732696935e-31 * local_6038 +
                 ((dVar194 * local_61f8 * 2.9767152251494278e-27 * local_6038 +
                  ((-(dVar209 * local_61f8 * 1.0330674055506187e-21) * local_6038 +
                    dVar195 * local_61f8 * 6.419508807886076e-20 * local_6038 +
                    ((dVar207 * local_61f8 * -9.963564958965524e-15 * local_6038 +
                     (dVar208 * local_61f8 * local_6038) / 4.98616712036352e+15) -
                    (dVar190 * local_61f8 * local_6038) / 2.68538535215104e+17) +
                   (dVar210 * local_61f8 * local_6038) / 6.413496239867403e+22) -
                  (dVar211 * local_61f8 * local_6038) / 4.5123912079969836e+24)) -
                 (dVar212 * local_61f8 * local_6038) / 2.638135332978604e+28);
  }
  else {
    local_65f8 = dVar213 * 24.0 *
                 (-(dVar397 * 10.0) * local_65f0 +
                 -(dVar518 * local_6040 * 5.0) * dVar488 +
                 local_65f0 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_65f0 * -72.0 +
                 local_6040 * local_6200 * -72.0 +
                 -(dVar524 * 1.5) * dVar488 * local_6040 +
                 (((local_6040 * local_6200 * 40.0 + local_5f30 * local_65f0 * 40.0) - dVar28) -
                 dVar33) * dVar216 + (dVar487 * dVar396) / 2.0 + (dVar393 * dVar488) / 2.0 +
                 (dVar395 * local_65f0 * dVar216) / 2.0 + (dVar215 * dVar488 * local_6040) / 4.0 +
                 dVar28 + dVar33) +
                 local_6200 * 48.0 * local_6040 * dVar218 +
                 local_6200 * 48.0 * dVar392 +
                 dVar390 * 48.0 * local_65f0 + local_6040 * 48.0 * dVar486;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6600 = local_65c8;
  }
  else {
    local_6600 = 0.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6608 = 0.0;
  }
  else {
    local_6608 = local_65c8;
  }
  dVar492 = dVar492 * dVar413;
  dVar28 = dVar493 * local_6058;
  dVar497 = dVar248 * dVar497;
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6610 = -(dVar399 * 0.001530612244897959) * local_6600 +
                 ((((((((dVar401 * local_6600 * -4.6972703222703225e-06 +
                         ((((((dVar410 * local_6600) / 2.1394273287347896e+20 -
                             (dVar411 * local_6600) / 1.493478751555308e+22) +
                            (dVar235 * local_6600) / 1.1046592834779778e+24) -
                           (local_5f40 * local_6600) / 8.627661500560449e+25) +
                          (dVar226 * local_6600) / 7.093855011571925e+27) -
                         (dVar398 * local_6600) / 6.123970353448437e+29) +
                         (dVar227 * local_6600) / 5.53739330121543e+31 +
                        (dVar402 * local_6600) / 6150144.0) - (dVar403 * local_6600) / 210862080.0)
                      + (dVar404 * local_6600) / 8272281600.0) -
                     (dVar405 * local_6600) / 363245076480.0) +
                    (dVar406 * local_6600) / 17589608644608.0) -
                   (dVar407 * local_6600) / 929135308308480.0) +
                  (dVar408 * local_6600) / 5.3093446189056e+16) -
                 (dVar409 * local_6600) / 3.26018619408384e+18) + (dVar400 * local_6600) / 9408.0 +
                 ((((((((((((((((dVar232 * local_6210 * 4.22754329004329e-05 * local_6050 +
                                dVar229 * local_6210 * 0.007653061224489796 * local_6050 +
                                -((dVar231 * local_6210 * local_6050) / 1344.0)) -
                               (dVar233 * local_6210 * local_6050) / 559104.0) +
                              (dVar234 * local_6210 * local_6050) / 16220160.0) -
                             (dVar236 * local_6210 * local_6050) / 551485440.0) +
                            (dVar237 * local_6210 * local_6050) / 21367357440.0) -
                           (dVar238 * local_6210 * local_6050) / 925768876032.0) +
                          (dVar239 * local_6210 * local_6050) / 44244538490880.0) -
                         (dVar240 * local_6210 * local_6050) / 2.308410703872e+15) +
                        (dVar241 * local_6210 * local_6050) / 1.304074477633536e+17) -
                       (dVar242 * local_6210 * local_6050) / 7.923804921239962e+18) +
                      (dVar243 * local_6210 * local_6050) / 5.149926729501062e+20) -
                     (dVar245 * local_6210 * local_6050) / 3.5634170434773477e+22) +
                    (dVar246 * local_6210 * local_6050) / 2.614442878957712e+24) -
                   (dVar247 * local_6210 * local_6050) / 2.0268157175919785e+26) +
                  (dVar228 * local_6210 * local_6050) / 1.6551271225536316e+28) -
                 (dVar230 * local_6210 * local_6050) / 1.4198444362090846e+30);
  }
  else {
    local_6610 = local_6608 * 1.1428571428571428 * dVar262 +
                 local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6608 +
                 dVar419 * 4.0 * dVar413 * local_6218 * local_6058 +
                 -dVar259 * dVar28 +
                 -(dVar260 * local_6218 * 480.0) * dVar415 +
                 dVar418 * 240.0 * local_6608 * dVar261 +
                 dVar51 * local_6058 * 240.0 * dVar498 +
                 dVar249 * 24.0 *
                 (dVar251 * local_6608 * 30720.0 +
                 dVar249 * local_6608 * -5760.0 +
                 local_5f48 * local_6608 * 448.0 +
                 local_6058 * local_6218 * 448.0 +
                 local_6058 * -17280.0 * dVar490 + local_6058 * 153600.0 * dVar491) +
                 dVar497 * 72.0 * local_6058 +
                 dVar416 * 72.0 * local_6608 +
                 dVar417 * 72.0 * local_6218 +
                 dVar258 * 144.0 * local_6058 * local_6218 +
                 -(dVar192 * 1.5) * dVar28 +
                 (dVar257 * local_6608 * 26880.0 +
                 dVar250 * local_6608 * -2880.0 +
                 dVar248 * local_6608 * 768.0 +
                 local_6608 * -8.0 +
                 -(dVar253 * 1105920.0) * local_6608 +
                 -(local_6058 * 8847360.0) * dVar252 * local_6218 +
                 local_6058 * 161280.0 * dVar496 +
                 local_6058 * 1536.0 * dVar494 + -(local_6058 * 11520.0 * dVar495)) * dVar256 +
                 (dVar492 * dVar415) / 2.0 + (dVar412 * dVar493) / 2.0 +
                 (dVar414 * local_6608 * dVar256) / 2.0 + (dVar254 * dVar28) / 4.0) +
                 local_6058 * 1.1428571428571428 * dVar499 +
                 local_6218 * 1.1428571428571428 * dVar420;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6618 = 0.0;
  }
  else {
    local_6618 = -(dVar147 * 0.36927938319101117) *
                 (-(dVar421 * 0.010531842222222223) * dVar502 +
                 local_6060 * 1.8171205928321397 * 0.026329605555555555 * dVar501 +
                 local_6610 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265 +
                 -(dVar517 * 0.1728395061728395) * dVar489 +
                 local_6048 * dVar151 * 0.018276169650205763 * dVar223 +
                 local_65f8 * dVar16 * 0.43209876543209874 * dVar223 +
                 local_65e0 * dVar184 + -((local_6030 * dVar443 * dVar482) / 5.0)) +
                 dVar355 * -0.36927938319101117 * dVar503 + -dVar6;
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + 0x10 + lVar3 * 8) =
         local_6618 * __x + local_6228 + *(double *)(in_stack_00000008[6] + 0x10 + lVar3 * 8);
  }
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_6620 = 0.0;
  }
  else {
    local_6620 = local_6620 + (dVar277 * dVar279 * dVar285 * dVar357 * local_6098) / 180.0;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6628 = local_6620;
  }
  else {
    local_6628 = 0.0;
  }
  local_6638 = ((((((((((((dVar42 * local_6188 * local_60a8) / 6.0 - (dVar274 * local_6628) / 18.0)
                        - (dVar43 * local_6188 * local_60a8) / 48.0) +
                        (dVar287 * local_6628) / 240.0 + (dVar45 * local_6188 * local_60a8) / 640.0)
                      - (dVar288 * local_6628) / 4480.0) -
                     (dVar46 * local_6188 * local_60a8) / 11520.0) +
                     (dVar289 * local_6628) / 103680.0 +
                    (dVar47 * local_6188 * local_60a8) / 258048.0) -
                   (dVar290 * local_6628) / 2838528.0) -
                  (dVar48 * local_6188 * local_60a8) / 6881280.0) +
                  (dVar291 * local_6628) / 89456640.0 +
                 (dVar50 * local_6188 * local_60a8) / 212336640.0) -
                (dVar41 * local_6628) / 3185049600.0) -
               (dVar40 * local_6188 * local_60a8) / 7431782400.0) +
               (local_5e88 * local_6628) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6630 = 0.0;
  }
  else {
    local_6630 = local_6620;
  }
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_6638 = -(local_6190 * 2.6666666666666665) * dVar425 +
                 -(local_60b0 * 2.6666666666666665) * dVar463 +
                 local_5e90 * -2.6666666666666665 *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_6630) * dVar56 +
                  -(dVar292 * 4.0) * local_6630 +
                  -(dVar55 * local_60b0) * dVar32 +
                  -(local_60b0 * dVar57 * 4.0) * local_6190 +
                  dVar522 * local_6190 * -2.0 * dVar214 + (dVar273 * local_6630 * dVar56) / 2.0 +
                  (dVar54 * local_6190 * dVar214) / 4.0) +
                 local_60b0 * 2.0 * dVar462 +
                 local_6190 * 2.0 * dVar276 +
                 local_6630 * 2.0 * dVar58 +
                 -dVar44 * local_6630 +
                 dVar521 * 2.0 * local_6190 * local_60b0 + (-(dVar34 * local_60b0) * dVar32) / 2.0)
                 + -(local_6630 * 2.6666666666666665 * dVar53);
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6640 = local_6620;
  }
  else {
    local_6640 = 0.0;
  }
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6648 = 0.0;
  }
  else {
    local_6648 = local_6620;
  }
  dVar32 = dVar89 * local_61a8 * 768.0 * local_60c8;
  dVar28 = dVar316 * 256.0 * local_6648;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_6650 = -(dVar74 * local_61a0 * 0.0036458333333333334) * local_60c0 +
                 dVar73 * local_61a0 * 0.026785714285714284 * local_60c0 +
                 -(dVar67 * local_61a0 * 6.156813072833613e-37) * local_60c0 +
                 -(dVar69 * local_61a0 * 5.2947108149957596e-33) * local_60c0 +
                 dVar75 * local_61a0 * 4.588885732696935e-31 * local_60c0 +
                 ((dVar70 * local_61a0 * 2.9767152251494278e-27 * local_60c0 +
                  ((dVar85 * local_61a0 * -1.0330674055506187e-21 * local_60c0 +
                   (dVar86 * local_61a0 * local_60c0) / 6.413496239867403e+22) -
                  (dVar87 * local_61a0 * local_60c0) / 4.5123912079969836e+24)) -
                 (dVar88 * local_61a0 * local_60c0) / 2.638135332978604e+28) +
                 (dVar72 * local_61a0 * local_60c0) / 1.7135877778106135e+34 +
                 dVar71 * local_61a0 * 6.419508807886076e-20 * local_60c0 +
                 ((-(dVar83 * local_61a0 * 9.963564958965524e-15) * local_60c0 +
                   -(dVar81 * local_61a0 * 1.8676367771303596e-11) * local_60c0 +
                   dVar80 * local_61a0 * 6.895252899056353e-10 * local_60c0 +
                   ((dVar78 * local_61a0 * 6.297278025793651e-07 * local_60c0 +
                    dVar76 * local_61a0 * 0.0002739448051948052 * local_60c0 +
                    -(dVar77 * local_61a0 * 1.475575206043956e-05 * local_60c0)) -
                   (dVar79 * local_61a0 * local_60c0) / 44564480.0) +
                   (dVar82 * local_61a0 * local_60c0) / 2207210536960.0 +
                  (dVar84 * local_61a0 * local_60c0) / 4.98616712036352e+15) -
                 (dVar66 * local_61a0 * local_60c0) / 2.68538535215104e+17) +
                 (((((((((((dVar65 * local_6640) / 8.121312287389663e+33 +
                          (dVar312 * local_6640) / 2.308410703872e+15) -
                         (dVar313 * local_6640) / 1.24654178009088e+17) +
                        (dVar314 * local_6640) / 7.250540450807808e+18) -
                       (dVar298 * local_6640) / 4.517479587281633e+20) +
                      (dVar300 * local_6640) / 3.000772247138819e+22) -
                     (local_5ea0 * local_6640) / 2.116453759156243e+24) +
                    (dVar63 * local_6640) / 1.5793369227989443e+26) -
                   (dVar297 * local_6640) / 1.2429808430244664e+28) +
                  (dVar64 * local_6640) / 1.0288727798616555e+30) -
                 (dVar304 * local_6640) / 8.934630842486435e+31) +
                 (((((((dVar305 * local_6640 * -3.0438311688311688e-05 +
                        -(dVar302 * 0.005357142857142857) * local_6640 +
                        (dVar301 * local_6640) / 7.633819549822504e+37 +
                        (dVar303 * local_6640) / 1920.0 + (dVar306 * local_6640) / 745472.0) -
                      (dVar307 * local_6640) / 20643840.0) + (dVar308 * local_6640) / 668467200.0) -
                    (dVar309 * local_6640) / 24654643200.0) +
                   (dVar310 * local_6640) / 1017328435200.0) -
                  (dVar311 * local_6640) / 46351421276160.0) -
                 (dVar299 * local_6640) / 7.71114500014776e+35);
  }
  else {
    local_6650 = local_6648 * 48.0 * dVar315 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_6648 +
                 -(dVar68 * local_60c8 * 5.0) * dVar466 +
                 local_6648 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_6648 * -72.0 +
                 local_60c8 * local_61a8 * -72.0 +
                 -(dVar523 * 1.5) * dVar466 * local_60c8 +
                 (((local_60c8 * local_61a8 * 40.0 + local_5ea8 * local_6648 * 40.0) - dVar32) -
                 dVar28) * dVar92 + (dVar465 * dVar428) / 2.0 + (dVar427 * dVar466) / 2.0 +
                 (dVar320 * local_6648 * dVar92) / 2.0 + (dVar91 * dVar466 * local_60c8) / 4.0 +
                 dVar32 + dVar28) +
                 local_61a8 * 48.0 * local_60c8 * dVar94 +
                 local_60c8 * 48.0 * dVar464 + local_61a8 * 48.0 * dVar426;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6658 = local_6620;
  }
  else {
    local_6658 = 0.0;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6660 = 0.0;
  }
  else {
    local_6660 = local_6620;
  }
  dVar32 = dVar471 * local_60e0;
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_6668 = ((((((((((((((((dVar109 * local_61b8 * 4.22754329004329e-05 * local_60d8 +
                                dVar106 * local_61b8 * 0.007653061224489796 * local_60d8 +
                                -((dVar108 * local_61b8 * local_60d8) / 1344.0)) -
                               (dVar110 * local_61b8 * local_60d8) / 559104.0) +
                              (dVar111 * local_61b8 * local_60d8) / 16220160.0) -
                             (dVar113 * local_61b8 * local_60d8) / 551485440.0) +
                            (dVar114 * local_61b8 * local_60d8) / 21367357440.0) -
                           (dVar115 * local_61b8 * local_60d8) / 925768876032.0) +
                          (dVar116 * local_61b8 * local_60d8) / 44244538490880.0) -
                         (dVar117 * local_61b8 * local_60d8) / 2.308410703872e+15) +
                        (dVar118 * local_61b8 * local_60d8) / 1.304074477633536e+17) -
                       (dVar119 * local_61b8 * local_60d8) / 7.923804921239962e+18) +
                      (dVar120 * local_61b8 * local_60d8) / 5.149926729501062e+20) -
                     (dVar122 * local_61b8 * local_60d8) / 3.5634170434773477e+22) +
                    (dVar123 * local_61b8 * local_60d8) / 2.614442878957712e+24) -
                   (dVar124 * local_61b8 * local_60d8) / 2.0268157175919785e+26) +
                  (dVar105 * local_61b8 * local_60d8) / 1.6551271225536316e+28) -
                 (dVar107 * local_61b8 * local_60d8) / 1.4198444362090846e+30) +
                 ((((dVar331 * local_6658 * -4.6972703222703225e-06 +
                     -(dVar329 * 0.001530612244897959) * local_6658 +
                     ((((((((-(dVar337 * local_6658) / 929135308308480.0 +
                            (dVar338 * local_6658) / 5.3093446189056e+16) -
                           (dVar339 * local_6658) / 3.26018619408384e+18) +
                          (dVar340 * local_6658) / 2.1394273287347896e+20) -
                         (dVar341 * local_6658) / 1.493478751555308e+22) +
                        (dVar112 * local_6658) / 1.1046592834779778e+24) -
                       (local_5eb8 * local_6658) / 8.627661500560449e+25) +
                      (dVar103 * local_6658) / 7.093855011571925e+27) -
                     (dVar328 * local_6658) / 6.123970353448437e+29) +
                     (dVar104 * local_6658) / 5.53739330121543e+31 + (dVar330 * local_6658) / 9408.0
                    + (dVar332 * local_6658) / 6150144.0) - (dVar333 * local_6658) / 210862080.0) +
                  (dVar334 * local_6658) / 8272281600.0) - (dVar335 * local_6658) / 363245076480.0)
                 + (dVar336 * local_6658) / 17589608644608.0;
  }
  else {
    local_6668 = local_6660 * 1.1428571428571428 * dVar139 +
                 local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_6660 +
                 dVar349 * 4.0 * dVar343 * local_61c0 * local_60e0 +
                 -dVar136 * dVar32 +
                 -(dVar137 * local_61c0 * 480.0) * dVar430 +
                 dVar348 * 240.0 * local_6660 * dVar138 +
                 dVar51 * local_60e0 * 240.0 * dVar476 +
                 dVar126 * 24.0 *
                 (dVar128 * local_6660 * 30720.0 +
                 dVar126 * local_6660 * -5760.0 +
                 local_5ec0 * local_6660 * 448.0 +
                 local_60e0 * local_61c0 * 448.0 +
                 local_60e0 * -17280.0 * dVar468 + local_60e0 * 153600.0 * dVar469) +
                 dVar475 * 72.0 * local_60e0 +
                 dVar346 * 72.0 * local_6660 +
                 dVar431 * 72.0 * local_61c0 +
                 dVar135 * 144.0 * local_60e0 * local_61c0 +
                 -(dVar90 * 1.5) * dVar32 +
                 (dVar134 * local_6660 * 26880.0 +
                 dVar127 * local_6660 * -2880.0 +
                 dVar125 * local_6660 * 768.0 +
                 local_6660 * -8.0 +
                 -(dVar130 * 1105920.0) * local_6660 +
                 -(local_60e0 * 8847360.0) * dVar129 * local_61c0 +
                 local_60e0 * 161280.0 * dVar474 +
                 local_60e0 * 1536.0 * dVar472 + -(local_60e0 * 11520.0 * dVar473)) * dVar133 +
                 (dVar470 * dVar430) / 2.0 + (dVar429 * dVar471) / 2.0 +
                 (dVar344 * local_6660 * dVar133) / 2.0 + (dVar131 * dVar32) / 4.0) +
                 local_60e0 * 1.1428571428571428 * dVar477 +
                 local_61c0 * 1.1428571428571428 * dVar432;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_6670 = 0.0;
  }
  else {
    local_6670 = -(dVar12 * 0.36927938319101117) *
                 (-(dVar433 * 0.010531842222222223) * dVar480 +
                 local_60e8 * 1.8171205928321397 * 0.026329605555555555 * dVar479 +
                 local_6668 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 -(dVar519 * 0.1728395061728395) * dVar467 +
                 local_60d0 * dVar22 * 0.018276169650205763 * dVar100 +
                 local_6650 * dVar96 * 0.43209876543209874 * dVar100 +
                 local_6638 * dVar60 + -((local_60b8 * dVar295 * dVar357) / 5.0)) +
                 dVar423 * -0.36927938319101117 * dVar481 + -dVar5;
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + 0x18 + lVar3 * 8) =
         local_6670 * __x + local_61d0 + *(double *)(in_stack_00000008[6] + 0x18 + lVar3 * 8);
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + 0x20 + lVar3 * 8) =
         *(double *)(in_stack_00000008[6] + 0x20 + lVar3 * 8) + 0.0;
  }
  dVar5 = dVar482 * dVar441;
  dVar18 = dVar18 * -0.40121303703703703 * dVar438 +
           -(dVar24 * 0.028692789826413812 * in_RCX[2] * dVar440);
  dVar32 = local_6208 * dVar16 * 1.8171205928321397;
  dVar28 = local_5f38 * dVar151 * 1.8171205928321397;
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6678 = 0.0;
  }
  else {
    local_6678 = (dVar277 * 0.006111111111111111 * dVar7 * dVar483 * dVar441 + dVar9 +
                 (dVar277 * dVar437 * dVar362 * dVar482 * local_6120) / 180.0) -
                 (dVar277 * dVar437 * dVar160 * dVar18) / 180.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6680 = local_6678;
  }
  else {
    local_6680 = 0.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6688 = 0.0;
  }
  else {
    local_6688 = local_6678;
  }
  dVar9 = dVar493 * local_6168;
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6690 = dVar401 * local_6680 * -4.6972703222703225e-06 +
                 -(dVar399 * 0.001530612244897959) * local_6680 +
                 ((((((((((((-(dVar398 * local_6680) / 6.123970353448437e+29 +
                             (dVar227 * local_6680) / 5.53739330121543e+31 +
                            (dVar235 * local_6680) / 1.1046592834779778e+24) -
                           (local_5f40 * local_6680) / 8.627661500560449e+25) +
                          (dVar226 * local_6680) / 7.093855011571925e+27) -
                         (dVar409 * local_6680) / 3.26018619408384e+18) +
                        (dVar410 * local_6680) / 2.1394273287347896e+20) -
                       (dVar411 * local_6680) / 1.493478751555308e+22) +
                      (dVar406 * local_6680) / 17589608644608.0) -
                     (dVar407 * local_6680) / 929135308308480.0) +
                    (dVar408 * local_6680) / 5.3093446189056e+16) -
                   (dVar403 * local_6680) / 210862080.0) + (dVar404 * local_6680) / 8272281600.0) -
                 (dVar405 * local_6680) / 363245076480.0) + (dVar400 * local_6680) / 9408.0 +
                 (dVar402 * local_6680) / 6150144.0 +
                 ((((((((dVar232 * local_6210 * 4.22754329004329e-05 * local_6160 +
                        ((dVar229 * local_6210 * 0.007653061224489796 * local_6160 +
                         ((((((((dVar241 * local_6210 * local_6160) / 1.304074477633536e+17 -
                               (dVar242 * local_6210 * local_6160) / 7.923804921239962e+18) +
                              (dVar243 * local_6210 * local_6160) / 5.149926729501062e+20) -
                             (dVar245 * local_6210 * local_6160) / 3.5634170434773477e+22) +
                            (dVar246 * local_6210 * local_6160) / 2.614442878957712e+24) -
                           (dVar247 * local_6210 * local_6160) / 2.0268157175919785e+26) +
                          (dVar228 * local_6210 * local_6160) / 1.6551271225536316e+28) -
                         (dVar230 * local_6210 * local_6160) / 1.4198444362090846e+30)) -
                        (dVar231 * local_6210 * local_6160) / 1344.0)) -
                       (dVar233 * local_6210 * local_6160) / 559104.0) +
                      (dVar234 * local_6210 * local_6160) / 16220160.0) -
                     (dVar236 * local_6210 * local_6160) / 551485440.0) +
                    (dVar237 * local_6210 * local_6160) / 21367357440.0) -
                   (dVar238 * local_6210 * local_6160) / 925768876032.0) +
                  (dVar239 * local_6210 * local_6160) / 44244538490880.0) -
                 (dVar240 * local_6210 * local_6160) / 2.308410703872e+15);
  }
  else {
    local_6690 = local_6688 * 1.1428571428571428 * dVar262 +
                 local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6688 +
                 dVar419 * 4.0 * dVar413 * local_6218 * local_6168 +
                 -dVar259 * dVar9 +
                 -(dVar260 * local_6218 * 480.0) * dVar454 +
                 dVar418 * 240.0 * local_6688 * dVar261 +
                 dVar51 * local_6168 * 240.0 * dVar498 +
                 dVar249 * 24.0 *
                 (dVar251 * local_6688 * 30720.0 +
                 dVar249 * local_6688 * -5760.0 +
                 local_5f48 * local_6688 * 448.0 +
                 local_6168 * local_6218 * 448.0 +
                 local_6168 * -17280.0 * dVar490 + local_6168 * 153600.0 * dVar491) +
                 dVar497 * 72.0 * local_6168 +
                 dVar416 * 72.0 * local_6688 +
                 dVar455 * 72.0 * local_6218 +
                 dVar258 * 144.0 * local_6168 * local_6218 +
                 -(dVar192 * 1.5) * dVar9 +
                 (dVar257 * local_6688 * 26880.0 +
                 dVar250 * local_6688 * -2880.0 +
                 dVar248 * local_6688 * 768.0 +
                 local_6688 * -8.0 +
                 -(dVar253 * 1105920.0) * local_6688 +
                 -(local_6168 * 8847360.0) * dVar252 * local_6218 +
                 local_6168 * 161280.0 * dVar496 +
                 local_6168 * 1536.0 * dVar494 + -(local_6168 * 11520.0 * dVar495)) * dVar256 +
                 (dVar492 * dVar454) / 2.0 + (dVar453 * dVar493) / 2.0 +
                 (dVar414 * local_6688 * dVar256) / 2.0 + (dVar254 * dVar9) / 4.0) +
                 local_6168 * 1.1428571428571428 * dVar499 +
                 local_6218 * 1.1428571428571428 * dVar456;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6698 = local_6678;
  }
  else {
    local_6698 = 0.0;
  }
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_66a0 = 0.0;
  }
  else {
    local_66a0 = local_6678;
  }
  dVar9 = dVar213 * local_6200 * 768.0 * local_6150;
  dVar33 = dVar391 * 256.0 * local_66a0;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_66a8 = -(dVar377 * 0.005357142857142857) * local_6698 +
                 (((((((((dVar387 * local_6698) / 2.308410703872e+15 -
                        (dVar388 * local_6698) / 1.24654178009088e+17) +
                       (dVar389 * local_6698) / 7.250540450807808e+18) -
                      (dVar373 * local_6698) / 4.517479587281633e+20) -
                     (dVar384 * local_6698) / 24654643200.0) +
                    (dVar385 * local_6698) / 1017328435200.0) -
                   (dVar386 * local_6698) / 46351421276160.0) + (dVar381 * local_6698) / 745472.0) -
                 (dVar382 * local_6698) / 20643840.0) + (dVar383 * local_6698) / 668467200.0 +
                 ((((((((dVar380 * local_6698 * -3.0438311688311688e-05 +
                        (dVar378 * local_6698) / 1920.0) -
                       (dVar374 * local_6698) / 7.71114500014776e+35) +
                       (dVar376 * local_6698) / 7.633819549822504e+37 +
                      (dVar375 * local_6698) / 3.000772247138819e+22) -
                     (local_5f28 * local_6698) / 2.116453759156243e+24) +
                    (dVar187 * local_6698) / 1.5793369227989443e+26) -
                   (dVar372 * local_6698) / 1.2429808430244664e+28) +
                  (dVar188 * local_6698) / 1.0288727798616555e+30) -
                 (dVar379 * local_6698) / 8.934630842486435e+31) +
                 (dVar189 * local_6698) / 8.121312287389663e+33 +
                 -(dVar205 * local_61f8 * 1.8676367771303596e-11) * local_6148 +
                 dVar204 * local_61f8 * 6.895252899056353e-10 * local_6148 +
                 ((dVar202 * local_61f8 * 6.297278025793651e-07 * local_6148 +
                  -(dVar201 * local_61f8 * 1.475575206043956e-05) * local_6148 +
                  dVar200 * local_61f8 * 0.0002739448051948052 * local_6148 +
                  -(dVar198 * local_61f8 * 0.0036458333333333334) * local_6148 +
                  dVar197 * local_61f8 * 0.026785714285714284 * local_6148 +
                  -(dVar191 * local_61f8 * 6.156813072833613e-37) * local_6148 +
                  (dVar196 * local_61f8 * local_6148) / 1.7135877778106135e+34) -
                 (dVar203 * local_61f8 * local_6148) / 44564480.0) +
                 (dVar206 * local_61f8 * local_6148) / 2207210536960.0 +
                 -(dVar193 * local_61f8 * 5.2947108149957596e-33) * local_6148 +
                 dVar199 * local_61f8 * 4.588885732696935e-31 * local_6148 +
                 ((dVar194 * local_61f8 * 2.9767152251494278e-27 * local_6148 +
                  ((-(dVar209 * local_61f8 * 1.0330674055506187e-21) * local_6148 +
                    dVar195 * local_61f8 * 6.419508807886076e-20 * local_6148 +
                    ((dVar207 * local_61f8 * -9.963564958965524e-15 * local_6148 +
                     (dVar208 * local_61f8 * local_6148) / 4.98616712036352e+15) -
                    (dVar190 * local_61f8 * local_6148) / 2.68538535215104e+17) +
                   (dVar210 * local_61f8 * local_6148) / 6.413496239867403e+22) -
                  (dVar211 * local_61f8 * local_6148) / 4.5123912079969836e+24)) -
                 (dVar212 * local_61f8 * local_6148) / 2.638135332978604e+28);
  }
  else {
    local_66a8 = dVar213 * 24.0 *
                 (-(dVar397 * 10.0) * local_66a0 +
                 -(dVar518 * local_6150 * 5.0) * dVar488 +
                 local_66a0 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_66a0 * -72.0 +
                 local_6150 * local_6200 * -72.0 +
                 -(dVar524 * 1.5) * dVar488 * local_6150 +
                 (((local_6150 * local_6200 * 40.0 + local_5f30 * local_66a0 * 40.0) - dVar9) -
                 dVar33) * dVar216 + (dVar487 * dVar447) / 2.0 + (dVar446 * dVar488) / 2.0 +
                 (dVar395 * local_66a0 * dVar216) / 2.0 + (dVar215 * dVar488 * local_6150) / 4.0 +
                 dVar9 + dVar33) +
                 local_6200 * 48.0 * local_6150 * dVar218 +
                 local_6200 * 48.0 * dVar445 +
                 dVar390 * 48.0 * local_66a0 + local_6150 * 48.0 * dVar486;
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_66b0 = local_6678;
  }
  else {
    local_66b0 = 0.0;
  }
  local_66c0 = ((((((((((((dVar167 * local_61e0 * local_6130) / 6.0 - (dVar359 * local_66b0) / 18.0)
                        - (dVar168 * local_61e0 * local_6130) / 48.0) +
                        (dVar364 * local_66b0) / 240.0 + (dVar170 * local_61e0 * local_6130) / 640.0
                       ) - (dVar365 * local_66b0) / 4480.0) -
                     (dVar171 * local_61e0 * local_6130) / 11520.0) +
                     (dVar366 * local_66b0) / 103680.0 +
                    (dVar172 * local_61e0 * local_6130) / 258048.0) -
                   (dVar367 * local_66b0) / 2838528.0) -
                  (dVar173 * local_61e0 * local_6130) / 6881280.0) +
                  (dVar368 * local_66b0) / 89456640.0 +
                 (dVar175 * local_61e0 * local_6130) / 212336640.0) -
                (dVar166 * local_66b0) / 3185049600.0) -
               (dVar165 * local_61e0 * local_6130) / 7431782400.0) +
               (local_5f10 * local_66b0) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_66b8 = 0.0;
  }
  else {
    local_66b8 = local_6678;
  }
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_66c0 = -(local_66b8 * 2.6666666666666665) * dVar177 +
                 -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_66b8) * dVar180 +
                  -(dVar369 * 4.0) * local_66b8 +
                  -(dVar179 * local_6138) * dVar25 +
                  -(local_6138 * dVar181 * 4.0) * local_61e8 +
                  dVar513 * local_61e8 * -2.0 * dVar14 + (dVar358 * local_66b8 * dVar180) / 2.0 +
                  (dVar178 * local_61e8 * dVar14) / 4.0) +
                 local_6138 * 2.0 * dVar484 +
                 local_61e8 * 2.0 * dVar360 +
                 local_66b8 * 2.0 * dVar182 +
                 -dVar169 * local_66b8 +
                 dVar267 * 2.0 * local_61e8 * local_6138 + (-(dVar159 * local_6138) * dVar25) / 2.0)
                 + local_6138 * -2.6666666666666665 * dVar485 +
                   -(local_61e8 * 2.6666666666666665 * dVar442);
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_66c8 = 0.0;
  }
  else {
    local_66c8 = -(dVar147 * 0.36927938319101117) *
                 (-(dVar449 * 0.1728395061728395) * dVar451 * dVar18 +
                  -(dVar10 * 0.1728395061728395) * dVar489 +
                  -(dVar8 * 0.1728395061728395) * dVar489 +
                  -(dVar28 * 0.007310467860082304) * dVar452 +
                  -(dVar32 * 0.1728395061728395) * dVar452 +
                  -(dVar500 * 0.07021228148148148) * dVar458 +
                  -(dVar457 * 0.010531842222222223) * dVar502 +
                  -(dVar264 * 0.010531842222222223) * dVar152 * dVar450 * dVar18 +
                  dVar264 * 0.028084912592592593 * dVar439 * dVar450 * dVar482 +
                  dVar449 * 0.2419753086419753 * dVar21 * dVar5 +
                  dVar263 * dVar17 * in_RCX[2] * 0.01474457911111111 * dVar151 * dVar19 * dVar5 +
                  -(dVar500 * 0.010531842222222223 * dVar459) +
                 local_5f20 * 0.24 * dVar5 +
                 local_66c0 * dVar184 +
                 -(local_5f38 * dVar438 * 0.0487364524005487) * dVar223 +
                 ((((-(dVar263 * 0.07021228148148148) * dVar17 * dVar438 * dVar222 +
                    local_6170 * 1.8171205928321397 * 0.026329605555555555 * dVar501 +
                    local_6158 * dVar151 * 0.018276169650205763 * dVar223 +
                    local_6208 * dVar448 * 0.43209876543209874 * dVar223 +
                    local_66a8 * dVar16 * 0.43209876543209874 * dVar223 +
                    local_6690 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265 +
                    -(dVar264 * 0.010531842222222223 * dVar151 * dVar450 * dVar441)) -
                   (local_61f0 * dVar443 * dVar441) / 5.0) - (local_6140 * dVar443 * dVar482) / 5.0)
                 - (dVar444 * dVar18) / 5.0)) + dVar435 * -0.36927938319101117 * dVar503 + -dVar6;
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + 0x28 + lVar3 * 8) =
         __x * local_66c8 + local_6228 + *(double *)(in_stack_00000008[6] + 0x28 + lVar3 * 8);
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + lVar3 * 8) =
         *(double *)(in_stack_00000008[7] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[7] + 8 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[7] + 0x10 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + 0x18 + lVar3 * 8) =
         *(double *)(in_stack_00000008[7] + 0x18 + lVar3 * 8) + 0.0;
  }
  dVar5 = dVar504 * dVar270 * local_5eb0 * 0.00536738469820968 * dVar507;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_66d0 = 0.0;
  }
  else {
    local_66d0 = -(dVar506 * 0.006440861637851617) * dVar95 * dVar327 +
                 -(dVar506 * 0.026836923491048402) * dVar22 * 1.8171205928321397 * dVar17 * dVar99 +
                 dVar504 * dVar11 * local_5fc0 * 0.01610215409462904 * dVar507 +
                 local_5f70 * 1.4422495703074083 * dVar505 * 0.01610215409462904 * dVar507 + dVar5;
  }
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + lVar3 * 8) =
         __x * local_66d0 + local_6230 + *(double *)(in_stack_00000008[8] + lVar3 * 8);
  }
  dVar6 = dVar508 * dVar270 * local_5f38 * 0.00536738469820968 * dVar511;
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_66d8 = 0.0;
  }
  else {
    local_66d8 = dVar508 * dVar11 * local_6048 * 0.01610215409462904 * dVar511 +
                 local_5ff8 * 1.4422495703074083 * dVar509 * 0.01610215409462904 * dVar511 + dVar6;
  }
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + 8 + lVar3 * 8) =
         __x * local_66d8 + local_6238 + *(double *)(in_stack_00000008[8] + 8 + lVar3 * 8);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_66e0 = 0.0;
  }
  else {
    local_66e0 = dVar504 * dVar11 * local_60d0 * 0.01610215409462904 * dVar507 +
                 local_6080 * 1.4422495703074083 * dVar505 * 0.01610215409462904 * dVar507 + dVar5;
  }
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + 0x10 + lVar3 * 8) =
         __x * local_66e0 + local_6230 + *(double *)(in_stack_00000008[8] + 0x10 + lVar3 * 8);
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_66e8 = 0.0;
  }
  else {
    local_66e8 = -(dVar510 * 0.006440861637851617) * dVar219 * dVar452 +
                 -(dVar510 * 0.026836923491048402) * dVar151 * 1.8171205928321397 * dVar17 * dVar222
                 + dVar508 * dVar11 * local_6158 * 0.01610215409462904 * dVar511 +
                   local_6108 * 1.4422495703074083 * dVar509 * 0.01610215409462904 * dVar511 + dVar6
    ;
  }
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + 0x18 + lVar3 * 8) =
         __x * local_66e8 + local_6238 + *(double *)(in_stack_00000008[8] + 0x18 + lVar3 * 8);
  }
  local_6188 = local_6188 * local_6188;
  dVar5 = dVar357 * dVar357;
  dVar15 = dVar13 * dVar1 * 1.4422495703074083 * dVar15;
  if ((dVar37 != 0.0) || (NAN(dVar37))) {
    local_66f0 = 0.0;
  }
  else {
    local_66f0 = dVar277 * 0.006111111111111111 * dVar29 * dVar35 * dVar5 +
                 -(dVar15 * 2.988832273584772e-05 * dVar278 * dVar35 * dVar24 * dVar27);
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_66f8 = local_66f0;
  }
  else {
    local_66f8 = 0.0;
  }
  local_6708 = ((((((((((((dVar42 * local_6188) / 6.0 - (dVar274 * local_66f8) / 18.0) -
                        (dVar43 * local_6188) / 48.0) + (dVar287 * local_66f8) / 240.0 +
                       (dVar45 * local_6188) / 640.0) - (dVar288 * local_66f8) / 4480.0) -
                     (dVar46 * local_6188) / 11520.0) + (dVar289 * local_66f8) / 103680.0 +
                    (dVar47 * local_6188) / 258048.0) - (dVar290 * local_66f8) / 2838528.0) -
                  (dVar48 * local_6188) / 6881280.0) + (dVar291 * local_66f8) / 89456640.0 +
                 (dVar50 * local_6188) / 212336640.0) - (dVar41 * local_66f8) / 3185049600.0) -
               (dVar40 * local_6188) / 7431782400.0) + (local_5e88 * local_66f8) / 126340300800.0;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    local_6700 = 0.0;
  }
  else {
    local_6700 = local_66f0;
  }
  dVar6 = local_6190 * local_6190;
  if ((dVar38 == 0.0) && (!NAN(dVar38))) {
    local_6708 = -(local_5e90 * 2.6666666666666665) *
                 (local_5e90 * 2.0 *
                  (-(dVar52 * local_6700) * dVar56 +
                  -(dVar292 * 4.0) * local_6700 +
                  -(dVar55 * dVar6) * dVar56 +
                  -(dVar6 * 4.0) * dVar57 +
                  dVar522 * -2.0 * dVar6 * dVar56 + (dVar273 * local_6700 * dVar56) / 2.0 +
                  (dVar54 * dVar6 * dVar56) / 4.0) +
                 local_6190 * 4.0 * dVar462 +
                 local_6700 * 2.0 * dVar58 +
                 -dVar44 * local_6700 + dVar521 * 2.0 * dVar6 + (-(dVar34 * dVar6) * dVar56) / 2.0)
                 + local_6700 * -2.6666666666666665 * dVar53 +
                   -(local_6190 * 5.333333333333333 * dVar463);
  }
  local_61a0 = local_61a0 * local_61a0;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6710 = local_66f0;
  }
  else {
    local_6710 = 0.0;
  }
  dVar6 = local_61a8 * local_61a8;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_6718 = 0.0;
  }
  else {
    local_6718 = local_66f0;
  }
  dVar8 = dVar89 * 768.0 * dVar6;
  dVar9 = dVar316 * 256.0 * local_6718;
  if ((dVar61 != 0.0) || (NAN(dVar61))) {
    local_6720 = dVar81 * local_61a0 * -1.8676367771303596e-11 +
                 dVar80 * local_61a0 * 6.895252899056353e-10 +
                 ((dVar78 * local_61a0 * 6.297278025793651e-07 +
                  dVar77 * local_61a0 * -1.475575206043956e-05 +
                  dVar76 * local_61a0 * 0.0002739448051948052 +
                  dVar74 * local_61a0 * -0.0036458333333333334 +
                  dVar73 * 0.026785714285714284 * local_61a0 +
                  dVar67 * local_61a0 * -6.156813072833613e-37 +
                  (dVar72 * local_61a0) / 1.7135877778106135e+34) -
                 (dVar79 * local_61a0) / 44564480.0) + (dVar82 * local_61a0) / 2207210536960.0 +
                 dVar69 * local_61a0 * -5.2947108149957596e-33 +
                 dVar75 * local_61a0 * 4.588885732696935e-31 +
                 ((dVar70 * local_61a0 * 2.9767152251494278e-27 +
                  ((dVar85 * local_61a0 * -1.0330674055506187e-21 +
                    dVar71 * local_61a0 * 6.419508807886076e-20 +
                    ((dVar83 * local_61a0 * -9.963564958965524e-15 +
                     (dVar84 * local_61a0) / 4.98616712036352e+15) -
                    (dVar66 * local_61a0) / 2.68538535215104e+17) +
                   (dVar86 * local_61a0) / 6.413496239867403e+22) -
                  (dVar87 * local_61a0) / 4.5123912079969836e+24)) -
                 (dVar88 * local_61a0) / 2.638135332978604e+28) +
                 ((((((dVar305 * local_6710 * -3.0438311688311688e-05 +
                       -(dVar302 * 0.005357142857142857) * local_6710 +
                       -(dVar299 * local_6710) / 7.71114500014776e+35 +
                       (dVar301 * local_6710) / 7.633819549822504e+37 +
                       (dVar303 * local_6710) / 1920.0 + (dVar306 * local_6710) / 745472.0) -
                     (dVar307 * local_6710) / 20643840.0) + (dVar308 * local_6710) / 668467200.0) -
                   (dVar309 * local_6710) / 24654643200.0) +
                  (dVar310 * local_6710) / 1017328435200.0) -
                 (dVar311 * local_6710) / 46351421276160.0) +
                 ((((((((((dVar312 * local_6710) / 2.308410703872e+15 -
                         (dVar313 * local_6710) / 1.24654178009088e+17) +
                        (dVar314 * local_6710) / 7.250540450807808e+18) -
                       (dVar298 * local_6710) / 4.517479587281633e+20) +
                      (dVar300 * local_6710) / 3.000772247138819e+22) -
                     (local_5ea0 * local_6710) / 2.116453759156243e+24) +
                    (dVar63 * local_6710) / 1.5793369227989443e+26) -
                   (dVar297 * local_6710) / 1.2429808430244664e+28) +
                  (dVar64 * local_6710) / 1.0288727798616555e+30) -
                 (dVar304 * local_6710) / 8.934630842486435e+31) +
                 (dVar65 * local_6710) / 8.121312287389663e+33;
  }
  else {
    local_6720 = local_6718 * 48.0 * dVar315 +
                 dVar94 * 48.0 * dVar6 +
                 local_61a8 * 96.0 * dVar464 +
                 dVar89 * 24.0 *
                 (-(dVar322 * 10.0) * local_6718 +
                 -(dVar68 * 5.0 * dVar6) * dVar92 +
                 local_6718 * 10.0 * dVar51 * dVar93 +
                 local_5ea8 * local_6718 * -72.0 +
                 dVar6 * -72.0 +
                 -(dVar523 * 1.5) * dVar6 * dVar92 +
                 (((dVar6 * 40.0 + local_5ea8 * local_6718 * 40.0) - dVar8) - dVar9) * dVar92 +
                 dVar465 * dVar466 + (dVar320 * local_6718 * dVar92) / 2.0 +
                 (dVar91 * dVar6 * dVar92) / 4.0 + dVar8 + dVar9);
  }
  local_61b8 = local_61b8 * local_61b8;
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6728 = local_66f0;
  }
  else {
    local_6728 = 0.0;
  }
  if ((dVar102 != 0.0) || (NAN(dVar102))) {
    local_6730 = 0.0;
  }
  else {
    local_6730 = local_66f0;
  }
  dVar6 = local_61c0 * local_61c0;
  dVar8 = dVar6 * dVar133;
  if ((dVar101 != 0.0) || (NAN(dVar101))) {
    local_6738 = ((((((((((((((((dVar109 * local_61b8 * 4.22754329004329e-05 +
                                dVar106 * 0.007653061224489796 * local_61b8 +
                                -((dVar108 * local_61b8) / 1344.0)) -
                               (dVar110 * local_61b8) / 559104.0) +
                              (dVar111 * local_61b8) / 16220160.0) -
                             (dVar113 * local_61b8) / 551485440.0) +
                            (dVar114 * local_61b8) / 21367357440.0) -
                           (dVar115 * local_61b8) / 925768876032.0) +
                          (dVar116 * local_61b8) / 44244538490880.0) -
                         (dVar117 * local_61b8) / 2.308410703872e+15) +
                        (dVar118 * local_61b8) / 1.304074477633536e+17) -
                       (dVar119 * local_61b8) / 7.923804921239962e+18) +
                      (dVar120 * local_61b8) / 5.149926729501062e+20) -
                     (dVar122 * local_61b8) / 3.5634170434773477e+22) +
                    (dVar123 * local_61b8) / 2.614442878957712e+24) -
                   (dVar124 * local_61b8) / 2.0268157175919785e+26) +
                  (dVar105 * local_61b8) / 1.6551271225536316e+28) -
                 (dVar107 * local_61b8) / 1.4198444362090846e+30) +
                 ((((((((((((((dVar331 * local_6728 * -4.6972703222703225e-06 +
                               dVar329 * -0.001530612244897959 * local_6728 +
                               (dVar330 * local_6728) / 9408.0 + (dVar332 * local_6728) / 6150144.0)
                             - (dVar333 * local_6728) / 210862080.0) +
                            (dVar334 * local_6728) / 8272281600.0) -
                           (dVar335 * local_6728) / 363245076480.0) +
                          (dVar336 * local_6728) / 17589608644608.0) -
                         (dVar337 * local_6728) / 929135308308480.0) +
                        (dVar338 * local_6728) / 5.3093446189056e+16) -
                       (dVar339 * local_6728) / 3.26018619408384e+18) +
                      (dVar340 * local_6728) / 2.1394273287347896e+20) -
                     (dVar341 * local_6728) / 1.493478751555308e+22) +
                    (dVar112 * local_6728) / 1.1046592834779778e+24) -
                   (local_5eb8 * local_6728) / 8.627661500560449e+25) +
                  (dVar103 * local_6728) / 7.093855011571925e+27) -
                 (dVar328 * local_6728) / 6.123970353448437e+29) +
                 (dVar104 * local_6728) / 5.53739330121543e+31;
  }
  else {
    local_6738 = local_5ec0 * 1.1428571428571428 *
                 (-(dVar349 * 2.0) * dVar132 * local_6730 +
                 dVar349 * 4.0 * dVar343 * dVar6 +
                 -dVar136 * dVar8 +
                 -(dVar137 * 480.0 * dVar6) * dVar133 +
                 dVar348 * 240.0 * local_6730 * dVar138 +
                 dVar51 * 240.0 * dVar6 * dVar138 +
                 dVar126 * 24.0 *
                 (dVar128 * local_6730 * 30720.0 +
                 dVar127 * dVar6 * 153600.0 +
                 dVar126 * local_6730 * -5760.0 +
                 dVar125 * dVar6 * -17280.0 + dVar6 * 448.0 + local_5ec0 * local_6730 * 448.0) +
                 dVar346 * 72.0 * local_6730 +
                 dVar475 * 144.0 * local_61c0 +
                 dVar135 * 144.0 * dVar6 +
                 -(dVar90 * 1.5) * dVar8 +
                 (dVar134 * local_6730 * 26880.0 +
                 dVar128 * dVar6 * 161280.0 +
                 dVar127 * local_6730 * -2880.0 +
                 dVar126 * dVar6 * -11520.0 +
                 dVar125 * local_6730 * 768.0 +
                 local_5ec0 * dVar6 * 1536.0 +
                 local_6730 * -8.0 +
                 dVar129 * -8847360.0 * dVar6 + -(dVar130 * 1105920.0 * local_6730)) * dVar133 +
                 dVar470 * dVar471 + (dVar344 * local_6730 * dVar133) / 2.0 +
                 (dVar131 * dVar8) / 4.0) +
                 local_6730 * 1.1428571428571428 * dVar139 +
                 local_61c0 * 2.2857142857142856 * dVar477;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_6740 = 0.0;
  }
  else {
    local_6740 = dVar12 * -0.36927938319101117 *
                 (-(local_5ec8 * *in_RCX * 3.490037979816484e-06) *
                  (1.0 / (dVar26 * dVar26)) * dVar325 +
                 dVar141 * 0.01474457911111111 * dVar23 * dVar98 * dVar5 +
                 -(dVar141 * 0.021063684444444446) * dVar22 * dVar325 * dVar357 +
                 -(dVar478 * 0.021063684444444446) * dVar480 +
                 local_61c8 * 1.8171205928321397 * 0.05265921111111111 * dVar479 +
                 local_6738 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar142 +
                 -(dVar97 * 5.727549162131833e-05) * dVar325 * dVar27 +
                 dVar324 * 0.2419753086419753 * dVar20 * dVar5 +
                 -(dVar31 * 0.014620935720164608) * dVar467 +
                 -(dVar30 * 0.345679012345679) * dVar467 +
                 local_61b0 * dVar22 * 0.036552339300411525 * dVar100 +
                 local_6720 * dVar96 * 0.43209876543209874 * dVar100 +
                 -(dVar296 * 0.0010759796184905178) * dVar24 * dVar27 +
                 local_5e98 * 0.24 * dVar5 +
                 local_6708 * dVar60 + -(local_6198 * dVar295 * 0.4 * dVar357));
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + lVar3 * 8) =
         __x * local_6740 + *(double *)(in_stack_00000008[9] + lVar3 * 8);
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[9] + 8 + lVar3 * 8) + 0.0;
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[9] + 0x10 + lVar3 * 8) + 0.0;
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + 0x18 + lVar3 * 8) =
         *(double *)(in_stack_00000008[9] + 0x18 + lVar3 * 8) + 0.0;
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + 0x20 + lVar3 * 8) =
         *(double *)(in_stack_00000008[9] + 0x20 + lVar3 * 8) + 0.0;
  }
  local_61e0 = local_61e0 * local_61e0;
  dVar5 = dVar482 * dVar482;
  if ((dVar162 != 0.0) || (NAN(dVar162))) {
    local_6748 = 0.0;
  }
  else {
    local_6748 = dVar277 * 0.006111111111111111 * dVar7 * dVar160 * dVar5 +
                 -(dVar15 * 2.988832273584772e-05 * dVar436 * dVar160 * dVar24 * dVar155);
  }
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6750 = local_6748;
  }
  else {
    local_6750 = 0.0;
  }
  local_6760 = ((((((((((((dVar167 * local_61e0) / 6.0 - (dVar359 * local_6750) / 18.0) -
                        (dVar168 * local_61e0) / 48.0) + (dVar364 * local_6750) / 240.0 +
                       (dVar170 * local_61e0) / 640.0) - (dVar365 * local_6750) / 4480.0) -
                     (dVar171 * local_61e0) / 11520.0) + (dVar366 * local_6750) / 103680.0 +
                    (dVar172 * local_61e0) / 258048.0) - (dVar367 * local_6750) / 2838528.0) -
                  (dVar173 * local_61e0) / 6881280.0) + (dVar368 * local_6750) / 89456640.0 +
                 (dVar175 * local_61e0) / 212336640.0) - (dVar166 * local_6750) / 3185049600.0) -
               (dVar165 * local_61e0) / 7431782400.0) + (local_5f10 * local_6750) / 126340300800.0;
  if ((dVar164 != 0.0) || (NAN(dVar164))) {
    local_6758 = 0.0;
  }
  else {
    local_6758 = local_6748;
  }
  dVar6 = local_61e8 * local_61e8;
  if ((dVar163 == 0.0) && (!NAN(dVar163))) {
    local_6760 = -(local_5f18 * 2.6666666666666665) *
                 (local_5f18 * 2.0 *
                  (-(dVar176 * local_6758) * dVar180 +
                  -(dVar369 * 4.0) * local_6758 +
                  -(dVar179 * dVar6) * dVar180 +
                  -(dVar6 * 4.0) * dVar181 +
                  dVar513 * -2.0 * dVar6 * dVar180 + (dVar358 * local_6758 * dVar180) / 2.0 +
                  (dVar178 * dVar6 * dVar180) / 4.0) +
                 local_61e8 * 4.0 * dVar484 +
                 local_6758 * 2.0 * dVar182 +
                 -dVar169 * local_6758 +
                 dVar267 * 2.0 * dVar6 + (-(dVar159 * dVar6) * dVar180) / 2.0) +
                 local_6758 * -2.6666666666666665 * dVar177 +
                 -(local_61e8 * 5.333333333333333 * dVar485);
  }
  local_61f8 = local_61f8 * local_61f8;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6768 = local_6748;
  }
  else {
    local_6768 = 0.0;
  }
  dVar6 = local_6200 * local_6200;
  if ((dVar186 != 0.0) || (NAN(dVar186))) {
    local_6770 = 0.0;
  }
  else {
    local_6770 = local_6748;
  }
  dVar8 = dVar213 * 768.0 * dVar6;
  dVar7 = dVar391 * 256.0 * local_6770;
  if ((dVar185 != 0.0) || (NAN(dVar185))) {
    local_6778 = ((dVar194 * local_61f8 * 2.9767152251494278e-27 +
                  ((dVar209 * local_61f8 * -1.0330674055506187e-21 +
                    dVar195 * local_61f8 * 6.419508807886076e-20 +
                    ((dVar207 * local_61f8 * -9.963564958965524e-15 +
                      dVar205 * local_61f8 * -1.8676367771303596e-11 +
                      (dVar206 * local_61f8) / 2207210536960.0 +
                     (dVar208 * local_61f8) / 4.98616712036352e+15) -
                    (dVar190 * local_61f8) / 2.68538535215104e+17) +
                   (dVar210 * local_61f8) / 6.413496239867403e+22) -
                  (dVar211 * local_61f8) / 4.5123912079969836e+24)) -
                 (dVar212 * local_61f8) / 2.638135332978604e+28) +
                 dVar204 * local_61f8 * 6.895252899056353e-10 +
                 ((dVar202 * local_61f8 * 6.297278025793651e-07 +
                  dVar201 * local_61f8 * -1.475575206043956e-05 +
                  dVar200 * local_61f8 * 0.0002739448051948052 +
                  dVar198 * local_61f8 * -0.0036458333333333334 +
                  dVar197 * 0.026785714285714284 * local_61f8 +
                  dVar191 * local_61f8 * -6.156813072833613e-37 +
                  dVar199 * local_61f8 * 4.588885732696935e-31 +
                  -(dVar193 * local_61f8 * 5.2947108149957596e-33) +
                  (dVar196 * local_61f8) / 1.7135877778106135e+34) -
                 (dVar203 * local_61f8) / 44564480.0) +
                 (((((((((((dVar189 * local_6768) / 8.121312287389663e+33 +
                          (dVar375 * local_6768) / 3.000772247138819e+22) -
                         (local_5f28 * local_6768) / 2.116453759156243e+24) +
                        (dVar187 * local_6768) / 1.5793369227989443e+26) -
                       (dVar372 * local_6768) / 1.2429808430244664e+28) +
                      (dVar188 * local_6768) / 1.0288727798616555e+30) -
                     (dVar379 * local_6768) / 8.934630842486435e+31) +
                    (dVar383 * local_6768) / 668467200.0) - (dVar384 * local_6768) / 24654643200.0)
                  + (dVar385 * local_6768) / 1017328435200.0) -
                 (dVar386 * local_6768) / 46351421276160.0) +
                 ((dVar380 * local_6768 * -3.0438311688311688e-05 +
                   -(dVar377 * 0.005357142857142857) * local_6768 +
                   (((((dVar387 * local_6768) / 2.308410703872e+15 -
                      (dVar388 * local_6768) / 1.24654178009088e+17) +
                     (dVar389 * local_6768) / 7.250540450807808e+18) -
                    (dVar373 * local_6768) / 4.517479587281633e+20) -
                   (dVar374 * local_6768) / 7.71114500014776e+35) +
                   (dVar376 * local_6768) / 7.633819549822504e+37 + (dVar378 * local_6768) / 1920.0
                  + (dVar381 * local_6768) / 745472.0) - (dVar382 * local_6768) / 20643840.0);
  }
  else {
    local_6778 = dVar218 * 48.0 * dVar6 +
                 dVar213 * 24.0 *
                 (-(dVar397 * 10.0) * local_6770 +
                 -(dVar518 * 5.0 * dVar6) * dVar216 +
                 local_6770 * 10.0 * dVar51 * dVar217 +
                 local_5f30 * local_6770 * -72.0 +
                 dVar6 * -72.0 +
                 -(dVar524 * 1.5) * dVar6 * dVar216 +
                 (((dVar6 * 40.0 + local_5f30 * local_6770 * 40.0) - dVar8) - dVar7) * dVar216 +
                 dVar487 * dVar488 + (dVar395 * local_6770 * dVar216) / 2.0 +
                 (dVar215 * dVar6 * dVar216) / 4.0 + dVar8 + dVar7) +
                 dVar390 * 48.0 * local_6770 + local_6200 * 96.0 * dVar486;
  }
  local_6210 = local_6210 * local_6210;
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6780 = local_6748;
  }
  else {
    local_6780 = 0.0;
  }
  if ((dVar225 != 0.0) || (NAN(dVar225))) {
    local_6788 = 0.0;
  }
  else {
    local_6788 = local_6748;
  }
  dVar6 = local_6218 * local_6218;
  dVar8 = dVar6 * dVar256;
  if ((dVar224 != 0.0) || (NAN(dVar224))) {
    local_6790 = ((((((((((((((((dVar232 * local_6210 * 4.22754329004329e-05 +
                                dVar229 * 0.007653061224489796 * local_6210 +
                                -((dVar231 * local_6210) / 1344.0)) -
                               (dVar233 * local_6210) / 559104.0) +
                              (dVar234 * local_6210) / 16220160.0) -
                             (dVar236 * local_6210) / 551485440.0) +
                            (dVar237 * local_6210) / 21367357440.0) -
                           (dVar238 * local_6210) / 925768876032.0) +
                          (dVar239 * local_6210) / 44244538490880.0) -
                         (dVar240 * local_6210) / 2.308410703872e+15) +
                        (dVar241 * local_6210) / 1.304074477633536e+17) -
                       (dVar242 * local_6210) / 7.923804921239962e+18) +
                      (dVar243 * local_6210) / 5.149926729501062e+20) -
                     (dVar245 * local_6210) / 3.5634170434773477e+22) +
                    (dVar246 * local_6210) / 2.614442878957712e+24) -
                   (dVar247 * local_6210) / 2.0268157175919785e+26) +
                  (dVar228 * local_6210) / 1.6551271225536316e+28) -
                 (dVar230 * local_6210) / 1.4198444362090846e+30) +
                 -(dVar399 * 0.001530612244897959) * local_6780 +
                 ((((dVar401 * local_6780 * -4.6972703222703225e-06 +
                     ((((((((((dVar226 * local_6780) / 7.093855011571925e+27 -
                             (dVar398 * local_6780) / 6.123970353448437e+29) +
                            (dVar227 * local_6780) / 5.53739330121543e+31) -
                           (dVar407 * local_6780) / 929135308308480.0) +
                          (dVar408 * local_6780) / 5.3093446189056e+16) -
                         (dVar409 * local_6780) / 3.26018619408384e+18) +
                        (dVar410 * local_6780) / 2.1394273287347896e+20) -
                       (dVar411 * local_6780) / 1.493478751555308e+22) +
                      (dVar235 * local_6780) / 1.1046592834779778e+24) -
                     (local_5f40 * local_6780) / 8.627661500560449e+25) +
                     (dVar400 * local_6780) / 9408.0 + (dVar402 * local_6780) / 6150144.0) -
                   (dVar403 * local_6780) / 210862080.0) + (dVar404 * local_6780) / 8272281600.0) -
                 (dVar405 * local_6780) / 363245076480.0) +
                 (dVar406 * local_6780) / 17589608644608.0;
  }
  else {
    local_6790 = local_5f48 * 1.1428571428571428 *
                 (-(dVar419 * 2.0) * dVar255 * local_6788 +
                 dVar419 * 4.0 * dVar413 * dVar6 +
                 -dVar259 * dVar8 +
                 -(dVar260 * 480.0 * dVar6) * dVar256 +
                 dVar418 * 240.0 * local_6788 * dVar261 +
                 dVar51 * 240.0 * dVar6 * dVar261 +
                 dVar249 * 24.0 *
                 (dVar251 * local_6788 * 30720.0 +
                 dVar250 * dVar6 * 153600.0 +
                 dVar249 * local_6788 * -5760.0 +
                 dVar248 * dVar6 * -17280.0 + dVar6 * 448.0 + local_5f48 * local_6788 * 448.0) +
                 dVar416 * 72.0 * local_6788 +
                 dVar497 * 144.0 * local_6218 +
                 dVar258 * 144.0 * dVar6 +
                 -(dVar192 * 1.5) * dVar8 +
                 (dVar257 * local_6788 * 26880.0 +
                 dVar251 * dVar6 * 161280.0 +
                 dVar250 * local_6788 * -2880.0 +
                 dVar249 * dVar6 * -11520.0 +
                 dVar248 * local_6788 * 768.0 +
                 local_5f48 * dVar6 * 1536.0 +
                 local_6788 * -8.0 +
                 dVar252 * -8847360.0 * dVar6 + -(dVar253 * 1105920.0 * local_6788)) * dVar256 +
                 dVar492 * dVar493 + (dVar414 * local_6788 * dVar256) / 2.0 +
                 (dVar254 * dVar8) / 4.0) +
                 local_6788 * 1.1428571428571428 * dVar262 +
                 local_6218 * 2.2857142857142856 * dVar499;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_6798 = 0.0;
  }
  else {
    local_6798 = dVar147 * -0.36927938319101117 *
                 (-(local_5f50 * in_RCX[2] * 3.490037979816484e-06) *
                  (1.0 / (dVar154 * dVar154)) * dVar450 +
                 dVar264 * 0.01474457911111111 * dVar152 * dVar19 * dVar5 +
                 -(dVar264 * 0.021063684444444446) * dVar151 * dVar450 * dVar482 +
                 -(dVar500 * 0.021063684444444446) * dVar502 +
                 local_6220 * 1.8171205928321397 * 0.05265921111111111 * dVar501 +
                 local_6790 * 1.8171205928321397 * dVar17 * 0.026329605555555555 * dVar265 +
                 -(dVar220 * 5.727549162131833e-05) * dVar450 * dVar155 +
                 dVar449 * 0.2419753086419753 * dVar21 * dVar5 +
                 -(dVar28 * 0.014620935720164608) * dVar489 +
                 -(dVar32 * 0.345679012345679) * dVar489 +
                 local_6208 * dVar151 * 0.036552339300411525 * dVar223 +
                 local_6778 * dVar16 * 0.43209876543209874 * dVar223 +
                 -(dVar444 * 0.0010759796184905178) * dVar24 * dVar155 +
                 local_5f20 * 0.24 * dVar5 +
                 local_6760 * dVar184 + -(local_61f0 * dVar443 * 0.4 * dVar482));
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + 0x28 + lVar3 * 8) =
         __x * local_6798 + *(double *)(in_stack_00000008[9] + 0x28 + lVar3 * 8);
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + 8 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + 0x10 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + 0x18 + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + 0x18 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + 0x20 + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + 0x20 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + 0x28 + lVar3 * 8) =
         *(double *)(in_stack_00000008[10] + 0x28 + lVar3 * 8) + 0.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_67a0 = 0.0;
  }
  else {
    local_67a0 = dVar504 * dVar11 * local_61b0 * 0.01610215409462904 * dVar507 +
                 -(dVar506 * 0.006440861637851617 * dVar95 * dVar467);
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + lVar3 * 8) =
         __x * local_67a0 + *(double *)(in_stack_00000008[0xb] + lVar3 * 8);
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xb] + 8 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xb] + 0x10 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + 0x18 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xb] + 0x18 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + 0x20 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xb] + 0x20 + lVar3 * 8) + 0.0;
  }
  if ((dVar144 != 0.0) || (NAN(dVar144))) {
    local_67a8 = 0.0;
  }
  else {
    local_67a8 = dVar508 * dVar11 * local_6208 * 0.01610215409462904 * dVar511 +
                 -(dVar510 * 0.006440861637851617 * dVar219 * dVar489);
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + 0x28 + lVar3 * 8) =
         __x * local_67a8 + *(double *)(in_stack_00000008[0xb] + 0x28 + lVar3 * 8);
  }
  if (((in_stack_00000008[0xc] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x11];
    *(double *)(in_stack_00000008[0xc] + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xc] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xc] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x11];
    *(double *)(in_stack_00000008[0xc] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xc] + 8 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xc] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x11];
    *(double *)(in_stack_00000008[0xc] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xc] + 0x10 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     (((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0 && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)))) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xd] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     (((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0 && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)))) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xd] + 8 + lVar3 * 8) + 0.0;
  }
  if ((((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
      ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xd] + 0x10 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     (((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0 && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)))) {
    lVar3 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + 0x18 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xd] + 0x18 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xe] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x12];
    *(double *)(in_stack_00000008[0xe] + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xe] + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xe] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x12];
    *(double *)(in_stack_00000008[0xe] + 8 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xe] + 8 + lVar3 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xe] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0x12];
    *(double *)(in_stack_00000008[0xe] + 0x10 + lVar3 * 8) =
         *(double *)(in_stack_00000008[0xe] + 0x10 + lVar3 * 8) + 0.0;
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_fxc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t5, t8, t9, t12;
  double t13, t14, t16, t17, t18, t19, t20, t21;
  double t22, t23, t24, t25, t26, t27, t28, t29;
  double t30, t31, t33, t34, t35, t36, t37, t40;
  double t41, t44, t45, t46, t48, t49, t50, t51;
  double t52, t53, t54, t55, t56, t57, t58, t60;
  double t61, t62, t63, t64, t67, t68, t71, tzk0;

  double t72, t73, t74, t76, t79, t80, t84, t85;
  double t87, t88, t89, t93, t94, t95, t98, t101;
  double t102, t106, t107, t109, t112, t113, t116, t118;
  double t120, tvrho0, t124, t127, t128, t132, t134, t137;
  double t138, t141, t142, t146, t147, t148, t151, t154;
  double t155, t159, tvrho1, t164, t165, t166, t169, t170;
  double t173, tvsigma0, tvsigma1, t176, t177, t178, t181, t182;
  double t185, tvsigma2;

  double t188, t189, t192, t193, t194, t197, t201, t202;
  double t205, t211, t212, t214, t215, t216, t218, t219;
  double t223, t224, t228, t230, t232, t234, t237, t238;
  double t242, t243, t244, t247, t250, t254, t255, t258;
  double t260, t262, t264, tv2rho20, t267, t271, t275, t276;
  double t279, t286, t287, t291, t295, t296, t299, t304;
  double t305, t308, tv2rho21, t313, t318, t322, t323, t328;
  double t329, t334, t338, t339, t346, t347, t351, t352;
  double t356, t358, t360, t362, t365, t366, t370, tv2rho22;
  double t375, t377, t380, t384, t385, t388, t389, t393;
  double tv2rhosigma0, tv2rhosigma1, t397, t399, t401, tv2rhosigma2, t406, tv2rhosigma3;
  double tv2rhosigma4, t412, t416, t417, t420, t421, t425, tv2rhosigma5;
  double t430, t434, t435, t438, tv2sigma20, tv2sigma21, tv2sigma22, tv2sigma23;
  double tv2sigma24, t442, t446, t447, t450, tv2sigma25;


  t1 = rho[0] <= p->dens_threshold;
  t2 = sqrt(M_PI);
  t3 = 0.1e1 / t2;
  t4 = rho[0] + rho[1];
  t5 = 0.1e1 / t4;
  t8 = 0.2e1 * rho[0] * t5 <= p->zeta_threshold;
  t9 = p->zeta_threshold - 0.1e1;
  t12 = 0.2e1 * rho[1] * t5 <= p->zeta_threshold;
  t13 = -t9;
  t14 = rho[0] - rho[1];
  t16 = my_piecewise5(t8, t9, t12, t13, t14 * t5);
  t17 = 0.1e1 + t16;
  t18 = t17 <= p->zeta_threshold;
  t19 = sqrt(p->zeta_threshold);
  t20 = t19 * p->zeta_threshold;
  t21 = sqrt(t17);
  t22 = t21 * t17;
  t23 = my_piecewise3(t18, t20, t22);
  t24 = t3 * t23;
  t25 = M_SQRT2;
  t26 = sqrt(t4);
  t27 = t25 * t26;
  t28 = rho[0] * rho[0];
  t29 = t28 * rho[0];
  t30 = 0.1e1 / t29;
  t31 = sigma[0] * t30;
  t33 = 0.1e1 + 0.8323e-2 * t31;
  t34 = POW_1_4(t33);
  t35 = t34 * t34;
  t36 = t35 * t34;
  t37 = 0.1e1 / t36;
  t40 = 0.1e1 + 0.22047110337950987485e-2 * t31 * t37;
  t41 = t27 * t40;
  t44 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t24 * t41);
  t45 = rho[1] <= p->dens_threshold;
  t46 = -t14;
  t48 = my_piecewise5(t12, t9, t8, t13, t46 * t5);
  t49 = 0.1e1 + t48;
  t50 = t49 <= p->zeta_threshold;
  t51 = sqrt(t49);
  t52 = t51 * t49;
  t53 = my_piecewise3(t50, t20, t52);
  t54 = t3 * t53;
  t55 = rho[1] * rho[1];
  t56 = t55 * rho[1];
  t57 = 0.1e1 / t56;
  t58 = sigma[2] * t57;
  t60 = 0.1e1 + 0.8323e-2 * t58;
  t61 = POW_1_4(t60);
  t62 = t61 * t61;
  t63 = t62 * t61;
  t64 = 0.1e1 / t63;
  t67 = 0.1e1 + 0.22047110337950987485e-2 * t58 * t64;
  t68 = t27 * t67;
  t71 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t54 * t68);
  tzk0 = t44 + t71;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t72 = t4 * t4;
  t73 = 0.1e1 / t72;
  t74 = t14 * t73;
  t76 = my_piecewise5(t8, 0, t12, 0, t5 - t74);
  t79 = my_piecewise3(t18, 0, 0.3e1 / 0.2e1 * t21 * t76);
  t80 = t3 * t79;
  t84 = t25 / t26;
  t85 = t84 * t40;
  t87 = t24 * t85 / 0.3e1;
  t88 = t28 * t28;
  t89 = 0.1e1 / t88;
  t93 = sigma[0] * sigma[0];
  t94 = t88 * t29;
  t95 = 0.1e1 / t94;
  t98 = 0.1e1 / t36 / t33;
  t101 = -0.66141331013852962455e-2 * sigma[0] * t89 * t37 + 0.41287072352122365488e-4 * t93 * t95 * t98;
  t102 = t27 * t101;
  t106 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t80 * t41 - t87 - 0.2e1 / 0.3e1 * t24 * t102);
  t107 = t46 * t73;
  t109 = my_piecewise5(t12, 0, t8, 0, -t5 - t107);
  t112 = my_piecewise3(t50, 0, 0.3e1 / 0.2e1 * t51 * t109);
  t113 = t3 * t112;
  t116 = t84 * t67;
  t118 = t54 * t116 / 0.3e1;
  t120 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t113 * t68 - t118);
  tvrho0 = t44 + t71 + t4 * (t106 + t120);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t124 = my_piecewise5(t8, 0, t12, 0, -t5 - t74);
  t127 = my_piecewise3(t18, 0, 0.3e1 / 0.2e1 * t21 * t124);
  t128 = t3 * t127;
  t132 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t128 * t41 - t87);
  t134 = my_piecewise5(t12, 0, t8, 0, t5 - t107);
  t137 = my_piecewise3(t50, 0, 0.3e1 / 0.2e1 * t51 * t134);
  t138 = t3 * t137;
  t141 = t55 * t55;
  t142 = 0.1e1 / t141;
  t146 = sigma[2] * sigma[2];
  t147 = t141 * t56;
  t148 = 0.1e1 / t147;
  t151 = 0.1e1 / t63 / t60;
  t154 = -0.66141331013852962455e-2 * sigma[2] * t142 * t64 + 0.41287072352122365488e-4 * t146 * t148 * t151;
  t155 = t27 * t154;
  t159 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t138 * t68 - t118 - 0.2e1 / 0.3e1 * t54 * t155);
  tvrho1 = t44 + t71 + t4 * (t132 + t159);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 1] += tvrho1;

  t164 = t88 * t28;
  t165 = 0.1e1 / t164;
  t166 = sigma[0] * t165;
  t169 = 0.22047110337950987485e-2 * t30 * t37 - 0.13762357450707455163e-4 * t166 * t98;
  t170 = t27 * t169;
  t173 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t24 * t170);
  tvsigma0 = t4 * t173;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  tvsigma1 = 0.e0;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 1] += tvsigma1;

  t176 = t141 * t55;
  t177 = 0.1e1 / t176;
  t178 = sigma[2] * t177;
  t181 = 0.22047110337950987485e-2 * t57 * t64 - 0.13762357450707455163e-4 * t178 * t151;
  t182 = t27 * t181;
  t185 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t54 * t182);
  tvsigma2 = t4 * t185;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 2] += tvsigma2;

  t188 = 0.1e1 / t21;
  t189 = t76 * t76;
  t192 = t72 * t4;
  t193 = 0.1e1 / t192;
  t194 = t14 * t193;
  t197 = my_piecewise5(t8, 0, t12, 0, -0.2e1 * t73 + 0.2e1 * t194);
  t201 = my_piecewise3(t18, 0, 0.3e1 / 0.4e1 * t188 * t189 + 0.3e1 / 0.2e1 * t21 * t197);
  t202 = t3 * t201;
  t205 = t80 * t85;
  t211 = t25 / t26 / t4;
  t212 = t211 * t40;
  t214 = t24 * t212 / 0.6e1;
  t215 = t84 * t101;
  t216 = t24 * t215;
  t218 = t88 * rho[0];
  t219 = 0.1e1 / t218;
  t223 = t88 * t88;
  t224 = 0.1e1 / t223;
  t228 = t93 * sigma[0];
  t230 = 0.1e1 / t223 / t29;
  t232 = t33 * t33;
  t234 = 0.1e1 / t36 / t232;
  t237 = 0.26456532405541184982e-1 * sigma[0] * t219 * t37 - 0.41287072352122365489e-3 * t93 * t224 * t98 + 0.18040695917302508518e-5 * t228 * t230 * t234;
  t238 = t27 * t237;
  t242 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t202 * t41 - 0.2e1 / 0.3e1 * t205 - 0.4e1 / 0.3e1 * t80 * t102 + t214 - 0.2e1 / 0.3e1 * t216 - 0.2e1 / 0.3e1 * t24 * t238);
  t243 = 0.1e1 / t51;
  t244 = t109 * t109;
  t247 = t46 * t193;
  t250 = my_piecewise5(t12, 0, t8, 0, 0.2e1 * t73 + 0.2e1 * t247);
  t254 = my_piecewise3(t50, 0, 0.3e1 / 0.4e1 * t243 * t244 + 0.3e1 / 0.2e1 * t51 * t250);
  t255 = t3 * t254;
  t258 = t113 * t116;
  t260 = t211 * t67;
  t262 = t54 * t260 / 0.6e1;
  t264 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t255 * t68 - 0.2e1 / 0.3e1 * t258 + t262);
  tv2rho20 = 0.2e1 * t106 + 0.2e1 * t120 + t4 * (t242 + t264);

  if(out->v2rho2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rho2[ip*p->dim.v2rho2 + 0] += tv2rho20;

  t267 = t188 * t124;
  t271 = my_piecewise5(t8, 0, t12, 0, 0.2e1 * t194);
  t275 = my_piecewise3(t18, 0, 0.3e1 / 0.4e1 * t267 * t76 + 0.3e1 / 0.2e1 * t21 * t271);
  t276 = t3 * t275;
  t279 = t128 * t85;
  t286 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t276 * t41 - t279 / 0.3e1 - 0.2e1 / 0.3e1 * t128 * t102 - t205 / 0.3e1 + t214 - t216 / 0.3e1);
  t287 = t243 * t134;
  t291 = my_piecewise5(t12, 0, t8, 0, 0.2e1 * t247);
  t295 = my_piecewise3(t50, 0, 0.3e1 / 0.4e1 * t287 * t109 + 0.3e1 / 0.2e1 * t51 * t291);
  t296 = t3 * t295;
  t299 = t138 * t116;
  t304 = t84 * t154;
  t305 = t54 * t304;
  t308 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t296 * t68 - t299 / 0.3e1 - t258 / 0.3e1 + t262 - 0.2e1 / 0.3e1 * t113 * t155 - t305 / 0.3e1);
  tv2rho21 = t106 + t120 + t132 + t159 + t4 * (t286 + t308);

  if(out->v2rho2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rho2[ip*p->dim.v2rho2 + 1] += tv2rho21;

  t313 = t124 * t124;
  t318 = my_piecewise5(t8, 0, t12, 0, 0.2e1 * t73 + 0.2e1 * t194);
  t322 = my_piecewise3(t18, 0, 0.3e1 / 0.4e1 * t188 * t313 + 0.3e1 / 0.2e1 * t21 * t318);
  t323 = t3 * t322;
  t328 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t323 * t41 - 0.2e1 / 0.3e1 * t279 + t214);
  t329 = t134 * t134;
  t334 = my_piecewise5(t12, 0, t8, 0, -0.2e1 * t73 + 0.2e1 * t247);
  t338 = my_piecewise3(t50, 0, 0.3e1 / 0.4e1 * t243 * t329 + 0.3e1 / 0.2e1 * t51 * t334);
  t339 = t3 * t338;
  t346 = t141 * rho[1];
  t347 = 0.1e1 / t346;
  t351 = t141 * t141;
  t352 = 0.1e1 / t351;
  t356 = t146 * sigma[2];
  t358 = 0.1e1 / t351 / t56;
  t360 = t60 * t60;
  t362 = 0.1e1 / t63 / t360;
  t365 = 0.26456532405541184982e-1 * sigma[2] * t347 * t64 - 0.41287072352122365489e-3 * t146 * t352 * t151 + 0.18040695917302508518e-5 * t356 * t358 * t362;
  t366 = t27 * t365;
  t370 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t339 * t68 - 0.2e1 / 0.3e1 * t299 - 0.4e1 / 0.3e1 * t138 * t155 + t262 - 0.2e1 / 0.3e1 * t305 - 0.2e1 / 0.3e1 * t54 * t366);
  tv2rho22 = 0.2e1 * t132 + 0.2e1 * t159 + t4 * (t328 + t370);

  if(out->v2rho2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rho2[ip*p->dim.v2rho2 + 2] += tv2rho22;

  t375 = t84 * t169;
  t377 = t24 * t375 / 0.3e1;
  t380 = t95 * t98;
  t384 = 0.1e1 / t223 / t28;
  t385 = t93 * t384;
  t388 = -0.66141331013852962455e-2 * t89 * t37 + 0.12386121705636709647e-3 * t380 * sigma[0] - 0.60135653057675028394e-6 * t385 * t234;
  t389 = t27 * t388;
  t393 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t80 * t170 - t377 - 0.2e1 / 0.3e1 * t24 * t389);
  tv2rhosigma0 = t4 * t393 + t173;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 0] += tv2rhosigma0;

  tv2rhosigma1 = 0.e0;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 1] += tv2rhosigma1;

  t397 = t84 * t181;
  t399 = t54 * t397 / 0.3e1;
  t401 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t113 * t182 - t399);
  tv2rhosigma2 = t4 * t401 + t185;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 2] += tv2rhosigma2;

  t406 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t128 * t170 - t377);
  tv2rhosigma3 = t4 * t406 + t173;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 3] += tv2rhosigma3;

  tv2rhosigma4 = 0.e0;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 4] += tv2rhosigma4;

  t412 = t148 * t151;
  t416 = 0.1e1 / t351 / t55;
  t417 = t146 * t416;
  t420 = -0.66141331013852962455e-2 * t142 * t64 + 0.12386121705636709647e-3 * t412 * sigma[2] - 0.60135653057675028394e-6 * t417 * t362;
  t421 = t27 * t420;
  t425 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t138 * t182 - t399 - 0.2e1 / 0.3e1 * t54 * t421);
  tv2rhosigma5 = t4 * t425 + t185;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 5] += tv2rhosigma5;

  t430 = 0.1e1 / t223 / rho[0];
  t434 = -0.27524714901414910326e-4 * t165 * t98 + 0.20045217685891676131e-6 * sigma[0] * t430 * t234;
  t435 = t27 * t434;
  t438 = my_piecewise3(t1, 0, -0.2e1 / 0.3e1 * t24 * t435);
  tv2sigma20 = t4 * t438;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 0] += tv2sigma20;

  tv2sigma21 = 0.e0;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 1] += tv2sigma21;

  tv2sigma22 = 0.e0;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 2] += tv2sigma22;

  tv2sigma23 = 0.e0;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 3] += tv2sigma23;

  tv2sigma24 = 0.e0;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 4] += tv2sigma24;

  t442 = 0.1e1 / t351 / rho[1];
  t446 = -0.27524714901414910326e-4 * t177 * t151 + 0.20045217685891676131e-6 * sigma[2] * t442 * t362;
  t447 = t27 * t446;
  t450 = my_piecewise3(t45, 0, -0.2e1 / 0.3e1 * t54 * t447);
  tv2sigma25 = t4 * t450;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 5] += tv2sigma25;

}